

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6502Storage.cpp
# Opt level: O0

void __thiscall
CPU::MOS6502::ProcessorStorage::ProcessorStorage(ProcessorStorage *this,Personality personality)

{
  bool bVar1;
  InstructionList *paMVar2;
  MicroOp *local_24d8;
  undefined1 local_24c9;
  MicroOp *local_24c0;
  MicroOp local_24b1;
  MicroOp *local_24a8;
  undefined1 local_2499;
  MicroOp *local_2490;
  MicroOp local_2481;
  MicroOp *local_2478;
  MicroOp local_2469;
  MicroOp *local_2460;
  MicroOp local_2451;
  MicroOp *local_2448;
  MicroOp local_2439;
  MicroOp *local_2430;
  MicroOp local_2421;
  MicroOp *local_2418;
  MicroOp local_2409;
  MicroOp *local_2400;
  MicroOp local_23f1;
  MicroOp *local_23e8;
  MicroOp local_23d9;
  MicroOp *local_23d0;
  MicroOp local_23c1;
  MicroOp *local_23b8;
  MicroOp local_23a9;
  MicroOp *local_23a0;
  MicroOp local_2391;
  MicroOp *local_2388;
  MicroOp *local_2378;
  MicroOp *local_2368;
  MicroOp *local_2358;
  MicroOp *local_2348;
  MicroOp *local_2338;
  MicroOp *local_2328;
  MicroOp *local_2318;
  MicroOp local_2301;
  MicroOp *local_22f8;
  MicroOp local_22e1;
  MicroOp *local_22d8;
  MicroOp *local_22c8;
  MicroOp *local_22b8;
  MicroOp local_22a1;
  MicroOp *local_2298;
  MicroOp *local_2288;
  MicroOp *local_2278;
  MicroOp *local_2268;
  MicroOp local_2251;
  MicroOp *local_2248;
  MicroOp local_2231;
  MicroOp *local_2228;
  MicroOp *local_2218;
  MicroOp *local_2208;
  MicroOp local_21f1;
  MicroOp *local_21e8;
  MicroOp *local_21d8;
  MicroOp *local_21c8;
  MicroOp *local_21b8;
  MicroOp local_21a1;
  MicroOp *local_2198;
  MicroOp local_2181;
  MicroOp *local_2178;
  MicroOp *local_2168;
  MicroOp *local_2158;
  MicroOp *local_2148;
  MicroOp *local_2138;
  MicroOp *local_2128;
  MicroOp *local_2118;
  MicroOp local_2101;
  MicroOp *local_20f8;
  MicroOp local_20e1;
  MicroOp *local_20d8;
  MicroOp *local_20c8;
  MicroOp *local_20b8;
  MicroOp local_20a1;
  MicroOp *local_2098;
  MicroOp *local_2088;
  MicroOp *local_2078;
  MicroOp *local_2068;
  MicroOp local_2051;
  MicroOp *local_2048;
  MicroOp local_2031;
  MicroOp *local_2028;
  MicroOp *local_2018;
  MicroOp *local_2008;
  MicroOp local_1ff1;
  MicroOp *local_1fe8;
  MicroOp *local_1fd8;
  MicroOp *local_1fc8;
  MicroOp *local_1fb8;
  MicroOp local_1fa1;
  MicroOp *local_1f98;
  MicroOp local_1f81;
  MicroOp *local_1f78;
  MicroOp *local_1f68;
  MicroOp *local_1f58;
  MicroOp local_1f41;
  MicroOp *local_1f38;
  MicroOp *local_1f28;
  MicroOp *local_1f18;
  MicroOp *local_1f08;
  MicroOp local_1ef1;
  MicroOp *local_1ee8;
  MicroOp local_1ed1;
  MicroOp *local_1ec8;
  MicroOp *local_1eb8;
  MicroOp *local_1ea8;
  MicroOp *local_1e98;
  MicroOp *local_1e88;
  MicroOp *local_1e78;
  MicroOp *local_1e68;
  MicroOp local_1e51;
  MicroOp *local_1e48;
  MicroOp local_1e31;
  MicroOp *local_1e28;
  MicroOp *local_1e18;
  MicroOp *local_1e08;
  MicroOp local_1df1;
  MicroOp *local_1de8;
  MicroOp *local_1dd8;
  MicroOp *local_1dc8;
  MicroOp *local_1db8;
  MicroOp *local_1da8;
  MicroOp *local_1d98;
  MicroOp *local_1d88;
  MicroOp *local_1d78;
  MicroOp *local_1d68;
  MicroOp *local_1d58;
  MicroOp *local_1d48;
  MicroOp *local_1d38;
  MicroOp *local_1d28;
  MicroOp *local_1d18;
  MicroOp *local_1d08;
  MicroOp *local_1cf8;
  MicroOp *local_1ce8;
  MicroOp *local_1cd8;
  MicroOp *local_1cc8;
  MicroOp *local_1cb8;
  MicroOp *local_1ca8;
  MicroOp *local_1c98;
  MicroOp *local_1c88;
  MicroOp *local_1c78;
  MicroOp *local_1c68;
  MicroOp *local_1c58;
  MicroOp *local_1c48;
  MicroOp *local_1c38;
  MicroOp *local_1c28;
  MicroOp *local_1c18;
  MicroOp *local_1c08;
  MicroOp *local_1bf8;
  MicroOp *local_1be8;
  MicroOp *local_1bd8;
  MicroOp *local_1bc8;
  MicroOp *local_1bb8;
  MicroOp *local_1ba8;
  MicroOp *local_1b98;
  MicroOp *local_1b88;
  MicroOp *local_1b78;
  MicroOp *local_1b68;
  MicroOp *local_1b58;
  MicroOp *local_1b48;
  MicroOp *local_1b38;
  MicroOp *local_1b28;
  MicroOp *local_1b18;
  MicroOp *local_1b08;
  MicroOp *local_1af8;
  MicroOp *local_1ae8;
  MicroOp *local_1ad8;
  MicroOp *local_1ac8;
  MicroOp *local_1ab8;
  MicroOp *local_1aa8;
  MicroOp *local_1a98;
  MicroOp *local_1a88;
  MicroOp *local_1a78;
  MicroOp *local_1a68;
  MicroOp *local_1a58;
  MicroOp *local_1a48;
  MicroOp *local_1a38;
  MicroOp *local_1a28;
  MicroOp *local_1a18;
  MicroOp *local_1a08;
  MicroOp *local_19f8;
  MicroOp *local_19e8;
  MicroOp *local_19d8;
  MicroOp *local_19c8;
  MicroOp *local_19b8;
  MicroOp local_19a1;
  MicroOp *local_1998;
  MicroOp local_1981;
  MicroOp *local_1978;
  MicroOp *local_1968;
  MicroOp *local_1958;
  MicroOp local_1941;
  MicroOp *local_1938;
  MicroOp *local_1928;
  MicroOp *local_1918;
  MicroOp *local_1908;
  MicroOp local_18f1;
  MicroOp *local_18e8;
  MicroOp local_18d1;
  MicroOp *local_18c8;
  MicroOp *local_18b8;
  MicroOp *local_18a8;
  MicroOp local_1891;
  MicroOp *local_1888;
  MicroOp *local_1878;
  MicroOp *local_1868;
  MicroOp *local_1858;
  MicroOp local_1841;
  MicroOp *local_1838;
  MicroOp local_1821;
  MicroOp *local_1818;
  MicroOp *local_1808;
  MicroOp *local_17f8;
  MicroOp *local_17e8;
  MicroOp *local_17d8;
  MicroOp *local_17c8;
  MicroOp *local_17b8;
  MicroOp local_17a1;
  MicroOp *local_1798;
  MicroOp local_1781;
  MicroOp *local_1778;
  MicroOp *local_1768;
  MicroOp *local_1758;
  MicroOp local_1741;
  MicroOp *local_1738;
  MicroOp *local_1728;
  MicroOp *local_1718;
  MicroOp *local_1708;
  MicroOp local_16f1;
  MicroOp *local_16e8;
  MicroOp local_16d1;
  MicroOp *local_16c8;
  MicroOp *local_16b8;
  MicroOp *local_16a8;
  MicroOp local_1691;
  MicroOp *local_1688;
  MicroOp *local_1678;
  MicroOp *local_1668;
  MicroOp *local_1658;
  MicroOp local_1641;
  MicroOp *local_1638;
  MicroOp local_1621;
  MicroOp *local_1618;
  MicroOp *local_1608;
  MicroOp *local_15f8;
  MicroOp local_15e1;
  MicroOp *local_15d8;
  MicroOp *local_15c8;
  MicroOp *local_15b8;
  MicroOp *local_15a8;
  MicroOp local_1591;
  MicroOp *local_1588;
  MicroOp local_1571;
  MicroOp *local_1568;
  MicroOp *local_1558;
  MicroOp *local_1548;
  MicroOp *local_1538;
  MicroOp *local_1528;
  MicroOp *local_1518;
  MicroOp *local_1508;
  MicroOp local_14f1;
  MicroOp *local_14e8;
  MicroOp local_14d1;
  MicroOp *local_14c8;
  MicroOp *local_14b8;
  MicroOp *local_14a8;
  MicroOp local_1491;
  MicroOp *local_1488;
  MicroOp *local_1478;
  MicroOp *local_1468;
  MicroOp *local_1458;
  MicroOp local_1441;
  MicroOp *local_1438;
  MicroOp local_1421;
  MicroOp *local_1418;
  MicroOp *local_1408;
  MicroOp *local_13f8;
  MicroOp local_13e1;
  MicroOp *local_13d8;
  MicroOp *local_13c8;
  MicroOp *local_13b8;
  MicroOp *local_13a8;
  MicroOp local_1391;
  MicroOp *local_1388;
  MicroOp local_1371;
  MicroOp *local_1368;
  MicroOp *local_1358;
  MicroOp *local_1348;
  MicroOp local_1331;
  MicroOp *local_1328;
  MicroOp *local_1318;
  MicroOp *local_1308;
  MicroOp *local_12f8;
  MicroOp local_12e1;
  MicroOp *local_12d8;
  MicroOp local_12c1;
  MicroOp *local_12b8;
  MicroOp *local_12a8;
  MicroOp *local_1298;
  MicroOp *local_1288;
  MicroOp *local_1278;
  MicroOp *local_1268;
  MicroOp *local_1258;
  MicroOp local_1241;
  MicroOp *local_1238;
  MicroOp local_1221;
  MicroOp *local_1218;
  MicroOp *local_1208;
  MicroOp *local_11f8;
  MicroOp local_11e1;
  MicroOp *local_11d8;
  MicroOp *local_11c8;
  MicroOp *local_11b8;
  MicroOp *local_11a8;
  MicroOp local_1191;
  MicroOp *local_1188;
  MicroOp local_1171;
  MicroOp *local_1168;
  MicroOp *local_1158;
  MicroOp *local_1148;
  MicroOp local_1131;
  MicroOp *local_1128;
  MicroOp *local_1118;
  MicroOp *local_1108;
  MicroOp *local_10f8;
  MicroOp local_10e1;
  MicroOp *local_10d8;
  MicroOp local_10c1;
  MicroOp *local_10b8;
  MicroOp *local_10a8;
  MicroOp *local_1098;
  MicroOp local_1081;
  MicroOp *local_1078;
  MicroOp *local_1068;
  MicroOp *local_1058;
  MicroOp *local_1048;
  MicroOp local_1031;
  MicroOp *local_1028;
  MicroOp local_1011;
  MicroOp *local_1008;
  MicroOp *local_ff8;
  MicroOp *local_fe8;
  MicroOp *local_fd8;
  MicroOp *local_fc8;
  MicroOp *local_fb8;
  MicroOp *local_fa8;
  MicroOp local_f91;
  MicroOp *local_f88;
  MicroOp local_f71;
  MicroOp *local_f68;
  MicroOp *local_f58;
  MicroOp *local_f48;
  MicroOp local_f31;
  MicroOp *local_f28;
  MicroOp *local_f18;
  MicroOp *local_f00;
  InstructionList code_50;
  InstructionList code_49;
  InstructionList code_48;
  InstructionList code_47;
  InstructionList code_46;
  int c_7;
  InstructionList code_45;
  int c_6;
  InstructionList code_44;
  int location_2;
  InstructionList code_43;
  int location_1;
  InstructionList code_42;
  int c_5;
  InstructionList code_41;
  int c_4;
  InstructionList code_40;
  int location;
  InstructionList code_39;
  InstructionList code_38;
  InstructionList code_37;
  InstructionList code_36;
  InstructionList code_35;
  InstructionList code_34;
  InstructionList code_33;
  InstructionList code_32;
  InstructionList code_31;
  InstructionList code_30;
  InstructionList code_29;
  InstructionList code_28;
  InstructionList code_27;
  InstructionList code_26;
  InstructionList code_25;
  InstructionList code_24;
  InstructionList code_23;
  InstructionList code_22;
  InstructionList code_21;
  InstructionList code_20;
  InstructionList code_19;
  InstructionList code_18;
  InstructionList code_17;
  InstructionList code_16;
  InstructionList code_15;
  InstructionList code_14;
  InstructionList code_13;
  InstructionList code_12;
  InstructionList code_11;
  InstructionList code_10;
  InstructionList code_9;
  InstructionList code_8;
  int c_3;
  InstructionList code_7;
  int c_2;
  InstructionList code_6;
  int c_1;
  InstructionList code_5;
  int c;
  InstructionList code_4;
  InstructionList code_3;
  InstructionList code_2;
  InstructionList code_1;
  InstructionList code;
  InstructionList operations_6502 [263];
  Personality personality_local;
  ProcessorStorage *this_local;
  
  this->scheduled_program_counter_ = (MicroOp *)0x0;
  this->s_ = '\0';
  operations_6502[0x106]._4_4_ = personality;
  unique0x100090c9 = this;
  MOS6502Esque::LazyFlags::LazyFlags(&this->flags_);
  this->next_bus_operation_ = None;
  this->is_jammed_ = false;
  Cycles::Cycles(&this->cycles_left_to_run_);
  this->interrupt_requests_ = '\x10';
  this->ready_is_active_ = false;
  this->ready_line_is_enabled_ = false;
  this->stop_is_active_ = false;
  this->wait_is_active_ = false;
  this->irq_line_ = '\0';
  this->irq_request_history_ = '\0';
  this->nmi_line_is_enabled_ = false;
  this->set_overflow_line_is_enabled_ = false;
  code[4] = CycleIncPCPushPCH;
  code[5] = CyclePushPCL;
  code[6] = OperationBRKPickVector;
  code[7] = OperationSetOperandFromFlagsWithBRKSet;
  code[8] = CyclePushOperand;
  code[9] = OperationSetIRQFlags;
  code[10] = CycleReadVectorLow;
  code[0xb] = CycleReadVectorHigh;
  operations_6502[0][0] = OperationMoveToNextProgram;
  local_f00 = operations_6502[0] + 1;
  do {
    *local_f00 = CycleFetchOperation;
    local_f00 = local_f00 + 1;
  } while (local_f00 != operations_6502[0] + 4);
  operations_6502[0][4] = CycleIncrementPCFetchAddressLowFromOperand;
  operations_6502[0][5] = CycleAddXToOperandFetchAddressLow;
  operations_6502[0][6] = CycleIncrementOperandFetchAddressHigh;
  operations_6502[0][7] = CycleFetchOperandFromAddress;
  operations_6502[0][8] = OperationORA;
  operations_6502[0][9] = OperationMoveToNextProgram;
  local_f18 = operations_6502[0] + 10;
  do {
    *local_f18 = CycleFetchOperation;
    local_f18 = local_f18 + 1;
  } while (local_f18 != operations_6502[1] + 4);
  operations_6502[1][4] = CycleFetchOperand;
  operations_6502[1][5] = OperationScheduleJam;
  local_f28 = operations_6502[1] + 6;
  do {
    *local_f28 = CycleFetchOperation;
    local_f28 = local_f28 + 1;
  } while (local_f28 != operations_6502[2] + 4);
  operations_6502[2][4] = CycleIncrementPCFetchAddressLowFromOperand;
  operations_6502[2][5] = CycleAddXToOperandFetchAddressLow;
  operations_6502[2][6] = CycleIncrementOperandFetchAddressHigh;
  operations_6502[2][7] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_f31 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_f31 = CycleWriteOperandToAddress;
  }
  operations_6502[2][8] = local_f31;
  operations_6502[2][9] = OperationASO;
  operations_6502[2][10] = CycleWriteOperandToAddress;
  operations_6502[2][0xb] = OperationMoveToNextProgram;
  local_f48 = operations_6502[3];
  do {
    *local_f48 = CycleFetchOperation;
    local_f48 = local_f48 + 1;
  } while (local_f48 != operations_6502[3] + 4);
  operations_6502[3][4] = OperationLoadAddressZeroPage;
  operations_6502[3][5] = CycleFetchOperandFromAddress;
  operations_6502[3][6] = OperationMoveToNextProgram;
  local_f58 = operations_6502[3] + 7;
  do {
    *local_f58 = CycleFetchOperation;
    local_f58 = local_f58 + 1;
  } while (local_f58 != operations_6502[4] + 4);
  operations_6502[4][4] = OperationLoadAddressZeroPage;
  operations_6502[4][5] = CycleFetchOperandFromAddress;
  operations_6502[4][6] = OperationORA;
  operations_6502[4][7] = OperationMoveToNextProgram;
  local_f68 = operations_6502[4] + 8;
  do {
    *local_f68 = CycleFetchOperation;
    local_f68 = local_f68 + 1;
  } while (local_f68 != operations_6502[5] + 4);
  operations_6502[5][4] = OperationLoadAddressZeroPage;
  operations_6502[5][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_f71 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_f71 = CycleWriteOperandToAddress;
  }
  operations_6502[5][6] = local_f71;
  operations_6502[5][7] = OperationASL;
  operations_6502[5][8] = CycleWriteOperandToAddress;
  operations_6502[5][9] = OperationMoveToNextProgram;
  local_f88 = operations_6502[5] + 10;
  do {
    *local_f88 = CycleFetchOperation;
    local_f88 = local_f88 + 1;
  } while (local_f88 != operations_6502[6] + 4);
  operations_6502[6][4] = OperationLoadAddressZeroPage;
  operations_6502[6][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_f91 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_f91 = CycleWriteOperandToAddress;
  }
  operations_6502[6][6] = local_f91;
  operations_6502[6][7] = OperationASO;
  operations_6502[6][8] = CycleWriteOperandToAddress;
  operations_6502[6][9] = OperationMoveToNextProgram;
  local_fa8 = operations_6502[6] + 10;
  do {
    *local_fa8 = CycleFetchOperation;
    local_fa8 = local_fa8 + 1;
  } while (local_fa8 != operations_6502[7] + 4);
  operations_6502[7][4] = OperationSetOperandFromFlagsWithBRKSet;
  operations_6502[7][5] = CyclePushOperand;
  operations_6502[7][6] = OperationMoveToNextProgram;
  local_fb8 = operations_6502[7] + 7;
  do {
    *local_fb8 = CycleFetchOperation;
    local_fb8 = local_fb8 + 1;
  } while (local_fb8 != operations_6502[8] + 4);
  operations_6502[8][4] = OperationIncrementPC;
  operations_6502[8][5] = OperationORA;
  operations_6502[8][6] = OperationMoveToNextProgram;
  local_fc8 = operations_6502[8] + 7;
  do {
    *local_fc8 = CycleFetchOperation;
    local_fc8 = local_fc8 + 1;
  } while (local_fc8 != operations_6502[9] + 4);
  operations_6502[9][4] = OperationSTA;
  operations_6502[9][5] = OperationASL;
  operations_6502[9][6] = OperationCopyOperandToA;
  operations_6502[9][7] = OperationMoveToNextProgram;
  local_fd8 = operations_6502[9] + 8;
  do {
    *local_fd8 = CycleFetchOperation;
    local_fd8 = local_fd8 + 1;
  } while (local_fd8 != operations_6502[10] + 4);
  operations_6502[10][4] = OperationIncrementPC;
  operations_6502[10][5] = OperationANC;
  operations_6502[10][6] = OperationMoveToNextProgram;
  local_fe8 = operations_6502[10] + 7;
  do {
    *local_fe8 = CycleFetchOperation;
    local_fe8 = local_fe8 + 1;
  } while (local_fe8 != operations_6502[0xb] + 4);
  operations_6502[0xb][4] = CycleLoadAddressAbsolute;
  operations_6502[0xb][5] = CycleFetchOperandFromAddress;
  operations_6502[0xb][6] = OperationMoveToNextProgram;
  local_ff8 = operations_6502[0xb] + 7;
  do {
    *local_ff8 = CycleFetchOperation;
    local_ff8 = local_ff8 + 1;
  } while (local_ff8 != operations_6502[0xc] + 4);
  operations_6502[0xc][4] = CycleLoadAddressAbsolute;
  operations_6502[0xc][5] = CycleFetchOperandFromAddress;
  operations_6502[0xc][6] = OperationORA;
  operations_6502[0xc][7] = OperationMoveToNextProgram;
  local_1008 = operations_6502[0xc] + 8;
  do {
    *local_1008 = CycleFetchOperation;
    local_1008 = local_1008 + 1;
  } while (local_1008 != operations_6502[0xd] + 4);
  operations_6502[0xd][4] = CycleLoadAddressAbsolute;
  operations_6502[0xd][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1011 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1011 = CycleWriteOperandToAddress;
  }
  operations_6502[0xd][6] = local_1011;
  operations_6502[0xd][7] = OperationASL;
  operations_6502[0xd][8] = CycleWriteOperandToAddress;
  operations_6502[0xd][9] = OperationMoveToNextProgram;
  local_1028 = operations_6502[0xd] + 10;
  do {
    *local_1028 = CycleFetchOperation;
    local_1028 = local_1028 + 1;
  } while (local_1028 != operations_6502[0xe] + 4);
  operations_6502[0xe][4] = CycleLoadAddressAbsolute;
  operations_6502[0xe][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1031 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1031 = CycleWriteOperandToAddress;
  }
  operations_6502[0xe][6] = local_1031;
  operations_6502[0xe][7] = OperationASO;
  operations_6502[0xe][8] = CycleWriteOperandToAddress;
  operations_6502[0xe][9] = OperationMoveToNextProgram;
  local_1048 = operations_6502[0xe] + 10;
  do {
    *local_1048 = CycleFetchOperation;
    local_1048 = local_1048 + 1;
  } while (local_1048 != operations_6502[0xf] + 4);
  operations_6502[0xf][4] = OperationBPL;
  operations_6502[0xf][5] = OperationMoveToNextProgram;
  local_1058 = operations_6502[0xf] + 6;
  do {
    *local_1058 = CycleFetchOperation;
    local_1058 = local_1058 + 1;
  } while (local_1058 != operations_6502[0x10] + 4);
  operations_6502[0x10][4] = CycleIncrementPCFetchAddressLowFromOperand;
  operations_6502[0x10][5] = CycleIncrementOperandFetchAddressHigh;
  operations_6502[0x10][6] = CycleAddYToAddressLow;
  operations_6502[0x10][7] = OperationCorrectAddressHigh;
  operations_6502[0x10][8] = CycleFetchOperandFromAddress;
  operations_6502[0x10][9] = OperationORA;
  operations_6502[0x10][10] = OperationMoveToNextProgram;
  local_1068 = operations_6502[0x10] + 0xb;
  do {
    *local_1068 = CycleFetchOperation;
    local_1068 = local_1068 + 1;
  } while (local_1068 != operations_6502[0x11] + 4);
  operations_6502[0x11][4] = CycleFetchOperand;
  operations_6502[0x11][5] = OperationScheduleJam;
  local_1078 = operations_6502[0x11] + 6;
  do {
    *local_1078 = CycleFetchOperation;
    local_1078 = local_1078 + 1;
  } while (local_1078 != operations_6502[0x12] + 4);
  operations_6502[0x12][4] = CycleIncrementPCFetchAddressLowFromOperand;
  operations_6502[0x12][5] = CycleIncrementOperandFetchAddressHigh;
  operations_6502[0x12][6] = CycleAddYToAddressLowRead;
  operations_6502[0x12][7] = OperationCorrectAddressHigh;
  operations_6502[0x12][8] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1081 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1081 = CycleWriteOperandToAddress;
  }
  operations_6502[0x12][9] = local_1081;
  operations_6502[0x12][10] = OperationASO;
  operations_6502[0x12][0xb] = CycleWriteOperandToAddress;
  operations_6502[0x13][0] = OperationMoveToNextProgram;
  local_1098 = operations_6502[0x13] + 1;
  do {
    *local_1098 = CycleFetchOperation;
    local_1098 = local_1098 + 1;
  } while (local_1098 != operations_6502[0x13] + 4);
  operations_6502[0x13][4] = CycleLoadAddessZeroX;
  operations_6502[0x13][5] = CycleFetchOperandFromAddress;
  operations_6502[0x13][6] = OperationMoveToNextProgram;
  local_10a8 = operations_6502[0x13] + 7;
  do {
    *local_10a8 = CycleFetchOperation;
    local_10a8 = local_10a8 + 1;
  } while (local_10a8 != operations_6502[0x14] + 4);
  operations_6502[0x14][4] = CycleLoadAddessZeroX;
  operations_6502[0x14][5] = CycleFetchOperandFromAddress;
  operations_6502[0x14][6] = OperationORA;
  operations_6502[0x14][7] = OperationMoveToNextProgram;
  local_10b8 = operations_6502[0x14] + 8;
  do {
    *local_10b8 = CycleFetchOperation;
    local_10b8 = local_10b8 + 1;
  } while (local_10b8 != operations_6502[0x15] + 4);
  operations_6502[0x15][4] = CycleLoadAddessZeroX;
  operations_6502[0x15][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_10c1 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_10c1 = CycleWriteOperandToAddress;
  }
  operations_6502[0x15][6] = local_10c1;
  operations_6502[0x15][7] = OperationASL;
  operations_6502[0x15][8] = CycleWriteOperandToAddress;
  operations_6502[0x15][9] = OperationMoveToNextProgram;
  local_10d8 = operations_6502[0x15] + 10;
  do {
    *local_10d8 = CycleFetchOperation;
    local_10d8 = local_10d8 + 1;
  } while (local_10d8 != operations_6502[0x16] + 4);
  operations_6502[0x16][4] = CycleLoadAddessZeroX;
  operations_6502[0x16][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_10e1 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_10e1 = CycleWriteOperandToAddress;
  }
  operations_6502[0x16][6] = local_10e1;
  operations_6502[0x16][7] = OperationASO;
  operations_6502[0x16][8] = CycleWriteOperandToAddress;
  operations_6502[0x16][9] = OperationMoveToNextProgram;
  local_10f8 = operations_6502[0x16] + 10;
  do {
    *local_10f8 = CycleFetchOperation;
    local_10f8 = local_10f8 + 1;
  } while (local_10f8 != operations_6502[0x17] + 4);
  operations_6502[0x17][4] = OperationCLC;
  operations_6502[0x17][5] = OperationMoveToNextProgram;
  local_1108 = operations_6502[0x17] + 6;
  do {
    *local_1108 = CycleFetchOperation;
    local_1108 = local_1108 + 1;
  } while (local_1108 != operations_6502[0x18] + 4);
  operations_6502[0x18][4] = CycleLoadAddressAbsolute;
  operations_6502[0x18][5] = CycleAddYToAddressLow;
  operations_6502[0x18][6] = OperationCorrectAddressHigh;
  operations_6502[0x18][7] = CycleFetchOperandFromAddress;
  operations_6502[0x18][8] = OperationORA;
  operations_6502[0x18][9] = OperationMoveToNextProgram;
  local_1118 = operations_6502[0x18] + 10;
  do {
    *local_1118 = CycleFetchOperation;
    local_1118 = local_1118 + 1;
  } while (local_1118 != operations_6502[0x19] + 4);
  operations_6502[0x19][4] = OperationMoveToNextProgram;
  local_1128 = operations_6502[0x19] + 5;
  do {
    *local_1128 = CycleFetchOperation;
    local_1128 = local_1128 + 1;
  } while (local_1128 != operations_6502[0x1a] + 4);
  operations_6502[0x1a][4] = CycleLoadAddressAbsolute;
  operations_6502[0x1a][5] = CycleAddYToAddressLowRead;
  operations_6502[0x1a][6] = OperationCorrectAddressHigh;
  operations_6502[0x1a][7] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1131 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1131 = CycleWriteOperandToAddress;
  }
  operations_6502[0x1a][8] = local_1131;
  operations_6502[0x1a][9] = OperationASO;
  operations_6502[0x1a][10] = CycleWriteOperandToAddress;
  operations_6502[0x1a][0xb] = OperationMoveToNextProgram;
  local_1148 = operations_6502[0x1b];
  do {
    *local_1148 = CycleFetchOperation;
    local_1148 = local_1148 + 1;
  } while (local_1148 != operations_6502[0x1b] + 4);
  operations_6502[0x1b][4] = CycleLoadAddressAbsolute;
  operations_6502[0x1b][5] = CycleAddXToAddressLow;
  operations_6502[0x1b][6] = OperationCorrectAddressHigh;
  operations_6502[0x1b][7] = CycleFetchOperandFromAddress;
  operations_6502[0x1b][8] = OperationMoveToNextProgram;
  local_1158 = operations_6502[0x1b] + 9;
  do {
    *local_1158 = CycleFetchOperation;
    local_1158 = local_1158 + 1;
  } while (local_1158 != operations_6502[0x1c] + 4);
  operations_6502[0x1c][4] = CycleLoadAddressAbsolute;
  operations_6502[0x1c][5] = CycleAddXToAddressLow;
  operations_6502[0x1c][6] = OperationCorrectAddressHigh;
  operations_6502[0x1c][7] = CycleFetchOperandFromAddress;
  operations_6502[0x1c][8] = OperationORA;
  operations_6502[0x1c][9] = OperationMoveToNextProgram;
  local_1168 = operations_6502[0x1c] + 10;
  do {
    *local_1168 = CycleFetchOperation;
    local_1168 = local_1168 + 1;
  } while (local_1168 != operations_6502[0x1d] + 4);
  operations_6502[0x1d][4] = CycleLoadAddressAbsolute;
  operations_6502[0x1d][5] = CycleAddXToAddressLowRead;
  operations_6502[0x1d][6] = OperationCorrectAddressHigh;
  operations_6502[0x1d][7] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1171 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1171 = CycleWriteOperandToAddress;
  }
  operations_6502[0x1d][8] = local_1171;
  operations_6502[0x1d][9] = OperationASL;
  operations_6502[0x1d][10] = CycleWriteOperandToAddress;
  operations_6502[0x1d][0xb] = OperationMoveToNextProgram;
  local_1188 = operations_6502[0x1e];
  do {
    *local_1188 = CycleFetchOperation;
    local_1188 = local_1188 + 1;
  } while (local_1188 != operations_6502[0x1e] + 4);
  operations_6502[0x1e][4] = CycleLoadAddressAbsolute;
  operations_6502[0x1e][5] = CycleAddXToAddressLowRead;
  operations_6502[0x1e][6] = OperationCorrectAddressHigh;
  operations_6502[0x1e][7] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1191 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1191 = CycleWriteOperandToAddress;
  }
  operations_6502[0x1e][8] = local_1191;
  operations_6502[0x1e][9] = OperationASO;
  operations_6502[0x1e][10] = CycleWriteOperandToAddress;
  operations_6502[0x1e][0xb] = OperationMoveToNextProgram;
  local_11a8 = operations_6502[0x1f];
  do {
    *local_11a8 = CycleFetchOperation;
    local_11a8 = local_11a8 + 1;
  } while (local_11a8 != operations_6502[0x1f] + 4);
  operations_6502[0x1f][4] = CycleIncrementPCAndReadStack;
  operations_6502[0x1f][5] = CyclePushPCH;
  operations_6502[0x1f][6] = CyclePushPCL;
  operations_6502[0x1f][7] = CycleReadPCHLoadPCL;
  operations_6502[0x1f][8] = OperationMoveToNextProgram;
  local_11b8 = operations_6502[0x1f] + 9;
  do {
    *local_11b8 = CycleFetchOperation;
    local_11b8 = local_11b8 + 1;
  } while (local_11b8 != operations_6502[0x20] + 4);
  operations_6502[0x20][4] = CycleIncrementPCFetchAddressLowFromOperand;
  operations_6502[0x20][5] = CycleAddXToOperandFetchAddressLow;
  operations_6502[0x20][6] = CycleIncrementOperandFetchAddressHigh;
  operations_6502[0x20][7] = CycleFetchOperandFromAddress;
  operations_6502[0x20][8] = OperationAND;
  operations_6502[0x20][9] = OperationMoveToNextProgram;
  local_11c8 = operations_6502[0x20] + 10;
  do {
    *local_11c8 = CycleFetchOperation;
    local_11c8 = local_11c8 + 1;
  } while (local_11c8 != operations_6502[0x21] + 4);
  operations_6502[0x21][4] = CycleFetchOperand;
  operations_6502[0x21][5] = OperationScheduleJam;
  local_11d8 = operations_6502[0x21] + 6;
  do {
    *local_11d8 = CycleFetchOperation;
    local_11d8 = local_11d8 + 1;
  } while (local_11d8 != operations_6502[0x22] + 4);
  operations_6502[0x22][4] = CycleIncrementPCFetchAddressLowFromOperand;
  operations_6502[0x22][5] = CycleAddXToOperandFetchAddressLow;
  operations_6502[0x22][6] = CycleIncrementOperandFetchAddressHigh;
  operations_6502[0x22][7] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_11e1 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_11e1 = CycleWriteOperandToAddress;
  }
  operations_6502[0x22][8] = local_11e1;
  operations_6502[0x22][9] = OperationRLA;
  operations_6502[0x22][10] = CycleWriteOperandToAddress;
  operations_6502[0x22][0xb] = OperationMoveToNextProgram;
  local_11f8 = operations_6502[0x23];
  do {
    *local_11f8 = CycleFetchOperation;
    local_11f8 = local_11f8 + 1;
  } while (local_11f8 != operations_6502[0x23] + 4);
  operations_6502[0x23][4] = OperationLoadAddressZeroPage;
  operations_6502[0x23][5] = CycleFetchOperandFromAddress;
  operations_6502[0x23][6] = OperationBIT;
  operations_6502[0x23][7] = OperationMoveToNextProgram;
  local_1208 = operations_6502[0x23] + 8;
  do {
    *local_1208 = CycleFetchOperation;
    local_1208 = local_1208 + 1;
  } while (local_1208 != operations_6502[0x24] + 4);
  operations_6502[0x24][4] = OperationLoadAddressZeroPage;
  operations_6502[0x24][5] = CycleFetchOperandFromAddress;
  operations_6502[0x24][6] = OperationAND;
  operations_6502[0x24][7] = OperationMoveToNextProgram;
  local_1218 = operations_6502[0x24] + 8;
  do {
    *local_1218 = CycleFetchOperation;
    local_1218 = local_1218 + 1;
  } while (local_1218 != operations_6502[0x25] + 4);
  operations_6502[0x25][4] = OperationLoadAddressZeroPage;
  operations_6502[0x25][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1221 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1221 = CycleWriteOperandToAddress;
  }
  operations_6502[0x25][6] = local_1221;
  operations_6502[0x25][7] = OperationROL;
  operations_6502[0x25][8] = CycleWriteOperandToAddress;
  operations_6502[0x25][9] = OperationMoveToNextProgram;
  local_1238 = operations_6502[0x25] + 10;
  do {
    *local_1238 = CycleFetchOperation;
    local_1238 = local_1238 + 1;
  } while (local_1238 != operations_6502[0x26] + 4);
  operations_6502[0x26][4] = OperationLoadAddressZeroPage;
  operations_6502[0x26][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1241 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1241 = CycleWriteOperandToAddress;
  }
  operations_6502[0x26][6] = local_1241;
  operations_6502[0x26][7] = OperationRLA;
  operations_6502[0x26][8] = CycleWriteOperandToAddress;
  operations_6502[0x26][9] = OperationMoveToNextProgram;
  local_1258 = operations_6502[0x26] + 10;
  do {
    *local_1258 = CycleFetchOperation;
    local_1258 = local_1258 + 1;
  } while (local_1258 != operations_6502[0x27] + 4);
  operations_6502[0x27][4] = CycleReadFromS;
  operations_6502[0x27][5] = CyclePullOperand;
  operations_6502[0x27][6] = OperationSetFlagsFromOperand;
  operations_6502[0x27][7] = OperationMoveToNextProgram;
  local_1268 = operations_6502[0x27] + 8;
  do {
    *local_1268 = CycleFetchOperation;
    local_1268 = local_1268 + 1;
  } while (local_1268 != operations_6502[0x28] + 4);
  operations_6502[0x28][4] = OperationIncrementPC;
  operations_6502[0x28][5] = OperationAND;
  operations_6502[0x28][6] = OperationMoveToNextProgram;
  local_1278 = operations_6502[0x28] + 7;
  do {
    *local_1278 = CycleFetchOperation;
    local_1278 = local_1278 + 1;
  } while (local_1278 != operations_6502[0x29] + 4);
  operations_6502[0x29][4] = OperationSTA;
  operations_6502[0x29][5] = OperationROL;
  operations_6502[0x29][6] = OperationCopyOperandToA;
  operations_6502[0x29][7] = OperationMoveToNextProgram;
  local_1288 = operations_6502[0x29] + 8;
  do {
    *local_1288 = CycleFetchOperation;
    local_1288 = local_1288 + 1;
  } while (local_1288 != operations_6502[0x2a] + 4);
  operations_6502[0x2a][4] = OperationIncrementPC;
  operations_6502[0x2a][5] = OperationANC;
  operations_6502[0x2a][6] = OperationMoveToNextProgram;
  local_1298 = operations_6502[0x2a] + 7;
  do {
    *local_1298 = CycleFetchOperation;
    local_1298 = local_1298 + 1;
  } while (local_1298 != operations_6502[0x2b] + 4);
  operations_6502[0x2b][4] = CycleLoadAddressAbsolute;
  operations_6502[0x2b][5] = CycleFetchOperandFromAddress;
  operations_6502[0x2b][6] = OperationBIT;
  operations_6502[0x2b][7] = OperationMoveToNextProgram;
  local_12a8 = operations_6502[0x2b] + 8;
  do {
    *local_12a8 = CycleFetchOperation;
    local_12a8 = local_12a8 + 1;
  } while (local_12a8 != operations_6502[0x2c] + 4);
  operations_6502[0x2c][4] = CycleLoadAddressAbsolute;
  operations_6502[0x2c][5] = CycleFetchOperandFromAddress;
  operations_6502[0x2c][6] = OperationAND;
  operations_6502[0x2c][7] = OperationMoveToNextProgram;
  local_12b8 = operations_6502[0x2c] + 8;
  do {
    *local_12b8 = CycleFetchOperation;
    local_12b8 = local_12b8 + 1;
  } while (local_12b8 != operations_6502[0x2d] + 4);
  operations_6502[0x2d][4] = CycleLoadAddressAbsolute;
  operations_6502[0x2d][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_12c1 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_12c1 = CycleWriteOperandToAddress;
  }
  operations_6502[0x2d][6] = local_12c1;
  operations_6502[0x2d][7] = OperationROL;
  operations_6502[0x2d][8] = CycleWriteOperandToAddress;
  operations_6502[0x2d][9] = OperationMoveToNextProgram;
  local_12d8 = operations_6502[0x2d] + 10;
  do {
    *local_12d8 = CycleFetchOperation;
    local_12d8 = local_12d8 + 1;
  } while (local_12d8 != operations_6502[0x2e] + 4);
  operations_6502[0x2e][4] = CycleLoadAddressAbsolute;
  operations_6502[0x2e][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_12e1 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_12e1 = CycleWriteOperandToAddress;
  }
  operations_6502[0x2e][6] = local_12e1;
  operations_6502[0x2e][7] = OperationRLA;
  operations_6502[0x2e][8] = CycleWriteOperandToAddress;
  operations_6502[0x2e][9] = OperationMoveToNextProgram;
  local_12f8 = operations_6502[0x2e] + 10;
  do {
    *local_12f8 = CycleFetchOperation;
    local_12f8 = local_12f8 + 1;
  } while (local_12f8 != operations_6502[0x2f] + 4);
  operations_6502[0x2f][4] = OperationBMI;
  operations_6502[0x2f][5] = OperationMoveToNextProgram;
  local_1308 = operations_6502[0x2f] + 6;
  do {
    *local_1308 = CycleFetchOperation;
    local_1308 = local_1308 + 1;
  } while (local_1308 != operations_6502[0x30] + 4);
  operations_6502[0x30][4] = CycleIncrementPCFetchAddressLowFromOperand;
  operations_6502[0x30][5] = CycleIncrementOperandFetchAddressHigh;
  operations_6502[0x30][6] = CycleAddYToAddressLow;
  operations_6502[0x30][7] = OperationCorrectAddressHigh;
  operations_6502[0x30][8] = CycleFetchOperandFromAddress;
  operations_6502[0x30][9] = OperationAND;
  operations_6502[0x30][10] = OperationMoveToNextProgram;
  local_1318 = operations_6502[0x30] + 0xb;
  do {
    *local_1318 = CycleFetchOperation;
    local_1318 = local_1318 + 1;
  } while (local_1318 != operations_6502[0x31] + 4);
  operations_6502[0x31][4] = CycleFetchOperand;
  operations_6502[0x31][5] = OperationScheduleJam;
  local_1328 = operations_6502[0x31] + 6;
  do {
    *local_1328 = CycleFetchOperation;
    local_1328 = local_1328 + 1;
  } while (local_1328 != operations_6502[0x32] + 4);
  operations_6502[0x32][4] = CycleIncrementPCFetchAddressLowFromOperand;
  operations_6502[0x32][5] = CycleIncrementOperandFetchAddressHigh;
  operations_6502[0x32][6] = CycleAddYToAddressLowRead;
  operations_6502[0x32][7] = OperationCorrectAddressHigh;
  operations_6502[0x32][8] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1331 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1331 = CycleWriteOperandToAddress;
  }
  operations_6502[0x32][9] = local_1331;
  operations_6502[0x32][10] = OperationRLA;
  operations_6502[0x32][0xb] = CycleWriteOperandToAddress;
  operations_6502[0x33][0] = OperationMoveToNextProgram;
  local_1348 = operations_6502[0x33] + 1;
  do {
    *local_1348 = CycleFetchOperation;
    local_1348 = local_1348 + 1;
  } while (local_1348 != operations_6502[0x33] + 4);
  operations_6502[0x33][4] = CycleLoadAddessZeroX;
  operations_6502[0x33][5] = CycleFetchOperandFromAddress;
  operations_6502[0x33][6] = OperationMoveToNextProgram;
  local_1358 = operations_6502[0x33] + 7;
  do {
    *local_1358 = CycleFetchOperation;
    local_1358 = local_1358 + 1;
  } while (local_1358 != operations_6502[0x34] + 4);
  operations_6502[0x34][4] = CycleLoadAddessZeroX;
  operations_6502[0x34][5] = CycleFetchOperandFromAddress;
  operations_6502[0x34][6] = OperationAND;
  operations_6502[0x34][7] = OperationMoveToNextProgram;
  local_1368 = operations_6502[0x34] + 8;
  do {
    *local_1368 = CycleFetchOperation;
    local_1368 = local_1368 + 1;
  } while (local_1368 != operations_6502[0x35] + 4);
  operations_6502[0x35][4] = CycleLoadAddessZeroX;
  operations_6502[0x35][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1371 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1371 = CycleWriteOperandToAddress;
  }
  operations_6502[0x35][6] = local_1371;
  operations_6502[0x35][7] = OperationROL;
  operations_6502[0x35][8] = CycleWriteOperandToAddress;
  operations_6502[0x35][9] = OperationMoveToNextProgram;
  local_1388 = operations_6502[0x35] + 10;
  do {
    *local_1388 = CycleFetchOperation;
    local_1388 = local_1388 + 1;
  } while (local_1388 != operations_6502[0x36] + 4);
  operations_6502[0x36][4] = CycleLoadAddessZeroX;
  operations_6502[0x36][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1391 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1391 = CycleWriteOperandToAddress;
  }
  operations_6502[0x36][6] = local_1391;
  operations_6502[0x36][7] = OperationRLA;
  operations_6502[0x36][8] = CycleWriteOperandToAddress;
  operations_6502[0x36][9] = OperationMoveToNextProgram;
  local_13a8 = operations_6502[0x36] + 10;
  do {
    *local_13a8 = CycleFetchOperation;
    local_13a8 = local_13a8 + 1;
  } while (local_13a8 != operations_6502[0x37] + 4);
  operations_6502[0x37][4] = OperationSEC;
  operations_6502[0x37][5] = OperationMoveToNextProgram;
  local_13b8 = operations_6502[0x37] + 6;
  do {
    *local_13b8 = CycleFetchOperation;
    local_13b8 = local_13b8 + 1;
  } while (local_13b8 != operations_6502[0x38] + 4);
  operations_6502[0x38][4] = CycleLoadAddressAbsolute;
  operations_6502[0x38][5] = CycleAddYToAddressLow;
  operations_6502[0x38][6] = OperationCorrectAddressHigh;
  operations_6502[0x38][7] = CycleFetchOperandFromAddress;
  operations_6502[0x38][8] = OperationAND;
  operations_6502[0x38][9] = OperationMoveToNextProgram;
  local_13c8 = operations_6502[0x38] + 10;
  do {
    *local_13c8 = CycleFetchOperation;
    local_13c8 = local_13c8 + 1;
  } while (local_13c8 != operations_6502[0x39] + 4);
  operations_6502[0x39][4] = OperationMoveToNextProgram;
  local_13d8 = operations_6502[0x39] + 5;
  do {
    *local_13d8 = CycleFetchOperation;
    local_13d8 = local_13d8 + 1;
  } while (local_13d8 != operations_6502[0x3a] + 4);
  operations_6502[0x3a][4] = CycleLoadAddressAbsolute;
  operations_6502[0x3a][5] = CycleAddYToAddressLowRead;
  operations_6502[0x3a][6] = OperationCorrectAddressHigh;
  operations_6502[0x3a][7] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_13e1 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_13e1 = CycleWriteOperandToAddress;
  }
  operations_6502[0x3a][8] = local_13e1;
  operations_6502[0x3a][9] = OperationRLA;
  operations_6502[0x3a][10] = CycleWriteOperandToAddress;
  operations_6502[0x3a][0xb] = OperationMoveToNextProgram;
  local_13f8 = operations_6502[0x3b];
  do {
    *local_13f8 = CycleFetchOperation;
    local_13f8 = local_13f8 + 1;
  } while (local_13f8 != operations_6502[0x3b] + 4);
  operations_6502[0x3b][4] = CycleLoadAddressAbsolute;
  operations_6502[0x3b][5] = CycleAddXToAddressLow;
  operations_6502[0x3b][6] = OperationCorrectAddressHigh;
  operations_6502[0x3b][7] = CycleFetchOperandFromAddress;
  operations_6502[0x3b][8] = OperationMoveToNextProgram;
  local_1408 = operations_6502[0x3b] + 9;
  do {
    *local_1408 = CycleFetchOperation;
    local_1408 = local_1408 + 1;
  } while (local_1408 != operations_6502[0x3c] + 4);
  operations_6502[0x3c][4] = CycleLoadAddressAbsolute;
  operations_6502[0x3c][5] = CycleAddXToAddressLow;
  operations_6502[0x3c][6] = OperationCorrectAddressHigh;
  operations_6502[0x3c][7] = CycleFetchOperandFromAddress;
  operations_6502[0x3c][8] = OperationAND;
  operations_6502[0x3c][9] = OperationMoveToNextProgram;
  local_1418 = operations_6502[0x3c] + 10;
  do {
    *local_1418 = CycleFetchOperation;
    local_1418 = local_1418 + 1;
  } while (local_1418 != operations_6502[0x3d] + 4);
  operations_6502[0x3d][4] = CycleLoadAddressAbsolute;
  operations_6502[0x3d][5] = CycleAddXToAddressLowRead;
  operations_6502[0x3d][6] = OperationCorrectAddressHigh;
  operations_6502[0x3d][7] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1421 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1421 = CycleWriteOperandToAddress;
  }
  operations_6502[0x3d][8] = local_1421;
  operations_6502[0x3d][9] = OperationROL;
  operations_6502[0x3d][10] = CycleWriteOperandToAddress;
  operations_6502[0x3d][0xb] = OperationMoveToNextProgram;
  local_1438 = operations_6502[0x3e];
  do {
    *local_1438 = CycleFetchOperation;
    local_1438 = local_1438 + 1;
  } while (local_1438 != operations_6502[0x3e] + 4);
  operations_6502[0x3e][4] = CycleLoadAddressAbsolute;
  operations_6502[0x3e][5] = CycleAddXToAddressLowRead;
  operations_6502[0x3e][6] = OperationCorrectAddressHigh;
  operations_6502[0x3e][7] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1441 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1441 = CycleWriteOperandToAddress;
  }
  operations_6502[0x3e][8] = local_1441;
  operations_6502[0x3e][9] = OperationRLA;
  operations_6502[0x3e][10] = CycleWriteOperandToAddress;
  operations_6502[0x3e][0xb] = OperationMoveToNextProgram;
  local_1458 = operations_6502[0x3f];
  do {
    *local_1458 = CycleFetchOperation;
    local_1458 = local_1458 + 1;
  } while (local_1458 != operations_6502[0x3f] + 4);
  operations_6502[0x3f][4] = CycleReadFromS;
  operations_6502[0x3f][5] = CyclePullOperand;
  operations_6502[0x3f][6] = OperationSetFlagsFromOperand;
  operations_6502[0x3f][7] = CyclePullPCL;
  operations_6502[0x3f][8] = CyclePullPCH;
  operations_6502[0x3f][9] = OperationMoveToNextProgram;
  local_1468 = operations_6502[0x3f] + 10;
  do {
    *local_1468 = CycleFetchOperation;
    local_1468 = local_1468 + 1;
  } while (local_1468 != operations_6502[0x40] + 4);
  operations_6502[0x40][4] = CycleIncrementPCFetchAddressLowFromOperand;
  operations_6502[0x40][5] = CycleAddXToOperandFetchAddressLow;
  operations_6502[0x40][6] = CycleIncrementOperandFetchAddressHigh;
  operations_6502[0x40][7] = CycleFetchOperandFromAddress;
  operations_6502[0x40][8] = OperationEOR;
  operations_6502[0x40][9] = OperationMoveToNextProgram;
  local_1478 = operations_6502[0x40] + 10;
  do {
    *local_1478 = CycleFetchOperation;
    local_1478 = local_1478 + 1;
  } while (local_1478 != operations_6502[0x41] + 4);
  operations_6502[0x41][4] = CycleFetchOperand;
  operations_6502[0x41][5] = OperationScheduleJam;
  local_1488 = operations_6502[0x41] + 6;
  do {
    *local_1488 = CycleFetchOperation;
    local_1488 = local_1488 + 1;
  } while (local_1488 != operations_6502[0x42] + 4);
  operations_6502[0x42][4] = CycleIncrementPCFetchAddressLowFromOperand;
  operations_6502[0x42][5] = CycleAddXToOperandFetchAddressLow;
  operations_6502[0x42][6] = CycleIncrementOperandFetchAddressHigh;
  operations_6502[0x42][7] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1491 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1491 = CycleWriteOperandToAddress;
  }
  operations_6502[0x42][8] = local_1491;
  operations_6502[0x42][9] = OperationLSE;
  operations_6502[0x42][10] = CycleWriteOperandToAddress;
  operations_6502[0x42][0xb] = OperationMoveToNextProgram;
  local_14a8 = operations_6502[0x43];
  do {
    *local_14a8 = CycleFetchOperation;
    local_14a8 = local_14a8 + 1;
  } while (local_14a8 != operations_6502[0x43] + 4);
  operations_6502[0x43][4] = OperationLoadAddressZeroPage;
  operations_6502[0x43][5] = CycleFetchOperandFromAddress;
  operations_6502[0x43][6] = OperationMoveToNextProgram;
  local_14b8 = operations_6502[0x43] + 7;
  do {
    *local_14b8 = CycleFetchOperation;
    local_14b8 = local_14b8 + 1;
  } while (local_14b8 != operations_6502[0x44] + 4);
  operations_6502[0x44][4] = OperationLoadAddressZeroPage;
  operations_6502[0x44][5] = CycleFetchOperandFromAddress;
  operations_6502[0x44][6] = OperationEOR;
  operations_6502[0x44][7] = OperationMoveToNextProgram;
  local_14c8 = operations_6502[0x44] + 8;
  do {
    *local_14c8 = CycleFetchOperation;
    local_14c8 = local_14c8 + 1;
  } while (local_14c8 != operations_6502[0x45] + 4);
  operations_6502[0x45][4] = OperationLoadAddressZeroPage;
  operations_6502[0x45][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_14d1 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_14d1 = CycleWriteOperandToAddress;
  }
  operations_6502[0x45][6] = local_14d1;
  operations_6502[0x45][7] = OperationLSR;
  operations_6502[0x45][8] = CycleWriteOperandToAddress;
  operations_6502[0x45][9] = OperationMoveToNextProgram;
  local_14e8 = operations_6502[0x45] + 10;
  do {
    *local_14e8 = CycleFetchOperation;
    local_14e8 = local_14e8 + 1;
  } while (local_14e8 != operations_6502[0x46] + 4);
  operations_6502[0x46][4] = OperationLoadAddressZeroPage;
  operations_6502[0x46][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_14f1 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_14f1 = CycleWriteOperandToAddress;
  }
  operations_6502[0x46][6] = local_14f1;
  operations_6502[0x46][7] = OperationLSE;
  operations_6502[0x46][8] = CycleWriteOperandToAddress;
  operations_6502[0x46][9] = OperationMoveToNextProgram;
  local_1508 = operations_6502[0x46] + 10;
  do {
    *local_1508 = CycleFetchOperation;
    local_1508 = local_1508 + 1;
  } while (local_1508 != operations_6502[0x47] + 4);
  operations_6502[0x47][4] = CyclePushA;
  operations_6502[0x47][5] = OperationMoveToNextProgram;
  local_1518 = operations_6502[0x47] + 6;
  do {
    *local_1518 = CycleFetchOperation;
    local_1518 = local_1518 + 1;
  } while (local_1518 != operations_6502[0x48] + 4);
  operations_6502[0x48][4] = OperationIncrementPC;
  operations_6502[0x48][5] = OperationEOR;
  operations_6502[0x48][6] = OperationMoveToNextProgram;
  local_1528 = operations_6502[0x48] + 7;
  do {
    *local_1528 = CycleFetchOperation;
    local_1528 = local_1528 + 1;
  } while (local_1528 != operations_6502[0x49] + 4);
  operations_6502[0x49][4] = OperationSTA;
  operations_6502[0x49][5] = OperationLSR;
  operations_6502[0x49][6] = OperationCopyOperandToA;
  operations_6502[0x49][7] = OperationMoveToNextProgram;
  local_1538 = operations_6502[0x49] + 8;
  do {
    *local_1538 = CycleFetchOperation;
    local_1538 = local_1538 + 1;
  } while (local_1538 != operations_6502[0x4a] + 4);
  operations_6502[0x4a][4] = OperationIncrementPC;
  operations_6502[0x4a][5] = OperationASR;
  operations_6502[0x4a][6] = OperationMoveToNextProgram;
  local_1548 = operations_6502[0x4a] + 7;
  do {
    *local_1548 = CycleFetchOperation;
    local_1548 = local_1548 + 1;
  } while (local_1548 != operations_6502[0x4b] + 4);
  operations_6502[0x4b][4] = CycleIncrementPCReadPCHLoadPCL;
  operations_6502[0x4b][5] = OperationMoveToNextProgram;
  local_1558 = operations_6502[0x4b] + 6;
  do {
    *local_1558 = CycleFetchOperation;
    local_1558 = local_1558 + 1;
  } while (local_1558 != operations_6502[0x4c] + 4);
  operations_6502[0x4c][4] = CycleLoadAddressAbsolute;
  operations_6502[0x4c][5] = CycleFetchOperandFromAddress;
  operations_6502[0x4c][6] = OperationEOR;
  operations_6502[0x4c][7] = OperationMoveToNextProgram;
  local_1568 = operations_6502[0x4c] + 8;
  do {
    *local_1568 = CycleFetchOperation;
    local_1568 = local_1568 + 1;
  } while (local_1568 != operations_6502[0x4d] + 4);
  operations_6502[0x4d][4] = CycleLoadAddressAbsolute;
  operations_6502[0x4d][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1571 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1571 = CycleWriteOperandToAddress;
  }
  operations_6502[0x4d][6] = local_1571;
  operations_6502[0x4d][7] = OperationLSR;
  operations_6502[0x4d][8] = CycleWriteOperandToAddress;
  operations_6502[0x4d][9] = OperationMoveToNextProgram;
  local_1588 = operations_6502[0x4d] + 10;
  do {
    *local_1588 = CycleFetchOperation;
    local_1588 = local_1588 + 1;
  } while (local_1588 != operations_6502[0x4e] + 4);
  operations_6502[0x4e][4] = CycleLoadAddressAbsolute;
  operations_6502[0x4e][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1591 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1591 = CycleWriteOperandToAddress;
  }
  operations_6502[0x4e][6] = local_1591;
  operations_6502[0x4e][7] = OperationLSE;
  operations_6502[0x4e][8] = CycleWriteOperandToAddress;
  operations_6502[0x4e][9] = OperationMoveToNextProgram;
  local_15a8 = operations_6502[0x4e] + 10;
  do {
    *local_15a8 = CycleFetchOperation;
    local_15a8 = local_15a8 + 1;
  } while (local_15a8 != operations_6502[0x4f] + 4);
  operations_6502[0x4f][4] = OperationBVC;
  operations_6502[0x4f][5] = OperationMoveToNextProgram;
  local_15b8 = operations_6502[0x4f] + 6;
  do {
    *local_15b8 = CycleFetchOperation;
    local_15b8 = local_15b8 + 1;
  } while (local_15b8 != operations_6502[0x50] + 4);
  operations_6502[0x50][4] = CycleIncrementPCFetchAddressLowFromOperand;
  operations_6502[0x50][5] = CycleIncrementOperandFetchAddressHigh;
  operations_6502[0x50][6] = CycleAddYToAddressLow;
  operations_6502[0x50][7] = OperationCorrectAddressHigh;
  operations_6502[0x50][8] = CycleFetchOperandFromAddress;
  operations_6502[0x50][9] = OperationEOR;
  operations_6502[0x50][10] = OperationMoveToNextProgram;
  local_15c8 = operations_6502[0x50] + 0xb;
  do {
    *local_15c8 = CycleFetchOperation;
    local_15c8 = local_15c8 + 1;
  } while (local_15c8 != operations_6502[0x51] + 4);
  operations_6502[0x51][4] = CycleFetchOperand;
  operations_6502[0x51][5] = OperationScheduleJam;
  local_15d8 = operations_6502[0x51] + 6;
  do {
    *local_15d8 = CycleFetchOperation;
    local_15d8 = local_15d8 + 1;
  } while (local_15d8 != operations_6502[0x52] + 4);
  operations_6502[0x52][4] = CycleIncrementPCFetchAddressLowFromOperand;
  operations_6502[0x52][5] = CycleIncrementOperandFetchAddressHigh;
  operations_6502[0x52][6] = CycleAddYToAddressLowRead;
  operations_6502[0x52][7] = OperationCorrectAddressHigh;
  operations_6502[0x52][8] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_15e1 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_15e1 = CycleWriteOperandToAddress;
  }
  operations_6502[0x52][9] = local_15e1;
  operations_6502[0x52][10] = OperationLSE;
  operations_6502[0x52][0xb] = CycleWriteOperandToAddress;
  operations_6502[0x53][0] = OperationMoveToNextProgram;
  local_15f8 = operations_6502[0x53] + 1;
  do {
    *local_15f8 = CycleFetchOperation;
    local_15f8 = local_15f8 + 1;
  } while (local_15f8 != operations_6502[0x53] + 4);
  operations_6502[0x53][4] = CycleLoadAddessZeroX;
  operations_6502[0x53][5] = CycleFetchOperandFromAddress;
  operations_6502[0x53][6] = OperationMoveToNextProgram;
  local_1608 = operations_6502[0x53] + 7;
  do {
    *local_1608 = CycleFetchOperation;
    local_1608 = local_1608 + 1;
  } while (local_1608 != operations_6502[0x54] + 4);
  operations_6502[0x54][4] = CycleLoadAddessZeroX;
  operations_6502[0x54][5] = CycleFetchOperandFromAddress;
  operations_6502[0x54][6] = OperationEOR;
  operations_6502[0x54][7] = OperationMoveToNextProgram;
  local_1618 = operations_6502[0x54] + 8;
  do {
    *local_1618 = CycleFetchOperation;
    local_1618 = local_1618 + 1;
  } while (local_1618 != operations_6502[0x55] + 4);
  operations_6502[0x55][4] = CycleLoadAddessZeroX;
  operations_6502[0x55][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1621 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1621 = CycleWriteOperandToAddress;
  }
  operations_6502[0x55][6] = local_1621;
  operations_6502[0x55][7] = OperationLSR;
  operations_6502[0x55][8] = CycleWriteOperandToAddress;
  operations_6502[0x55][9] = OperationMoveToNextProgram;
  local_1638 = operations_6502[0x55] + 10;
  do {
    *local_1638 = CycleFetchOperation;
    local_1638 = local_1638 + 1;
  } while (local_1638 != operations_6502[0x56] + 4);
  operations_6502[0x56][4] = CycleLoadAddessZeroX;
  operations_6502[0x56][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1641 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1641 = CycleWriteOperandToAddress;
  }
  operations_6502[0x56][6] = local_1641;
  operations_6502[0x56][7] = OperationLSE;
  operations_6502[0x56][8] = CycleWriteOperandToAddress;
  operations_6502[0x56][9] = OperationMoveToNextProgram;
  local_1658 = operations_6502[0x56] + 10;
  do {
    *local_1658 = CycleFetchOperation;
    local_1658 = local_1658 + 1;
  } while (local_1658 != operations_6502[0x57] + 4);
  operations_6502[0x57][4] = OperationCLI;
  operations_6502[0x57][5] = OperationMoveToNextProgram;
  local_1668 = operations_6502[0x57] + 6;
  do {
    *local_1668 = CycleFetchOperation;
    local_1668 = local_1668 + 1;
  } while (local_1668 != operations_6502[0x58] + 4);
  operations_6502[0x58][4] = CycleLoadAddressAbsolute;
  operations_6502[0x58][5] = CycleAddYToAddressLow;
  operations_6502[0x58][6] = OperationCorrectAddressHigh;
  operations_6502[0x58][7] = CycleFetchOperandFromAddress;
  operations_6502[0x58][8] = OperationEOR;
  operations_6502[0x58][9] = OperationMoveToNextProgram;
  local_1678 = operations_6502[0x58] + 10;
  do {
    *local_1678 = CycleFetchOperation;
    local_1678 = local_1678 + 1;
  } while (local_1678 != operations_6502[0x59] + 4);
  operations_6502[0x59][4] = OperationMoveToNextProgram;
  local_1688 = operations_6502[0x59] + 5;
  do {
    *local_1688 = CycleFetchOperation;
    local_1688 = local_1688 + 1;
  } while (local_1688 != operations_6502[0x5a] + 4);
  operations_6502[0x5a][4] = CycleLoadAddressAbsolute;
  operations_6502[0x5a][5] = CycleAddYToAddressLowRead;
  operations_6502[0x5a][6] = OperationCorrectAddressHigh;
  operations_6502[0x5a][7] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1691 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1691 = CycleWriteOperandToAddress;
  }
  operations_6502[0x5a][8] = local_1691;
  operations_6502[0x5a][9] = OperationLSE;
  operations_6502[0x5a][10] = CycleWriteOperandToAddress;
  operations_6502[0x5a][0xb] = OperationMoveToNextProgram;
  local_16a8 = operations_6502[0x5b];
  do {
    *local_16a8 = CycleFetchOperation;
    local_16a8 = local_16a8 + 1;
  } while (local_16a8 != operations_6502[0x5b] + 4);
  operations_6502[0x5b][4] = CycleLoadAddressAbsolute;
  operations_6502[0x5b][5] = CycleAddXToAddressLow;
  operations_6502[0x5b][6] = OperationCorrectAddressHigh;
  operations_6502[0x5b][7] = CycleFetchOperandFromAddress;
  operations_6502[0x5b][8] = OperationMoveToNextProgram;
  local_16b8 = operations_6502[0x5b] + 9;
  do {
    *local_16b8 = CycleFetchOperation;
    local_16b8 = local_16b8 + 1;
  } while (local_16b8 != operations_6502[0x5c] + 4);
  operations_6502[0x5c][4] = CycleLoadAddressAbsolute;
  operations_6502[0x5c][5] = CycleAddXToAddressLow;
  operations_6502[0x5c][6] = OperationCorrectAddressHigh;
  operations_6502[0x5c][7] = CycleFetchOperandFromAddress;
  operations_6502[0x5c][8] = OperationEOR;
  operations_6502[0x5c][9] = OperationMoveToNextProgram;
  local_16c8 = operations_6502[0x5c] + 10;
  do {
    *local_16c8 = CycleFetchOperation;
    local_16c8 = local_16c8 + 1;
  } while (local_16c8 != operations_6502[0x5d] + 4);
  operations_6502[0x5d][4] = CycleLoadAddressAbsolute;
  operations_6502[0x5d][5] = CycleAddXToAddressLowRead;
  operations_6502[0x5d][6] = OperationCorrectAddressHigh;
  operations_6502[0x5d][7] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_16d1 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_16d1 = CycleWriteOperandToAddress;
  }
  operations_6502[0x5d][8] = local_16d1;
  operations_6502[0x5d][9] = OperationLSR;
  operations_6502[0x5d][10] = CycleWriteOperandToAddress;
  operations_6502[0x5d][0xb] = OperationMoveToNextProgram;
  local_16e8 = operations_6502[0x5e];
  do {
    *local_16e8 = CycleFetchOperation;
    local_16e8 = local_16e8 + 1;
  } while (local_16e8 != operations_6502[0x5e] + 4);
  operations_6502[0x5e][4] = CycleLoadAddressAbsolute;
  operations_6502[0x5e][5] = CycleAddXToAddressLowRead;
  operations_6502[0x5e][6] = OperationCorrectAddressHigh;
  operations_6502[0x5e][7] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_16f1 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_16f1 = CycleWriteOperandToAddress;
  }
  operations_6502[0x5e][8] = local_16f1;
  operations_6502[0x5e][9] = OperationLSE;
  operations_6502[0x5e][10] = CycleWriteOperandToAddress;
  operations_6502[0x5e][0xb] = OperationMoveToNextProgram;
  local_1708 = operations_6502[0x5f];
  do {
    *local_1708 = CycleFetchOperation;
    local_1708 = local_1708 + 1;
  } while (local_1708 != operations_6502[0x5f] + 4);
  operations_6502[0x5f][4] = CycleReadFromS;
  operations_6502[0x5f][5] = CyclePullPCL;
  operations_6502[0x5f][6] = CyclePullPCH;
  operations_6502[0x5f][7] = CycleReadAndIncrementPC;
  operations_6502[0x5f][8] = OperationMoveToNextProgram;
  local_1718 = operations_6502[0x5f] + 9;
  do {
    *local_1718 = CycleFetchOperation;
    local_1718 = local_1718 + 1;
  } while (local_1718 != operations_6502[0x60] + 4);
  operations_6502[0x60][4] = CycleIncrementPCFetchAddressLowFromOperand;
  operations_6502[0x60][5] = CycleAddXToOperandFetchAddressLow;
  operations_6502[0x60][6] = CycleIncrementOperandFetchAddressHigh;
  operations_6502[0x60][7] = CycleFetchOperandFromAddress;
  operations_6502[0x60][8] = OperationADC;
  operations_6502[0x60][9] = OperationMoveToNextProgram;
  local_1728 = operations_6502[0x60] + 10;
  do {
    *local_1728 = CycleFetchOperation;
    local_1728 = local_1728 + 1;
  } while (local_1728 != operations_6502[0x61] + 4);
  operations_6502[0x61][4] = CycleFetchOperand;
  operations_6502[0x61][5] = OperationScheduleJam;
  local_1738 = operations_6502[0x61] + 6;
  do {
    *local_1738 = CycleFetchOperation;
    local_1738 = local_1738 + 1;
  } while (local_1738 != operations_6502[0x62] + 4);
  operations_6502[0x62][4] = CycleIncrementPCFetchAddressLowFromOperand;
  operations_6502[0x62][5] = CycleAddXToOperandFetchAddressLow;
  operations_6502[0x62][6] = CycleIncrementOperandFetchAddressHigh;
  operations_6502[0x62][7] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1741 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1741 = CycleWriteOperandToAddress;
  }
  operations_6502[0x62][8] = local_1741;
  operations_6502[0x62][9] = OperationRRA;
  operations_6502[0x62][10] = OperationADC;
  operations_6502[0x62][0xb] = CycleWriteOperandToAddress;
  operations_6502[99][0] = OperationMoveToNextProgram;
  local_1758 = operations_6502[99] + 1;
  do {
    *local_1758 = CycleFetchOperation;
    local_1758 = local_1758 + 1;
  } while (local_1758 != operations_6502[99] + 4);
  operations_6502[99][4] = OperationLoadAddressZeroPage;
  operations_6502[99][5] = CycleFetchOperandFromAddress;
  operations_6502[99][6] = OperationMoveToNextProgram;
  local_1768 = operations_6502[99] + 7;
  do {
    *local_1768 = CycleFetchOperation;
    local_1768 = local_1768 + 1;
  } while (local_1768 != operations_6502[100] + 4);
  operations_6502[100][4] = OperationLoadAddressZeroPage;
  operations_6502[100][5] = CycleFetchOperandFromAddress;
  operations_6502[100][6] = OperationADC;
  operations_6502[100][7] = OperationMoveToNextProgram;
  local_1778 = operations_6502[100] + 8;
  do {
    *local_1778 = CycleFetchOperation;
    local_1778 = local_1778 + 1;
  } while (local_1778 != operations_6502[0x65] + 4);
  operations_6502[0x65][4] = OperationLoadAddressZeroPage;
  operations_6502[0x65][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1781 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1781 = CycleWriteOperandToAddress;
  }
  operations_6502[0x65][6] = local_1781;
  operations_6502[0x65][7] = OperationROR;
  operations_6502[0x65][8] = CycleWriteOperandToAddress;
  operations_6502[0x65][9] = OperationMoveToNextProgram;
  local_1798 = operations_6502[0x65] + 10;
  do {
    *local_1798 = CycleFetchOperation;
    local_1798 = local_1798 + 1;
  } while (local_1798 != operations_6502[0x66] + 4);
  operations_6502[0x66][4] = OperationLoadAddressZeroPage;
  operations_6502[0x66][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_17a1 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_17a1 = CycleWriteOperandToAddress;
  }
  operations_6502[0x66][6] = local_17a1;
  operations_6502[0x66][7] = OperationRRA;
  operations_6502[0x66][8] = OperationADC;
  operations_6502[0x66][9] = CycleWriteOperandToAddress;
  operations_6502[0x66][10] = OperationMoveToNextProgram;
  local_17b8 = operations_6502[0x66] + 0xb;
  do {
    *local_17b8 = CycleFetchOperation;
    local_17b8 = local_17b8 + 1;
  } while (local_17b8 != operations_6502[0x67] + 4);
  operations_6502[0x67][4] = CycleReadFromS;
  operations_6502[0x67][5] = CyclePullA;
  operations_6502[0x67][6] = OperationSetFlagsFromA;
  operations_6502[0x67][7] = OperationMoveToNextProgram;
  local_17c8 = operations_6502[0x67] + 8;
  do {
    *local_17c8 = CycleFetchOperation;
    local_17c8 = local_17c8 + 1;
  } while (local_17c8 != operations_6502[0x68] + 4);
  operations_6502[0x68][4] = OperationIncrementPC;
  operations_6502[0x68][5] = OperationADC;
  operations_6502[0x68][6] = OperationMoveToNextProgram;
  local_17d8 = operations_6502[0x68] + 7;
  do {
    *local_17d8 = CycleFetchOperation;
    local_17d8 = local_17d8 + 1;
  } while (local_17d8 != operations_6502[0x69] + 4);
  operations_6502[0x69][4] = OperationSTA;
  operations_6502[0x69][5] = OperationROR;
  operations_6502[0x69][6] = OperationCopyOperandToA;
  operations_6502[0x69][7] = OperationMoveToNextProgram;
  local_17e8 = operations_6502[0x69] + 8;
  do {
    *local_17e8 = CycleFetchOperation;
    local_17e8 = local_17e8 + 1;
  } while (local_17e8 != operations_6502[0x6a] + 4);
  operations_6502[0x6a][4] = OperationIncrementPC;
  operations_6502[0x6a][5] = OperationARR;
  operations_6502[0x6a][6] = OperationMoveToNextProgram;
  local_17f8 = operations_6502[0x6a] + 7;
  do {
    *local_17f8 = CycleFetchOperation;
    local_17f8 = local_17f8 + 1;
  } while (local_17f8 != operations_6502[0x6b] + 4);
  operations_6502[0x6b][4] = CycleReadAddressHLoadAddressL;
  operations_6502[0x6b][5] = CycleReadPCLFromAddress;
  operations_6502[0x6b][6] = CycleReadPCHFromAddressLowInc;
  operations_6502[0x6b][7] = OperationMoveToNextProgram;
  local_1808 = operations_6502[0x6b] + 8;
  do {
    *local_1808 = CycleFetchOperation;
    local_1808 = local_1808 + 1;
  } while (local_1808 != operations_6502[0x6c] + 4);
  operations_6502[0x6c][4] = CycleLoadAddressAbsolute;
  operations_6502[0x6c][5] = CycleFetchOperandFromAddress;
  operations_6502[0x6c][6] = OperationADC;
  operations_6502[0x6c][7] = OperationMoveToNextProgram;
  local_1818 = operations_6502[0x6c] + 8;
  do {
    *local_1818 = CycleFetchOperation;
    local_1818 = local_1818 + 1;
  } while (local_1818 != operations_6502[0x6d] + 4);
  operations_6502[0x6d][4] = CycleLoadAddressAbsolute;
  operations_6502[0x6d][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1821 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1821 = CycleWriteOperandToAddress;
  }
  operations_6502[0x6d][6] = local_1821;
  operations_6502[0x6d][7] = OperationROR;
  operations_6502[0x6d][8] = CycleWriteOperandToAddress;
  operations_6502[0x6d][9] = OperationMoveToNextProgram;
  local_1838 = operations_6502[0x6d] + 10;
  do {
    *local_1838 = CycleFetchOperation;
    local_1838 = local_1838 + 1;
  } while (local_1838 != operations_6502[0x6e] + 4);
  operations_6502[0x6e][4] = CycleLoadAddressAbsolute;
  operations_6502[0x6e][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1841 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1841 = CycleWriteOperandToAddress;
  }
  operations_6502[0x6e][6] = local_1841;
  operations_6502[0x6e][7] = OperationRRA;
  operations_6502[0x6e][8] = OperationADC;
  operations_6502[0x6e][9] = CycleWriteOperandToAddress;
  operations_6502[0x6e][10] = OperationMoveToNextProgram;
  local_1858 = operations_6502[0x6e] + 0xb;
  do {
    *local_1858 = CycleFetchOperation;
    local_1858 = local_1858 + 1;
  } while (local_1858 != operations_6502[0x6f] + 4);
  operations_6502[0x6f][4] = OperationBVS;
  operations_6502[0x6f][5] = OperationMoveToNextProgram;
  local_1868 = operations_6502[0x6f] + 6;
  do {
    *local_1868 = CycleFetchOperation;
    local_1868 = local_1868 + 1;
  } while (local_1868 != operations_6502[0x70] + 4);
  operations_6502[0x70][4] = CycleIncrementPCFetchAddressLowFromOperand;
  operations_6502[0x70][5] = CycleIncrementOperandFetchAddressHigh;
  operations_6502[0x70][6] = CycleAddYToAddressLow;
  operations_6502[0x70][7] = OperationCorrectAddressHigh;
  operations_6502[0x70][8] = CycleFetchOperandFromAddress;
  operations_6502[0x70][9] = OperationADC;
  operations_6502[0x70][10] = OperationMoveToNextProgram;
  local_1878 = operations_6502[0x70] + 0xb;
  do {
    *local_1878 = CycleFetchOperation;
    local_1878 = local_1878 + 1;
  } while (local_1878 != operations_6502[0x71] + 4);
  operations_6502[0x71][4] = CycleFetchOperand;
  operations_6502[0x71][5] = OperationScheduleJam;
  local_1888 = operations_6502[0x71] + 6;
  do {
    *local_1888 = CycleFetchOperation;
    local_1888 = local_1888 + 1;
  } while (local_1888 != operations_6502[0x72] + 4);
  operations_6502[0x72][4] = CycleIncrementPCFetchAddressLowFromOperand;
  operations_6502[0x72][5] = CycleIncrementOperandFetchAddressHigh;
  operations_6502[0x72][6] = CycleAddYToAddressLowRead;
  operations_6502[0x72][7] = OperationCorrectAddressHigh;
  operations_6502[0x72][8] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1891 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1891 = CycleWriteOperandToAddress;
  }
  operations_6502[0x72][9] = local_1891;
  operations_6502[0x72][10] = OperationRRA;
  operations_6502[0x72][0xb] = OperationADC;
  operations_6502[0x73][0] = CycleWriteOperandToAddress;
  operations_6502[0x73][1] = OperationMoveToNextProgram;
  local_18a8 = operations_6502[0x73] + 2;
  do {
    *local_18a8 = CycleFetchOperation;
    local_18a8 = local_18a8 + 1;
  } while (local_18a8 != operations_6502[0x73] + 4);
  operations_6502[0x73][4] = CycleLoadAddessZeroX;
  operations_6502[0x73][5] = CycleFetchOperandFromAddress;
  operations_6502[0x73][6] = OperationMoveToNextProgram;
  local_18b8 = operations_6502[0x73] + 7;
  do {
    *local_18b8 = CycleFetchOperation;
    local_18b8 = local_18b8 + 1;
  } while (local_18b8 != operations_6502[0x74] + 4);
  operations_6502[0x74][4] = CycleLoadAddessZeroX;
  operations_6502[0x74][5] = CycleFetchOperandFromAddress;
  operations_6502[0x74][6] = OperationADC;
  operations_6502[0x74][7] = OperationMoveToNextProgram;
  local_18c8 = operations_6502[0x74] + 8;
  do {
    *local_18c8 = CycleFetchOperation;
    local_18c8 = local_18c8 + 1;
  } while (local_18c8 != operations_6502[0x75] + 4);
  operations_6502[0x75][4] = CycleLoadAddessZeroX;
  operations_6502[0x75][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_18d1 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_18d1 = CycleWriteOperandToAddress;
  }
  operations_6502[0x75][6] = local_18d1;
  operations_6502[0x75][7] = OperationROR;
  operations_6502[0x75][8] = CycleWriteOperandToAddress;
  operations_6502[0x75][9] = OperationMoveToNextProgram;
  local_18e8 = operations_6502[0x75] + 10;
  do {
    *local_18e8 = CycleFetchOperation;
    local_18e8 = local_18e8 + 1;
  } while (local_18e8 != operations_6502[0x76] + 4);
  operations_6502[0x76][4] = CycleLoadAddessZeroX;
  operations_6502[0x76][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_18f1 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_18f1 = CycleWriteOperandToAddress;
  }
  operations_6502[0x76][6] = local_18f1;
  operations_6502[0x76][7] = OperationRRA;
  operations_6502[0x76][8] = OperationADC;
  operations_6502[0x76][9] = CycleWriteOperandToAddress;
  operations_6502[0x76][10] = OperationMoveToNextProgram;
  local_1908 = operations_6502[0x76] + 0xb;
  do {
    *local_1908 = CycleFetchOperation;
    local_1908 = local_1908 + 1;
  } while (local_1908 != operations_6502[0x77] + 4);
  operations_6502[0x77][4] = OperationSEI;
  operations_6502[0x77][5] = OperationMoveToNextProgram;
  local_1918 = operations_6502[0x77] + 6;
  do {
    *local_1918 = CycleFetchOperation;
    local_1918 = local_1918 + 1;
  } while (local_1918 != operations_6502[0x78] + 4);
  operations_6502[0x78][4] = CycleLoadAddressAbsolute;
  operations_6502[0x78][5] = CycleAddYToAddressLow;
  operations_6502[0x78][6] = OperationCorrectAddressHigh;
  operations_6502[0x78][7] = CycleFetchOperandFromAddress;
  operations_6502[0x78][8] = OperationADC;
  operations_6502[0x78][9] = OperationMoveToNextProgram;
  local_1928 = operations_6502[0x78] + 10;
  do {
    *local_1928 = CycleFetchOperation;
    local_1928 = local_1928 + 1;
  } while (local_1928 != operations_6502[0x79] + 4);
  operations_6502[0x79][4] = OperationMoveToNextProgram;
  local_1938 = operations_6502[0x79] + 5;
  do {
    *local_1938 = CycleFetchOperation;
    local_1938 = local_1938 + 1;
  } while (local_1938 != operations_6502[0x7a] + 4);
  operations_6502[0x7a][4] = CycleLoadAddressAbsolute;
  operations_6502[0x7a][5] = CycleAddYToAddressLowRead;
  operations_6502[0x7a][6] = OperationCorrectAddressHigh;
  operations_6502[0x7a][7] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1941 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1941 = CycleWriteOperandToAddress;
  }
  operations_6502[0x7a][8] = local_1941;
  operations_6502[0x7a][9] = OperationRRA;
  operations_6502[0x7a][10] = OperationADC;
  operations_6502[0x7a][0xb] = CycleWriteOperandToAddress;
  operations_6502[0x7b][0] = OperationMoveToNextProgram;
  local_1958 = operations_6502[0x7b] + 1;
  do {
    *local_1958 = CycleFetchOperation;
    local_1958 = local_1958 + 1;
  } while (local_1958 != operations_6502[0x7b] + 4);
  operations_6502[0x7b][4] = CycleLoadAddressAbsolute;
  operations_6502[0x7b][5] = CycleAddXToAddressLow;
  operations_6502[0x7b][6] = OperationCorrectAddressHigh;
  operations_6502[0x7b][7] = CycleFetchOperandFromAddress;
  operations_6502[0x7b][8] = OperationMoveToNextProgram;
  local_1968 = operations_6502[0x7b] + 9;
  do {
    *local_1968 = CycleFetchOperation;
    local_1968 = local_1968 + 1;
  } while (local_1968 != operations_6502[0x7c] + 4);
  operations_6502[0x7c][4] = CycleLoadAddressAbsolute;
  operations_6502[0x7c][5] = CycleAddXToAddressLow;
  operations_6502[0x7c][6] = OperationCorrectAddressHigh;
  operations_6502[0x7c][7] = CycleFetchOperandFromAddress;
  operations_6502[0x7c][8] = OperationADC;
  operations_6502[0x7c][9] = OperationMoveToNextProgram;
  local_1978 = operations_6502[0x7c] + 10;
  do {
    *local_1978 = CycleFetchOperation;
    local_1978 = local_1978 + 1;
  } while (local_1978 != operations_6502[0x7d] + 4);
  operations_6502[0x7d][4] = CycleLoadAddressAbsolute;
  operations_6502[0x7d][5] = CycleAddXToAddressLowRead;
  operations_6502[0x7d][6] = OperationCorrectAddressHigh;
  operations_6502[0x7d][7] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1981 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1981 = CycleWriteOperandToAddress;
  }
  operations_6502[0x7d][8] = local_1981;
  operations_6502[0x7d][9] = OperationROR;
  operations_6502[0x7d][10] = CycleWriteOperandToAddress;
  operations_6502[0x7d][0xb] = OperationMoveToNextProgram;
  local_1998 = operations_6502[0x7e];
  do {
    *local_1998 = CycleFetchOperation;
    local_1998 = local_1998 + 1;
  } while (local_1998 != operations_6502[0x7e] + 4);
  operations_6502[0x7e][4] = CycleLoadAddressAbsolute;
  operations_6502[0x7e][5] = CycleAddXToAddressLowRead;
  operations_6502[0x7e][6] = OperationCorrectAddressHigh;
  operations_6502[0x7e][7] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_19a1 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_19a1 = CycleWriteOperandToAddress;
  }
  operations_6502[0x7e][8] = local_19a1;
  operations_6502[0x7e][9] = OperationRRA;
  operations_6502[0x7e][10] = OperationADC;
  operations_6502[0x7e][0xb] = CycleWriteOperandToAddress;
  operations_6502[0x7f][0] = OperationMoveToNextProgram;
  local_19b8 = operations_6502[0x7f] + 1;
  do {
    *local_19b8 = CycleFetchOperation;
    local_19b8 = local_19b8 + 1;
  } while (local_19b8 != operations_6502[0x7f] + 4);
  operations_6502[0x7f][4] = OperationIncrementPC;
  operations_6502[0x7f][5] = OperationMoveToNextProgram;
  local_19c8 = operations_6502[0x7f] + 6;
  do {
    *local_19c8 = CycleFetchOperation;
    local_19c8 = local_19c8 + 1;
  } while (local_19c8 != operations_6502[0x80] + 4);
  operations_6502[0x80][4] = CycleIncrementPCFetchAddressLowFromOperand;
  operations_6502[0x80][5] = CycleAddXToOperandFetchAddressLow;
  operations_6502[0x80][6] = CycleIncrementOperandFetchAddressHigh;
  operations_6502[0x80][7] = OperationSTA;
  operations_6502[0x80][8] = CycleWriteOperandToAddress;
  operations_6502[0x80][9] = OperationMoveToNextProgram;
  local_19d8 = operations_6502[0x80] + 10;
  do {
    *local_19d8 = CycleFetchOperation;
    local_19d8 = local_19d8 + 1;
  } while (local_19d8 != operations_6502[0x81] + 4);
  operations_6502[0x81][4] = OperationIncrementPC;
  operations_6502[0x81][5] = OperationMoveToNextProgram;
  local_19e8 = operations_6502[0x81] + 6;
  do {
    *local_19e8 = CycleFetchOperation;
    local_19e8 = local_19e8 + 1;
  } while (local_19e8 != operations_6502[0x82] + 4);
  operations_6502[0x82][4] = CycleIncrementPCFetchAddressLowFromOperand;
  operations_6502[0x82][5] = CycleAddXToOperandFetchAddressLow;
  operations_6502[0x82][6] = CycleIncrementOperandFetchAddressHigh;
  operations_6502[0x82][7] = OperationSAX;
  operations_6502[0x82][8] = CycleWriteOperandToAddress;
  operations_6502[0x82][9] = OperationMoveToNextProgram;
  local_19f8 = operations_6502[0x82] + 10;
  do {
    *local_19f8 = CycleFetchOperation;
    local_19f8 = local_19f8 + 1;
  } while (local_19f8 != operations_6502[0x83] + 4);
  operations_6502[0x83][4] = OperationLoadAddressZeroPage;
  operations_6502[0x83][5] = OperationSTY;
  operations_6502[0x83][6] = CycleWriteOperandToAddress;
  operations_6502[0x83][7] = OperationMoveToNextProgram;
  local_1a08 = operations_6502[0x83] + 8;
  do {
    *local_1a08 = CycleFetchOperation;
    local_1a08 = local_1a08 + 1;
  } while (local_1a08 != operations_6502[0x84] + 4);
  operations_6502[0x84][4] = OperationLoadAddressZeroPage;
  operations_6502[0x84][5] = OperationSTA;
  operations_6502[0x84][6] = CycleWriteOperandToAddress;
  operations_6502[0x84][7] = OperationMoveToNextProgram;
  local_1a18 = operations_6502[0x84] + 8;
  do {
    *local_1a18 = CycleFetchOperation;
    local_1a18 = local_1a18 + 1;
  } while (local_1a18 != operations_6502[0x85] + 4);
  operations_6502[0x85][4] = OperationLoadAddressZeroPage;
  operations_6502[0x85][5] = OperationSTX;
  operations_6502[0x85][6] = CycleWriteOperandToAddress;
  operations_6502[0x85][7] = OperationMoveToNextProgram;
  local_1a28 = operations_6502[0x85] + 8;
  do {
    *local_1a28 = CycleFetchOperation;
    local_1a28 = local_1a28 + 1;
  } while (local_1a28 != operations_6502[0x86] + 4);
  operations_6502[0x86][4] = OperationLoadAddressZeroPage;
  operations_6502[0x86][5] = OperationSAX;
  operations_6502[0x86][6] = CycleWriteOperandToAddress;
  operations_6502[0x86][7] = OperationMoveToNextProgram;
  local_1a38 = operations_6502[0x86] + 8;
  do {
    *local_1a38 = CycleFetchOperation;
    local_1a38 = local_1a38 + 1;
  } while (local_1a38 != operations_6502[0x87] + 4);
  operations_6502[0x87][4] = OperationDEY;
  operations_6502[0x87][5] = OperationMoveToNextProgram;
  local_1a48 = operations_6502[0x87] + 6;
  do {
    *local_1a48 = CycleFetchOperation;
    local_1a48 = local_1a48 + 1;
  } while (local_1a48 != operations_6502[0x88] + 4);
  operations_6502[0x88][4] = OperationIncrementPC;
  operations_6502[0x88][5] = OperationMoveToNextProgram;
  local_1a58 = operations_6502[0x88] + 6;
  do {
    *local_1a58 = CycleFetchOperation;
    local_1a58 = local_1a58 + 1;
  } while (local_1a58 != operations_6502[0x89] + 4);
  operations_6502[0x89][4] = OperationTXA;
  operations_6502[0x89][5] = OperationMoveToNextProgram;
  local_1a68 = operations_6502[0x89] + 6;
  do {
    *local_1a68 = CycleFetchOperation;
    local_1a68 = local_1a68 + 1;
  } while (local_1a68 != operations_6502[0x8a] + 4);
  operations_6502[0x8a][4] = OperationIncrementPC;
  operations_6502[0x8a][5] = OperationANE;
  operations_6502[0x8a][6] = OperationMoveToNextProgram;
  local_1a78 = operations_6502[0x8a] + 7;
  do {
    *local_1a78 = CycleFetchOperation;
    local_1a78 = local_1a78 + 1;
  } while (local_1a78 != operations_6502[0x8b] + 4);
  operations_6502[0x8b][4] = CycleLoadAddressAbsolute;
  operations_6502[0x8b][5] = OperationSTY;
  operations_6502[0x8b][6] = CycleWriteOperandToAddress;
  operations_6502[0x8b][7] = OperationMoveToNextProgram;
  local_1a88 = operations_6502[0x8b] + 8;
  do {
    *local_1a88 = CycleFetchOperation;
    local_1a88 = local_1a88 + 1;
  } while (local_1a88 != operations_6502[0x8c] + 4);
  operations_6502[0x8c][4] = CycleLoadAddressAbsolute;
  operations_6502[0x8c][5] = OperationSTA;
  operations_6502[0x8c][6] = CycleWriteOperandToAddress;
  operations_6502[0x8c][7] = OperationMoveToNextProgram;
  local_1a98 = operations_6502[0x8c] + 8;
  do {
    *local_1a98 = CycleFetchOperation;
    local_1a98 = local_1a98 + 1;
  } while (local_1a98 != operations_6502[0x8d] + 4);
  operations_6502[0x8d][4] = CycleLoadAddressAbsolute;
  operations_6502[0x8d][5] = OperationSTX;
  operations_6502[0x8d][6] = CycleWriteOperandToAddress;
  operations_6502[0x8d][7] = OperationMoveToNextProgram;
  local_1aa8 = operations_6502[0x8d] + 8;
  do {
    *local_1aa8 = CycleFetchOperation;
    local_1aa8 = local_1aa8 + 1;
  } while (local_1aa8 != operations_6502[0x8e] + 4);
  operations_6502[0x8e][4] = CycleLoadAddressAbsolute;
  operations_6502[0x8e][5] = OperationSAX;
  operations_6502[0x8e][6] = CycleWriteOperandToAddress;
  operations_6502[0x8e][7] = OperationMoveToNextProgram;
  local_1ab8 = operations_6502[0x8e] + 8;
  do {
    *local_1ab8 = CycleFetchOperation;
    local_1ab8 = local_1ab8 + 1;
  } while (local_1ab8 != operations_6502[0x8f] + 4);
  operations_6502[0x8f][4] = OperationBCC;
  operations_6502[0x8f][5] = OperationMoveToNextProgram;
  local_1ac8 = operations_6502[0x8f] + 6;
  do {
    *local_1ac8 = CycleFetchOperation;
    local_1ac8 = local_1ac8 + 1;
  } while (local_1ac8 != operations_6502[0x90] + 4);
  operations_6502[0x90][4] = CycleIncrementPCFetchAddressLowFromOperand;
  operations_6502[0x90][5] = CycleIncrementOperandFetchAddressHigh;
  operations_6502[0x90][6] = CycleAddYToAddressLowRead;
  operations_6502[0x90][7] = OperationCorrectAddressHigh;
  operations_6502[0x90][8] = OperationSTA;
  operations_6502[0x90][9] = CycleWriteOperandToAddress;
  operations_6502[0x90][10] = OperationMoveToNextProgram;
  local_1ad8 = operations_6502[0x90] + 0xb;
  do {
    *local_1ad8 = CycleFetchOperation;
    local_1ad8 = local_1ad8 + 1;
  } while (local_1ad8 != operations_6502[0x91] + 4);
  operations_6502[0x91][4] = CycleFetchOperand;
  operations_6502[0x91][5] = OperationScheduleJam;
  local_1ae8 = operations_6502[0x91] + 6;
  do {
    *local_1ae8 = CycleFetchOperation;
    local_1ae8 = local_1ae8 + 1;
  } while (local_1ae8 != operations_6502[0x92] + 4);
  operations_6502[0x92][4] = CycleIncrementPCFetchAddressLowFromOperand;
  operations_6502[0x92][5] = CycleIncrementOperandFetchAddressHigh;
  operations_6502[0x92][6] = CycleAddYToAddressLowRead;
  operations_6502[0x92][7] = OperationCorrectAddressHigh;
  operations_6502[0x92][8] = OperationSHA;
  operations_6502[0x92][9] = CycleWriteOperandToAddress;
  operations_6502[0x92][10] = OperationMoveToNextProgram;
  local_1af8 = operations_6502[0x92] + 0xb;
  do {
    *local_1af8 = CycleFetchOperation;
    local_1af8 = local_1af8 + 1;
  } while (local_1af8 != operations_6502[0x93] + 4);
  operations_6502[0x93][4] = CycleLoadAddessZeroX;
  operations_6502[0x93][5] = OperationSTY;
  operations_6502[0x93][6] = CycleWriteOperandToAddress;
  operations_6502[0x93][7] = OperationMoveToNextProgram;
  local_1b08 = operations_6502[0x93] + 8;
  do {
    *local_1b08 = CycleFetchOperation;
    local_1b08 = local_1b08 + 1;
  } while (local_1b08 != operations_6502[0x94] + 4);
  operations_6502[0x94][4] = CycleLoadAddessZeroX;
  operations_6502[0x94][5] = OperationSTA;
  operations_6502[0x94][6] = CycleWriteOperandToAddress;
  operations_6502[0x94][7] = OperationMoveToNextProgram;
  local_1b18 = operations_6502[0x94] + 8;
  do {
    *local_1b18 = CycleFetchOperation;
    local_1b18 = local_1b18 + 1;
  } while (local_1b18 != operations_6502[0x95] + 4);
  operations_6502[0x95][4] = CycleLoadAddessZeroY;
  operations_6502[0x95][5] = OperationSTX;
  operations_6502[0x95][6] = CycleWriteOperandToAddress;
  operations_6502[0x95][7] = OperationMoveToNextProgram;
  local_1b28 = operations_6502[0x95] + 8;
  do {
    *local_1b28 = CycleFetchOperation;
    local_1b28 = local_1b28 + 1;
  } while (local_1b28 != operations_6502[0x96] + 4);
  operations_6502[0x96][4] = CycleLoadAddessZeroY;
  operations_6502[0x96][5] = OperationSAX;
  operations_6502[0x96][6] = CycleWriteOperandToAddress;
  operations_6502[0x96][7] = OperationMoveToNextProgram;
  local_1b38 = operations_6502[0x96] + 8;
  do {
    *local_1b38 = CycleFetchOperation;
    local_1b38 = local_1b38 + 1;
  } while (local_1b38 != operations_6502[0x97] + 4);
  operations_6502[0x97][4] = OperationTYA;
  operations_6502[0x97][5] = OperationMoveToNextProgram;
  local_1b48 = operations_6502[0x97] + 6;
  do {
    *local_1b48 = CycleFetchOperation;
    local_1b48 = local_1b48 + 1;
  } while (local_1b48 != operations_6502[0x98] + 4);
  operations_6502[0x98][4] = CycleLoadAddressAbsolute;
  operations_6502[0x98][5] = CycleAddYToAddressLowRead;
  operations_6502[0x98][6] = OperationCorrectAddressHigh;
  operations_6502[0x98][7] = OperationSTA;
  operations_6502[0x98][8] = CycleWriteOperandToAddress;
  operations_6502[0x98][9] = OperationMoveToNextProgram;
  local_1b58 = operations_6502[0x98] + 10;
  do {
    *local_1b58 = CycleFetchOperation;
    local_1b58 = local_1b58 + 1;
  } while (local_1b58 != operations_6502[0x99] + 4);
  operations_6502[0x99][4] = OperationTXS;
  operations_6502[0x99][5] = OperationMoveToNextProgram;
  local_1b68 = operations_6502[0x99] + 6;
  do {
    *local_1b68 = CycleFetchOperation;
    local_1b68 = local_1b68 + 1;
  } while (local_1b68 != operations_6502[0x9a] + 4);
  operations_6502[0x9a][4] = CycleLoadAddressAbsolute;
  operations_6502[0x9a][5] = CycleAddYToAddressLowRead;
  operations_6502[0x9a][6] = OperationCorrectAddressHigh;
  operations_6502[0x9a][7] = OperationSHS;
  operations_6502[0x9a][8] = CycleWriteOperandToAddress;
  operations_6502[0x9a][9] = OperationMoveToNextProgram;
  local_1b78 = operations_6502[0x9a] + 10;
  do {
    *local_1b78 = CycleFetchOperation;
    local_1b78 = local_1b78 + 1;
  } while (local_1b78 != operations_6502[0x9b] + 4);
  operations_6502[0x9b][4] = CycleLoadAddressAbsolute;
  operations_6502[0x9b][5] = CycleAddXToAddressLowRead;
  operations_6502[0x9b][6] = OperationCorrectAddressHigh;
  operations_6502[0x9b][7] = OperationSHY;
  operations_6502[0x9b][8] = CycleWriteOperandToAddress;
  operations_6502[0x9b][9] = OperationMoveToNextProgram;
  local_1b88 = operations_6502[0x9b] + 10;
  do {
    *local_1b88 = CycleFetchOperation;
    local_1b88 = local_1b88 + 1;
  } while (local_1b88 != operations_6502[0x9c] + 4);
  operations_6502[0x9c][4] = CycleLoadAddressAbsolute;
  operations_6502[0x9c][5] = CycleAddXToAddressLowRead;
  operations_6502[0x9c][6] = OperationCorrectAddressHigh;
  operations_6502[0x9c][7] = OperationSTA;
  operations_6502[0x9c][8] = CycleWriteOperandToAddress;
  operations_6502[0x9c][9] = OperationMoveToNextProgram;
  local_1b98 = operations_6502[0x9c] + 10;
  do {
    *local_1b98 = CycleFetchOperation;
    local_1b98 = local_1b98 + 1;
  } while (local_1b98 != operations_6502[0x9d] + 4);
  operations_6502[0x9d][4] = CycleLoadAddressAbsolute;
  operations_6502[0x9d][5] = CycleAddYToAddressLowRead;
  operations_6502[0x9d][6] = OperationCorrectAddressHigh;
  operations_6502[0x9d][7] = OperationSHX;
  operations_6502[0x9d][8] = CycleWriteOperandToAddress;
  operations_6502[0x9d][9] = OperationMoveToNextProgram;
  local_1ba8 = operations_6502[0x9d] + 10;
  do {
    *local_1ba8 = CycleFetchOperation;
    local_1ba8 = local_1ba8 + 1;
  } while (local_1ba8 != operations_6502[0x9e] + 4);
  operations_6502[0x9e][4] = CycleLoadAddressAbsolute;
  operations_6502[0x9e][5] = CycleAddYToAddressLowRead;
  operations_6502[0x9e][6] = OperationCorrectAddressHigh;
  operations_6502[0x9e][7] = OperationSHA;
  operations_6502[0x9e][8] = CycleWriteOperandToAddress;
  operations_6502[0x9e][9] = OperationMoveToNextProgram;
  local_1bb8 = operations_6502[0x9e] + 10;
  do {
    *local_1bb8 = CycleFetchOperation;
    local_1bb8 = local_1bb8 + 1;
  } while (local_1bb8 != operations_6502[0x9f] + 4);
  operations_6502[0x9f][4] = OperationIncrementPC;
  operations_6502[0x9f][5] = OperationLDY;
  operations_6502[0x9f][6] = OperationMoveToNextProgram;
  local_1bc8 = operations_6502[0x9f] + 7;
  do {
    *local_1bc8 = CycleFetchOperation;
    local_1bc8 = local_1bc8 + 1;
  } while (local_1bc8 != operations_6502[0xa0] + 4);
  operations_6502[0xa0][4] = CycleIncrementPCFetchAddressLowFromOperand;
  operations_6502[0xa0][5] = CycleAddXToOperandFetchAddressLow;
  operations_6502[0xa0][6] = CycleIncrementOperandFetchAddressHigh;
  operations_6502[0xa0][7] = CycleFetchOperandFromAddress;
  operations_6502[0xa0][8] = OperationLDA;
  operations_6502[0xa0][9] = OperationMoveToNextProgram;
  local_1bd8 = operations_6502[0xa0] + 10;
  do {
    *local_1bd8 = CycleFetchOperation;
    local_1bd8 = local_1bd8 + 1;
  } while (local_1bd8 != operations_6502[0xa1] + 4);
  operations_6502[0xa1][4] = OperationIncrementPC;
  operations_6502[0xa1][5] = OperationLDX;
  operations_6502[0xa1][6] = OperationMoveToNextProgram;
  local_1be8 = operations_6502[0xa1] + 7;
  do {
    *local_1be8 = CycleFetchOperation;
    local_1be8 = local_1be8 + 1;
  } while (local_1be8 != operations_6502[0xa2] + 4);
  operations_6502[0xa2][4] = CycleIncrementPCFetchAddressLowFromOperand;
  operations_6502[0xa2][5] = CycleAddXToOperandFetchAddressLow;
  operations_6502[0xa2][6] = CycleIncrementOperandFetchAddressHigh;
  operations_6502[0xa2][7] = CycleFetchOperandFromAddress;
  operations_6502[0xa2][8] = OperationLAX;
  operations_6502[0xa2][9] = OperationMoveToNextProgram;
  local_1bf8 = operations_6502[0xa2] + 10;
  do {
    *local_1bf8 = CycleFetchOperation;
    local_1bf8 = local_1bf8 + 1;
  } while (local_1bf8 != operations_6502[0xa3] + 4);
  operations_6502[0xa3][4] = OperationLoadAddressZeroPage;
  operations_6502[0xa3][5] = CycleFetchOperandFromAddress;
  operations_6502[0xa3][6] = OperationLDY;
  operations_6502[0xa3][7] = OperationMoveToNextProgram;
  local_1c08 = operations_6502[0xa3] + 8;
  do {
    *local_1c08 = CycleFetchOperation;
    local_1c08 = local_1c08 + 1;
  } while (local_1c08 != operations_6502[0xa4] + 4);
  operations_6502[0xa4][4] = OperationLoadAddressZeroPage;
  operations_6502[0xa4][5] = CycleFetchOperandFromAddress;
  operations_6502[0xa4][6] = OperationLDA;
  operations_6502[0xa4][7] = OperationMoveToNextProgram;
  local_1c18 = operations_6502[0xa4] + 8;
  do {
    *local_1c18 = CycleFetchOperation;
    local_1c18 = local_1c18 + 1;
  } while (local_1c18 != operations_6502[0xa5] + 4);
  operations_6502[0xa5][4] = OperationLoadAddressZeroPage;
  operations_6502[0xa5][5] = CycleFetchOperandFromAddress;
  operations_6502[0xa5][6] = OperationLDX;
  operations_6502[0xa5][7] = OperationMoveToNextProgram;
  local_1c28 = operations_6502[0xa5] + 8;
  do {
    *local_1c28 = CycleFetchOperation;
    local_1c28 = local_1c28 + 1;
  } while (local_1c28 != operations_6502[0xa6] + 4);
  operations_6502[0xa6][4] = OperationLoadAddressZeroPage;
  operations_6502[0xa6][5] = CycleFetchOperandFromAddress;
  operations_6502[0xa6][6] = OperationLAX;
  operations_6502[0xa6][7] = OperationMoveToNextProgram;
  local_1c38 = operations_6502[0xa6] + 8;
  do {
    *local_1c38 = CycleFetchOperation;
    local_1c38 = local_1c38 + 1;
  } while (local_1c38 != operations_6502[0xa7] + 4);
  operations_6502[0xa7][4] = OperationTAY;
  operations_6502[0xa7][5] = OperationMoveToNextProgram;
  local_1c48 = operations_6502[0xa7] + 6;
  do {
    *local_1c48 = CycleFetchOperation;
    local_1c48 = local_1c48 + 1;
  } while (local_1c48 != operations_6502[0xa8] + 4);
  operations_6502[0xa8][4] = OperationIncrementPC;
  operations_6502[0xa8][5] = OperationLDA;
  operations_6502[0xa8][6] = OperationMoveToNextProgram;
  local_1c58 = operations_6502[0xa8] + 7;
  do {
    *local_1c58 = CycleFetchOperation;
    local_1c58 = local_1c58 + 1;
  } while (local_1c58 != operations_6502[0xa9] + 4);
  operations_6502[0xa9][4] = OperationTAX;
  operations_6502[0xa9][5] = OperationMoveToNextProgram;
  local_1c68 = operations_6502[0xa9] + 6;
  do {
    *local_1c68 = CycleFetchOperation;
    local_1c68 = local_1c68 + 1;
  } while (local_1c68 != operations_6502[0xaa] + 4);
  operations_6502[0xaa][4] = OperationIncrementPC;
  operations_6502[0xaa][5] = OperationLXA;
  operations_6502[0xaa][6] = OperationMoveToNextProgram;
  local_1c78 = operations_6502[0xaa] + 7;
  do {
    *local_1c78 = CycleFetchOperation;
    local_1c78 = local_1c78 + 1;
  } while (local_1c78 != operations_6502[0xab] + 4);
  operations_6502[0xab][4] = CycleLoadAddressAbsolute;
  operations_6502[0xab][5] = CycleFetchOperandFromAddress;
  operations_6502[0xab][6] = OperationLDY;
  operations_6502[0xab][7] = OperationMoveToNextProgram;
  local_1c88 = operations_6502[0xab] + 8;
  do {
    *local_1c88 = CycleFetchOperation;
    local_1c88 = local_1c88 + 1;
  } while (local_1c88 != operations_6502[0xac] + 4);
  operations_6502[0xac][4] = CycleLoadAddressAbsolute;
  operations_6502[0xac][5] = CycleFetchOperandFromAddress;
  operations_6502[0xac][6] = OperationLDA;
  operations_6502[0xac][7] = OperationMoveToNextProgram;
  local_1c98 = operations_6502[0xac] + 8;
  do {
    *local_1c98 = CycleFetchOperation;
    local_1c98 = local_1c98 + 1;
  } while (local_1c98 != operations_6502[0xad] + 4);
  operations_6502[0xad][4] = CycleLoadAddressAbsolute;
  operations_6502[0xad][5] = CycleFetchOperandFromAddress;
  operations_6502[0xad][6] = OperationLDX;
  operations_6502[0xad][7] = OperationMoveToNextProgram;
  local_1ca8 = operations_6502[0xad] + 8;
  do {
    *local_1ca8 = CycleFetchOperation;
    local_1ca8 = local_1ca8 + 1;
  } while (local_1ca8 != operations_6502[0xae] + 4);
  operations_6502[0xae][4] = CycleLoadAddressAbsolute;
  operations_6502[0xae][5] = CycleFetchOperandFromAddress;
  operations_6502[0xae][6] = OperationLAX;
  operations_6502[0xae][7] = OperationMoveToNextProgram;
  local_1cb8 = operations_6502[0xae] + 8;
  do {
    *local_1cb8 = CycleFetchOperation;
    local_1cb8 = local_1cb8 + 1;
  } while (local_1cb8 != operations_6502[0xaf] + 4);
  operations_6502[0xaf][4] = OperationBCS;
  operations_6502[0xaf][5] = OperationMoveToNextProgram;
  local_1cc8 = operations_6502[0xaf] + 6;
  do {
    *local_1cc8 = CycleFetchOperation;
    local_1cc8 = local_1cc8 + 1;
  } while (local_1cc8 != operations_6502[0xb0] + 4);
  operations_6502[0xb0][4] = CycleIncrementPCFetchAddressLowFromOperand;
  operations_6502[0xb0][5] = CycleIncrementOperandFetchAddressHigh;
  operations_6502[0xb0][6] = CycleAddYToAddressLow;
  operations_6502[0xb0][7] = OperationCorrectAddressHigh;
  operations_6502[0xb0][8] = CycleFetchOperandFromAddress;
  operations_6502[0xb0][9] = OperationLDA;
  operations_6502[0xb0][10] = OperationMoveToNextProgram;
  local_1cd8 = operations_6502[0xb0] + 0xb;
  do {
    *local_1cd8 = CycleFetchOperation;
    local_1cd8 = local_1cd8 + 1;
  } while (local_1cd8 != operations_6502[0xb1] + 4);
  operations_6502[0xb1][4] = CycleFetchOperand;
  operations_6502[0xb1][5] = OperationScheduleJam;
  local_1ce8 = operations_6502[0xb1] + 6;
  do {
    *local_1ce8 = CycleFetchOperation;
    local_1ce8 = local_1ce8 + 1;
  } while (local_1ce8 != operations_6502[0xb2] + 4);
  operations_6502[0xb2][4] = CycleIncrementPCFetchAddressLowFromOperand;
  operations_6502[0xb2][5] = CycleIncrementOperandFetchAddressHigh;
  operations_6502[0xb2][6] = CycleAddYToAddressLow;
  operations_6502[0xb2][7] = OperationCorrectAddressHigh;
  operations_6502[0xb2][8] = CycleFetchOperandFromAddress;
  operations_6502[0xb2][9] = OperationLAX;
  operations_6502[0xb2][10] = OperationMoveToNextProgram;
  local_1cf8 = operations_6502[0xb2] + 0xb;
  do {
    *local_1cf8 = CycleFetchOperation;
    local_1cf8 = local_1cf8 + 1;
  } while (local_1cf8 != operations_6502[0xb3] + 4);
  operations_6502[0xb3][4] = CycleLoadAddessZeroX;
  operations_6502[0xb3][5] = CycleFetchOperandFromAddress;
  operations_6502[0xb3][6] = OperationLDY;
  operations_6502[0xb3][7] = OperationMoveToNextProgram;
  local_1d08 = operations_6502[0xb3] + 8;
  do {
    *local_1d08 = CycleFetchOperation;
    local_1d08 = local_1d08 + 1;
  } while (local_1d08 != operations_6502[0xb4] + 4);
  operations_6502[0xb4][4] = CycleLoadAddessZeroX;
  operations_6502[0xb4][5] = CycleFetchOperandFromAddress;
  operations_6502[0xb4][6] = OperationLDA;
  operations_6502[0xb4][7] = OperationMoveToNextProgram;
  local_1d18 = operations_6502[0xb4] + 8;
  do {
    *local_1d18 = CycleFetchOperation;
    local_1d18 = local_1d18 + 1;
  } while (local_1d18 != operations_6502[0xb5] + 4);
  operations_6502[0xb5][4] = CycleLoadAddessZeroY;
  operations_6502[0xb5][5] = CycleFetchOperandFromAddress;
  operations_6502[0xb5][6] = OperationLDX;
  operations_6502[0xb5][7] = OperationMoveToNextProgram;
  local_1d28 = operations_6502[0xb5] + 8;
  do {
    *local_1d28 = CycleFetchOperation;
    local_1d28 = local_1d28 + 1;
  } while (local_1d28 != operations_6502[0xb6] + 4);
  operations_6502[0xb6][4] = CycleLoadAddessZeroY;
  operations_6502[0xb6][5] = CycleFetchOperandFromAddress;
  operations_6502[0xb6][6] = OperationLAX;
  operations_6502[0xb6][7] = OperationMoveToNextProgram;
  local_1d38 = operations_6502[0xb6] + 8;
  do {
    *local_1d38 = CycleFetchOperation;
    local_1d38 = local_1d38 + 1;
  } while (local_1d38 != operations_6502[0xb7] + 4);
  operations_6502[0xb7][4] = OperationCLV;
  operations_6502[0xb7][5] = OperationMoveToNextProgram;
  local_1d48 = operations_6502[0xb7] + 6;
  do {
    *local_1d48 = CycleFetchOperation;
    local_1d48 = local_1d48 + 1;
  } while (local_1d48 != operations_6502[0xb8] + 4);
  operations_6502[0xb8][4] = CycleLoadAddressAbsolute;
  operations_6502[0xb8][5] = CycleAddYToAddressLow;
  operations_6502[0xb8][6] = OperationCorrectAddressHigh;
  operations_6502[0xb8][7] = CycleFetchOperandFromAddress;
  operations_6502[0xb8][8] = OperationLDA;
  operations_6502[0xb8][9] = OperationMoveToNextProgram;
  local_1d58 = operations_6502[0xb8] + 10;
  do {
    *local_1d58 = CycleFetchOperation;
    local_1d58 = local_1d58 + 1;
  } while (local_1d58 != operations_6502[0xb9] + 4);
  operations_6502[0xb9][4] = OperationTSX;
  operations_6502[0xb9][5] = OperationMoveToNextProgram;
  local_1d68 = operations_6502[0xb9] + 6;
  do {
    *local_1d68 = CycleFetchOperation;
    local_1d68 = local_1d68 + 1;
  } while (local_1d68 != operations_6502[0xba] + 4);
  operations_6502[0xba][4] = CycleLoadAddressAbsolute;
  operations_6502[0xba][5] = CycleAddYToAddressLow;
  operations_6502[0xba][6] = OperationCorrectAddressHigh;
  operations_6502[0xba][7] = CycleFetchOperandFromAddress;
  operations_6502[0xba][8] = OperationLAS;
  operations_6502[0xba][9] = OperationMoveToNextProgram;
  local_1d78 = operations_6502[0xba] + 10;
  do {
    *local_1d78 = CycleFetchOperation;
    local_1d78 = local_1d78 + 1;
  } while (local_1d78 != operations_6502[0xbb] + 4);
  operations_6502[0xbb][4] = CycleLoadAddressAbsolute;
  operations_6502[0xbb][5] = CycleAddXToAddressLow;
  operations_6502[0xbb][6] = OperationCorrectAddressHigh;
  operations_6502[0xbb][7] = CycleFetchOperandFromAddress;
  operations_6502[0xbb][8] = OperationLDY;
  operations_6502[0xbb][9] = OperationMoveToNextProgram;
  local_1d88 = operations_6502[0xbb] + 10;
  do {
    *local_1d88 = CycleFetchOperation;
    local_1d88 = local_1d88 + 1;
  } while (local_1d88 != operations_6502[0xbc] + 4);
  operations_6502[0xbc][4] = CycleLoadAddressAbsolute;
  operations_6502[0xbc][5] = CycleAddXToAddressLow;
  operations_6502[0xbc][6] = OperationCorrectAddressHigh;
  operations_6502[0xbc][7] = CycleFetchOperandFromAddress;
  operations_6502[0xbc][8] = OperationLDA;
  operations_6502[0xbc][9] = OperationMoveToNextProgram;
  local_1d98 = operations_6502[0xbc] + 10;
  do {
    *local_1d98 = CycleFetchOperation;
    local_1d98 = local_1d98 + 1;
  } while (local_1d98 != operations_6502[0xbd] + 4);
  operations_6502[0xbd][4] = CycleLoadAddressAbsolute;
  operations_6502[0xbd][5] = CycleAddYToAddressLow;
  operations_6502[0xbd][6] = OperationCorrectAddressHigh;
  operations_6502[0xbd][7] = CycleFetchOperandFromAddress;
  operations_6502[0xbd][8] = OperationLDX;
  operations_6502[0xbd][9] = OperationMoveToNextProgram;
  local_1da8 = operations_6502[0xbd] + 10;
  do {
    *local_1da8 = CycleFetchOperation;
    local_1da8 = local_1da8 + 1;
  } while (local_1da8 != operations_6502[0xbe] + 4);
  operations_6502[0xbe][4] = CycleLoadAddressAbsolute;
  operations_6502[0xbe][5] = CycleAddYToAddressLow;
  operations_6502[0xbe][6] = OperationCorrectAddressHigh;
  operations_6502[0xbe][7] = CycleFetchOperandFromAddress;
  operations_6502[0xbe][8] = OperationLAX;
  operations_6502[0xbe][9] = OperationMoveToNextProgram;
  local_1db8 = operations_6502[0xbe] + 10;
  do {
    *local_1db8 = CycleFetchOperation;
    local_1db8 = local_1db8 + 1;
  } while (local_1db8 != operations_6502[0xbf] + 4);
  operations_6502[0xbf][4] = OperationIncrementPC;
  operations_6502[0xbf][5] = OperationCPY;
  operations_6502[0xbf][6] = OperationMoveToNextProgram;
  local_1dc8 = operations_6502[0xbf] + 7;
  do {
    *local_1dc8 = CycleFetchOperation;
    local_1dc8 = local_1dc8 + 1;
  } while (local_1dc8 != operations_6502[0xc0] + 4);
  operations_6502[0xc0][4] = CycleIncrementPCFetchAddressLowFromOperand;
  operations_6502[0xc0][5] = CycleAddXToOperandFetchAddressLow;
  operations_6502[0xc0][6] = CycleIncrementOperandFetchAddressHigh;
  operations_6502[0xc0][7] = CycleFetchOperandFromAddress;
  operations_6502[0xc0][8] = OperationCMP;
  operations_6502[0xc0][9] = OperationMoveToNextProgram;
  local_1dd8 = operations_6502[0xc0] + 10;
  do {
    *local_1dd8 = CycleFetchOperation;
    local_1dd8 = local_1dd8 + 1;
  } while (local_1dd8 != operations_6502[0xc1] + 4);
  operations_6502[0xc1][4] = OperationIncrementPC;
  operations_6502[0xc1][5] = OperationMoveToNextProgram;
  local_1de8 = operations_6502[0xc1] + 6;
  do {
    *local_1de8 = CycleFetchOperation;
    local_1de8 = local_1de8 + 1;
  } while (local_1de8 != operations_6502[0xc2] + 4);
  operations_6502[0xc2][4] = CycleIncrementPCFetchAddressLowFromOperand;
  operations_6502[0xc2][5] = CycleAddXToOperandFetchAddressLow;
  operations_6502[0xc2][6] = CycleIncrementOperandFetchAddressHigh;
  operations_6502[0xc2][7] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1df1 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1df1 = CycleWriteOperandToAddress;
  }
  operations_6502[0xc2][8] = local_1df1;
  operations_6502[0xc2][9] = OperationDecrementOperand;
  operations_6502[0xc2][10] = OperationCMP;
  operations_6502[0xc2][0xb] = CycleWriteOperandToAddress;
  operations_6502[0xc3][0] = OperationMoveToNextProgram;
  local_1e08 = operations_6502[0xc3] + 1;
  do {
    *local_1e08 = CycleFetchOperation;
    local_1e08 = local_1e08 + 1;
  } while (local_1e08 != operations_6502[0xc3] + 4);
  operations_6502[0xc3][4] = OperationLoadAddressZeroPage;
  operations_6502[0xc3][5] = CycleFetchOperandFromAddress;
  operations_6502[0xc3][6] = OperationCPY;
  operations_6502[0xc3][7] = OperationMoveToNextProgram;
  local_1e18 = operations_6502[0xc3] + 8;
  do {
    *local_1e18 = CycleFetchOperation;
    local_1e18 = local_1e18 + 1;
  } while (local_1e18 != operations_6502[0xc4] + 4);
  operations_6502[0xc4][4] = OperationLoadAddressZeroPage;
  operations_6502[0xc4][5] = CycleFetchOperandFromAddress;
  operations_6502[0xc4][6] = OperationCMP;
  operations_6502[0xc4][7] = OperationMoveToNextProgram;
  local_1e28 = operations_6502[0xc4] + 8;
  do {
    *local_1e28 = CycleFetchOperation;
    local_1e28 = local_1e28 + 1;
  } while (local_1e28 != operations_6502[0xc5] + 4);
  operations_6502[0xc5][4] = OperationLoadAddressZeroPage;
  operations_6502[0xc5][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1e31 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1e31 = CycleWriteOperandToAddress;
  }
  operations_6502[0xc5][6] = local_1e31;
  operations_6502[0xc5][7] = OperationDEC;
  operations_6502[0xc5][8] = CycleWriteOperandToAddress;
  operations_6502[0xc5][9] = OperationMoveToNextProgram;
  local_1e48 = operations_6502[0xc5] + 10;
  do {
    *local_1e48 = CycleFetchOperation;
    local_1e48 = local_1e48 + 1;
  } while (local_1e48 != operations_6502[0xc6] + 4);
  operations_6502[0xc6][4] = OperationLoadAddressZeroPage;
  operations_6502[0xc6][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1e51 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1e51 = CycleWriteOperandToAddress;
  }
  operations_6502[0xc6][6] = local_1e51;
  operations_6502[0xc6][7] = OperationDecrementOperand;
  operations_6502[0xc6][8] = OperationCMP;
  operations_6502[0xc6][9] = CycleWriteOperandToAddress;
  operations_6502[0xc6][10] = OperationMoveToNextProgram;
  local_1e68 = operations_6502[0xc6] + 0xb;
  do {
    *local_1e68 = CycleFetchOperation;
    local_1e68 = local_1e68 + 1;
  } while (local_1e68 != operations_6502[199] + 4);
  operations_6502[199][4] = OperationINY;
  operations_6502[199][5] = OperationMoveToNextProgram;
  local_1e78 = operations_6502[199] + 6;
  do {
    *local_1e78 = CycleFetchOperation;
    local_1e78 = local_1e78 + 1;
  } while (local_1e78 != operations_6502[200] + 4);
  operations_6502[200][4] = OperationIncrementPC;
  operations_6502[200][5] = OperationCMP;
  operations_6502[200][6] = OperationMoveToNextProgram;
  local_1e88 = operations_6502[200] + 7;
  do {
    *local_1e88 = CycleFetchOperation;
    local_1e88 = local_1e88 + 1;
  } while (local_1e88 != operations_6502[0xc9] + 4);
  operations_6502[0xc9][4] = OperationDEX;
  operations_6502[0xc9][5] = OperationMoveToNextProgram;
  local_1e98 = operations_6502[0xc9] + 6;
  do {
    *local_1e98 = CycleFetchOperation;
    local_1e98 = local_1e98 + 1;
  } while (local_1e98 != operations_6502[0xca] + 4);
  operations_6502[0xca][4] = OperationIncrementPC;
  operations_6502[0xca][5] = OperationSBX;
  operations_6502[0xca][6] = OperationMoveToNextProgram;
  local_1ea8 = operations_6502[0xca] + 7;
  do {
    *local_1ea8 = CycleFetchOperation;
    local_1ea8 = local_1ea8 + 1;
  } while (local_1ea8 != operations_6502[0xcb] + 4);
  operations_6502[0xcb][4] = CycleLoadAddressAbsolute;
  operations_6502[0xcb][5] = CycleFetchOperandFromAddress;
  operations_6502[0xcb][6] = OperationCPY;
  operations_6502[0xcb][7] = OperationMoveToNextProgram;
  local_1eb8 = operations_6502[0xcb] + 8;
  do {
    *local_1eb8 = CycleFetchOperation;
    local_1eb8 = local_1eb8 + 1;
  } while (local_1eb8 != operations_6502[0xcc] + 4);
  operations_6502[0xcc][4] = CycleLoadAddressAbsolute;
  operations_6502[0xcc][5] = CycleFetchOperandFromAddress;
  operations_6502[0xcc][6] = OperationCMP;
  operations_6502[0xcc][7] = OperationMoveToNextProgram;
  local_1ec8 = operations_6502[0xcc] + 8;
  do {
    *local_1ec8 = CycleFetchOperation;
    local_1ec8 = local_1ec8 + 1;
  } while (local_1ec8 != operations_6502[0xcd] + 4);
  operations_6502[0xcd][4] = CycleLoadAddressAbsolute;
  operations_6502[0xcd][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1ed1 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1ed1 = CycleWriteOperandToAddress;
  }
  operations_6502[0xcd][6] = local_1ed1;
  operations_6502[0xcd][7] = OperationDEC;
  operations_6502[0xcd][8] = CycleWriteOperandToAddress;
  operations_6502[0xcd][9] = OperationMoveToNextProgram;
  local_1ee8 = operations_6502[0xcd] + 10;
  do {
    *local_1ee8 = CycleFetchOperation;
    local_1ee8 = local_1ee8 + 1;
  } while (local_1ee8 != operations_6502[0xce] + 4);
  operations_6502[0xce][4] = CycleLoadAddressAbsolute;
  operations_6502[0xce][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1ef1 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1ef1 = CycleWriteOperandToAddress;
  }
  operations_6502[0xce][6] = local_1ef1;
  operations_6502[0xce][7] = OperationDecrementOperand;
  operations_6502[0xce][8] = OperationCMP;
  operations_6502[0xce][9] = CycleWriteOperandToAddress;
  operations_6502[0xce][10] = OperationMoveToNextProgram;
  local_1f08 = operations_6502[0xce] + 0xb;
  do {
    *local_1f08 = CycleFetchOperation;
    local_1f08 = local_1f08 + 1;
  } while (local_1f08 != operations_6502[0xcf] + 4);
  operations_6502[0xcf][4] = OperationBNE;
  operations_6502[0xcf][5] = OperationMoveToNextProgram;
  local_1f18 = operations_6502[0xcf] + 6;
  do {
    *local_1f18 = CycleFetchOperation;
    local_1f18 = local_1f18 + 1;
  } while (local_1f18 != operations_6502[0xd0] + 4);
  operations_6502[0xd0][4] = CycleIncrementPCFetchAddressLowFromOperand;
  operations_6502[0xd0][5] = CycleIncrementOperandFetchAddressHigh;
  operations_6502[0xd0][6] = CycleAddYToAddressLow;
  operations_6502[0xd0][7] = OperationCorrectAddressHigh;
  operations_6502[0xd0][8] = CycleFetchOperandFromAddress;
  operations_6502[0xd0][9] = OperationCMP;
  operations_6502[0xd0][10] = OperationMoveToNextProgram;
  local_1f28 = operations_6502[0xd0] + 0xb;
  do {
    *local_1f28 = CycleFetchOperation;
    local_1f28 = local_1f28 + 1;
  } while (local_1f28 != operations_6502[0xd1] + 4);
  operations_6502[0xd1][4] = CycleFetchOperand;
  operations_6502[0xd1][5] = OperationScheduleJam;
  local_1f38 = operations_6502[0xd1] + 6;
  do {
    *local_1f38 = CycleFetchOperation;
    local_1f38 = local_1f38 + 1;
  } while (local_1f38 != operations_6502[0xd2] + 4);
  operations_6502[0xd2][4] = CycleIncrementPCFetchAddressLowFromOperand;
  operations_6502[0xd2][5] = CycleIncrementOperandFetchAddressHigh;
  operations_6502[0xd2][6] = CycleAddYToAddressLowRead;
  operations_6502[0xd2][7] = OperationCorrectAddressHigh;
  operations_6502[0xd2][8] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1f41 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1f41 = CycleWriteOperandToAddress;
  }
  operations_6502[0xd2][9] = local_1f41;
  operations_6502[0xd2][10] = OperationDecrementOperand;
  operations_6502[0xd2][0xb] = OperationCMP;
  operations_6502[0xd3][0] = CycleWriteOperandToAddress;
  operations_6502[0xd3][1] = OperationMoveToNextProgram;
  local_1f58 = operations_6502[0xd3] + 2;
  do {
    *local_1f58 = CycleFetchOperation;
    local_1f58 = local_1f58 + 1;
  } while (local_1f58 != operations_6502[0xd3] + 4);
  operations_6502[0xd3][4] = CycleLoadAddessZeroX;
  operations_6502[0xd3][5] = CycleFetchOperandFromAddress;
  operations_6502[0xd3][6] = OperationMoveToNextProgram;
  local_1f68 = operations_6502[0xd3] + 7;
  do {
    *local_1f68 = CycleFetchOperation;
    local_1f68 = local_1f68 + 1;
  } while (local_1f68 != operations_6502[0xd4] + 4);
  operations_6502[0xd4][4] = CycleLoadAddessZeroX;
  operations_6502[0xd4][5] = CycleFetchOperandFromAddress;
  operations_6502[0xd4][6] = OperationCMP;
  operations_6502[0xd4][7] = OperationMoveToNextProgram;
  local_1f78 = operations_6502[0xd4] + 8;
  do {
    *local_1f78 = CycleFetchOperation;
    local_1f78 = local_1f78 + 1;
  } while (local_1f78 != operations_6502[0xd5] + 4);
  operations_6502[0xd5][4] = CycleLoadAddessZeroX;
  operations_6502[0xd5][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1f81 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1f81 = CycleWriteOperandToAddress;
  }
  operations_6502[0xd5][6] = local_1f81;
  operations_6502[0xd5][7] = OperationDEC;
  operations_6502[0xd5][8] = CycleWriteOperandToAddress;
  operations_6502[0xd5][9] = OperationMoveToNextProgram;
  local_1f98 = operations_6502[0xd5] + 10;
  do {
    *local_1f98 = CycleFetchOperation;
    local_1f98 = local_1f98 + 1;
  } while (local_1f98 != operations_6502[0xd6] + 4);
  operations_6502[0xd6][4] = CycleLoadAddessZeroX;
  operations_6502[0xd6][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1fa1 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1fa1 = CycleWriteOperandToAddress;
  }
  operations_6502[0xd6][6] = local_1fa1;
  operations_6502[0xd6][7] = OperationDecrementOperand;
  operations_6502[0xd6][8] = OperationCMP;
  operations_6502[0xd6][9] = CycleWriteOperandToAddress;
  operations_6502[0xd6][10] = OperationMoveToNextProgram;
  local_1fb8 = operations_6502[0xd6] + 0xb;
  do {
    *local_1fb8 = CycleFetchOperation;
    local_1fb8 = local_1fb8 + 1;
  } while (local_1fb8 != operations_6502[0xd7] + 4);
  operations_6502[0xd7][4] = OperationCLD;
  operations_6502[0xd7][5] = OperationMoveToNextProgram;
  local_1fc8 = operations_6502[0xd7] + 6;
  do {
    *local_1fc8 = CycleFetchOperation;
    local_1fc8 = local_1fc8 + 1;
  } while (local_1fc8 != operations_6502[0xd8] + 4);
  operations_6502[0xd8][4] = CycleLoadAddressAbsolute;
  operations_6502[0xd8][5] = CycleAddYToAddressLow;
  operations_6502[0xd8][6] = OperationCorrectAddressHigh;
  operations_6502[0xd8][7] = CycleFetchOperandFromAddress;
  operations_6502[0xd8][8] = OperationCMP;
  operations_6502[0xd8][9] = OperationMoveToNextProgram;
  local_1fd8 = operations_6502[0xd8] + 10;
  do {
    *local_1fd8 = CycleFetchOperation;
    local_1fd8 = local_1fd8 + 1;
  } while (local_1fd8 != operations_6502[0xd9] + 4);
  operations_6502[0xd9][4] = OperationMoveToNextProgram;
  local_1fe8 = operations_6502[0xd9] + 5;
  do {
    *local_1fe8 = CycleFetchOperation;
    local_1fe8 = local_1fe8 + 1;
  } while (local_1fe8 != operations_6502[0xda] + 4);
  operations_6502[0xda][4] = CycleLoadAddressAbsolute;
  operations_6502[0xda][5] = CycleAddYToAddressLowRead;
  operations_6502[0xda][6] = OperationCorrectAddressHigh;
  operations_6502[0xda][7] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_1ff1 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_1ff1 = CycleWriteOperandToAddress;
  }
  operations_6502[0xda][8] = local_1ff1;
  operations_6502[0xda][9] = OperationDecrementOperand;
  operations_6502[0xda][10] = OperationCMP;
  operations_6502[0xda][0xb] = CycleWriteOperandToAddress;
  operations_6502[0xdb][0] = OperationMoveToNextProgram;
  local_2008 = operations_6502[0xdb] + 1;
  do {
    *local_2008 = CycleFetchOperation;
    local_2008 = local_2008 + 1;
  } while (local_2008 != operations_6502[0xdb] + 4);
  operations_6502[0xdb][4] = CycleLoadAddressAbsolute;
  operations_6502[0xdb][5] = CycleAddXToAddressLow;
  operations_6502[0xdb][6] = OperationCorrectAddressHigh;
  operations_6502[0xdb][7] = CycleFetchOperandFromAddress;
  operations_6502[0xdb][8] = OperationMoveToNextProgram;
  local_2018 = operations_6502[0xdb] + 9;
  do {
    *local_2018 = CycleFetchOperation;
    local_2018 = local_2018 + 1;
  } while (local_2018 != operations_6502[0xdc] + 4);
  operations_6502[0xdc][4] = CycleLoadAddressAbsolute;
  operations_6502[0xdc][5] = CycleAddXToAddressLow;
  operations_6502[0xdc][6] = OperationCorrectAddressHigh;
  operations_6502[0xdc][7] = CycleFetchOperandFromAddress;
  operations_6502[0xdc][8] = OperationCMP;
  operations_6502[0xdc][9] = OperationMoveToNextProgram;
  local_2028 = operations_6502[0xdc] + 10;
  do {
    *local_2028 = CycleFetchOperation;
    local_2028 = local_2028 + 1;
  } while (local_2028 != operations_6502[0xdd] + 4);
  operations_6502[0xdd][4] = CycleLoadAddressAbsolute;
  operations_6502[0xdd][5] = CycleAddXToAddressLowRead;
  operations_6502[0xdd][6] = OperationCorrectAddressHigh;
  operations_6502[0xdd][7] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_2031 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_2031 = CycleWriteOperandToAddress;
  }
  operations_6502[0xdd][8] = local_2031;
  operations_6502[0xdd][9] = OperationDEC;
  operations_6502[0xdd][10] = CycleWriteOperandToAddress;
  operations_6502[0xdd][0xb] = OperationMoveToNextProgram;
  local_2048 = operations_6502[0xde];
  do {
    *local_2048 = CycleFetchOperation;
    local_2048 = local_2048 + 1;
  } while (local_2048 != operations_6502[0xde] + 4);
  operations_6502[0xde][4] = CycleLoadAddressAbsolute;
  operations_6502[0xde][5] = CycleAddXToAddressLowRead;
  operations_6502[0xde][6] = OperationCorrectAddressHigh;
  operations_6502[0xde][7] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_2051 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_2051 = CycleWriteOperandToAddress;
  }
  operations_6502[0xde][8] = local_2051;
  operations_6502[0xde][9] = OperationDecrementOperand;
  operations_6502[0xde][10] = OperationCMP;
  operations_6502[0xde][0xb] = CycleWriteOperandToAddress;
  operations_6502[0xdf][0] = OperationMoveToNextProgram;
  local_2068 = operations_6502[0xdf] + 1;
  do {
    *local_2068 = CycleFetchOperation;
    local_2068 = local_2068 + 1;
  } while (local_2068 != operations_6502[0xdf] + 4);
  operations_6502[0xdf][4] = OperationIncrementPC;
  operations_6502[0xdf][5] = OperationCPX;
  operations_6502[0xdf][6] = OperationMoveToNextProgram;
  local_2078 = operations_6502[0xdf] + 7;
  do {
    *local_2078 = CycleFetchOperation;
    local_2078 = local_2078 + 1;
  } while (local_2078 != operations_6502[0xe0] + 4);
  operations_6502[0xe0][4] = CycleIncrementPCFetchAddressLowFromOperand;
  operations_6502[0xe0][5] = CycleAddXToOperandFetchAddressLow;
  operations_6502[0xe0][6] = CycleIncrementOperandFetchAddressHigh;
  operations_6502[0xe0][7] = CycleFetchOperandFromAddress;
  operations_6502[0xe0][8] = OperationSBC;
  operations_6502[0xe0][9] = OperationMoveToNextProgram;
  local_2088 = operations_6502[0xe0] + 10;
  do {
    *local_2088 = CycleFetchOperation;
    local_2088 = local_2088 + 1;
  } while (local_2088 != operations_6502[0xe1] + 4);
  operations_6502[0xe1][4] = OperationIncrementPC;
  operations_6502[0xe1][5] = OperationMoveToNextProgram;
  local_2098 = operations_6502[0xe1] + 6;
  do {
    *local_2098 = CycleFetchOperation;
    local_2098 = local_2098 + 1;
  } while (local_2098 != operations_6502[0xe2] + 4);
  operations_6502[0xe2][4] = CycleIncrementPCFetchAddressLowFromOperand;
  operations_6502[0xe2][5] = CycleAddXToOperandFetchAddressLow;
  operations_6502[0xe2][6] = CycleIncrementOperandFetchAddressHigh;
  operations_6502[0xe2][7] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_20a1 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_20a1 = CycleWriteOperandToAddress;
  }
  operations_6502[0xe2][8] = local_20a1;
  operations_6502[0xe2][9] = OperationINS;
  operations_6502[0xe2][10] = CycleWriteOperandToAddress;
  operations_6502[0xe2][0xb] = OperationMoveToNextProgram;
  local_20b8 = operations_6502[0xe3];
  do {
    *local_20b8 = CycleFetchOperation;
    local_20b8 = local_20b8 + 1;
  } while (local_20b8 != operations_6502[0xe3] + 4);
  operations_6502[0xe3][4] = OperationLoadAddressZeroPage;
  operations_6502[0xe3][5] = CycleFetchOperandFromAddress;
  operations_6502[0xe3][6] = OperationCPX;
  operations_6502[0xe3][7] = OperationMoveToNextProgram;
  local_20c8 = operations_6502[0xe3] + 8;
  do {
    *local_20c8 = CycleFetchOperation;
    local_20c8 = local_20c8 + 1;
  } while (local_20c8 != operations_6502[0xe4] + 4);
  operations_6502[0xe4][4] = OperationLoadAddressZeroPage;
  operations_6502[0xe4][5] = CycleFetchOperandFromAddress;
  operations_6502[0xe4][6] = OperationSBC;
  operations_6502[0xe4][7] = OperationMoveToNextProgram;
  local_20d8 = operations_6502[0xe4] + 8;
  do {
    *local_20d8 = CycleFetchOperation;
    local_20d8 = local_20d8 + 1;
  } while (local_20d8 != operations_6502[0xe5] + 4);
  operations_6502[0xe5][4] = OperationLoadAddressZeroPage;
  operations_6502[0xe5][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_20e1 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_20e1 = CycleWriteOperandToAddress;
  }
  operations_6502[0xe5][6] = local_20e1;
  operations_6502[0xe5][7] = OperationINC;
  operations_6502[0xe5][8] = CycleWriteOperandToAddress;
  operations_6502[0xe5][9] = OperationMoveToNextProgram;
  local_20f8 = operations_6502[0xe5] + 10;
  do {
    *local_20f8 = CycleFetchOperation;
    local_20f8 = local_20f8 + 1;
  } while (local_20f8 != operations_6502[0xe6] + 4);
  operations_6502[0xe6][4] = OperationLoadAddressZeroPage;
  operations_6502[0xe6][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_2101 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_2101 = CycleWriteOperandToAddress;
  }
  operations_6502[0xe6][6] = local_2101;
  operations_6502[0xe6][7] = OperationINS;
  operations_6502[0xe6][8] = CycleWriteOperandToAddress;
  operations_6502[0xe6][9] = OperationMoveToNextProgram;
  local_2118 = operations_6502[0xe6] + 10;
  do {
    *local_2118 = CycleFetchOperation;
    local_2118 = local_2118 + 1;
  } while (local_2118 != operations_6502[0xe7] + 4);
  operations_6502[0xe7][4] = OperationINX;
  operations_6502[0xe7][5] = OperationMoveToNextProgram;
  local_2128 = operations_6502[0xe7] + 6;
  do {
    *local_2128 = CycleFetchOperation;
    local_2128 = local_2128 + 1;
  } while (local_2128 != operations_6502[0xe8] + 4);
  operations_6502[0xe8][4] = OperationIncrementPC;
  operations_6502[0xe8][5] = OperationSBC;
  operations_6502[0xe8][6] = OperationMoveToNextProgram;
  local_2138 = operations_6502[0xe8] + 7;
  do {
    *local_2138 = CycleFetchOperation;
    local_2138 = local_2138 + 1;
  } while (local_2138 != operations_6502[0xe9] + 4);
  operations_6502[0xe9][4] = OperationMoveToNextProgram;
  local_2148 = operations_6502[0xe9] + 5;
  do {
    *local_2148 = CycleFetchOperation;
    local_2148 = local_2148 + 1;
  } while (local_2148 != operations_6502[0xea] + 4);
  operations_6502[0xea][4] = OperationIncrementPC;
  operations_6502[0xea][5] = OperationSBC;
  operations_6502[0xea][6] = OperationMoveToNextProgram;
  local_2158 = operations_6502[0xea] + 7;
  do {
    *local_2158 = CycleFetchOperation;
    local_2158 = local_2158 + 1;
  } while (local_2158 != operations_6502[0xeb] + 4);
  operations_6502[0xeb][4] = CycleLoadAddressAbsolute;
  operations_6502[0xeb][5] = CycleFetchOperandFromAddress;
  operations_6502[0xeb][6] = OperationCPX;
  operations_6502[0xeb][7] = OperationMoveToNextProgram;
  local_2168 = operations_6502[0xeb] + 8;
  do {
    *local_2168 = CycleFetchOperation;
    local_2168 = local_2168 + 1;
  } while (local_2168 != operations_6502[0xec] + 4);
  operations_6502[0xec][4] = CycleLoadAddressAbsolute;
  operations_6502[0xec][5] = CycleFetchOperandFromAddress;
  operations_6502[0xec][6] = OperationSBC;
  operations_6502[0xec][7] = OperationMoveToNextProgram;
  local_2178 = operations_6502[0xec] + 8;
  do {
    *local_2178 = CycleFetchOperation;
    local_2178 = local_2178 + 1;
  } while (local_2178 != operations_6502[0xed] + 4);
  operations_6502[0xed][4] = CycleLoadAddressAbsolute;
  operations_6502[0xed][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_2181 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_2181 = CycleWriteOperandToAddress;
  }
  operations_6502[0xed][6] = local_2181;
  operations_6502[0xed][7] = OperationINC;
  operations_6502[0xed][8] = CycleWriteOperandToAddress;
  operations_6502[0xed][9] = OperationMoveToNextProgram;
  local_2198 = operations_6502[0xed] + 10;
  do {
    *local_2198 = CycleFetchOperation;
    local_2198 = local_2198 + 1;
  } while (local_2198 != operations_6502[0xee] + 4);
  operations_6502[0xee][4] = CycleLoadAddressAbsolute;
  operations_6502[0xee][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_21a1 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_21a1 = CycleWriteOperandToAddress;
  }
  operations_6502[0xee][6] = local_21a1;
  operations_6502[0xee][7] = OperationINS;
  operations_6502[0xee][8] = CycleWriteOperandToAddress;
  operations_6502[0xee][9] = OperationMoveToNextProgram;
  local_21b8 = operations_6502[0xee] + 10;
  do {
    *local_21b8 = CycleFetchOperation;
    local_21b8 = local_21b8 + 1;
  } while (local_21b8 != operations_6502[0xef] + 4);
  operations_6502[0xef][4] = OperationBEQ;
  operations_6502[0xef][5] = OperationMoveToNextProgram;
  local_21c8 = operations_6502[0xef] + 6;
  do {
    *local_21c8 = CycleFetchOperation;
    local_21c8 = local_21c8 + 1;
  } while (local_21c8 != operations_6502[0xf0] + 4);
  operations_6502[0xf0][4] = CycleIncrementPCFetchAddressLowFromOperand;
  operations_6502[0xf0][5] = CycleIncrementOperandFetchAddressHigh;
  operations_6502[0xf0][6] = CycleAddYToAddressLow;
  operations_6502[0xf0][7] = OperationCorrectAddressHigh;
  operations_6502[0xf0][8] = CycleFetchOperandFromAddress;
  operations_6502[0xf0][9] = OperationSBC;
  operations_6502[0xf0][10] = OperationMoveToNextProgram;
  local_21d8 = operations_6502[0xf0] + 0xb;
  do {
    *local_21d8 = CycleFetchOperation;
    local_21d8 = local_21d8 + 1;
  } while (local_21d8 != operations_6502[0xf1] + 4);
  operations_6502[0xf1][4] = CycleFetchOperand;
  operations_6502[0xf1][5] = OperationScheduleJam;
  local_21e8 = operations_6502[0xf1] + 6;
  do {
    *local_21e8 = CycleFetchOperation;
    local_21e8 = local_21e8 + 1;
  } while (local_21e8 != operations_6502[0xf2] + 4);
  operations_6502[0xf2][4] = CycleIncrementPCFetchAddressLowFromOperand;
  operations_6502[0xf2][5] = CycleIncrementOperandFetchAddressHigh;
  operations_6502[0xf2][6] = CycleAddYToAddressLowRead;
  operations_6502[0xf2][7] = OperationCorrectAddressHigh;
  operations_6502[0xf2][8] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_21f1 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_21f1 = CycleWriteOperandToAddress;
  }
  operations_6502[0xf2][9] = local_21f1;
  operations_6502[0xf2][10] = OperationINS;
  operations_6502[0xf2][0xb] = CycleWriteOperandToAddress;
  operations_6502[0xf3][0] = OperationMoveToNextProgram;
  local_2208 = operations_6502[0xf3] + 1;
  do {
    *local_2208 = CycleFetchOperation;
    local_2208 = local_2208 + 1;
  } while (local_2208 != operations_6502[0xf3] + 4);
  operations_6502[0xf3][4] = CycleLoadAddessZeroX;
  operations_6502[0xf3][5] = CycleFetchOperandFromAddress;
  operations_6502[0xf3][6] = OperationMoveToNextProgram;
  local_2218 = operations_6502[0xf3] + 7;
  do {
    *local_2218 = CycleFetchOperation;
    local_2218 = local_2218 + 1;
  } while (local_2218 != operations_6502[0xf4] + 4);
  operations_6502[0xf4][4] = CycleLoadAddessZeroX;
  operations_6502[0xf4][5] = CycleFetchOperandFromAddress;
  operations_6502[0xf4][6] = OperationSBC;
  operations_6502[0xf4][7] = OperationMoveToNextProgram;
  local_2228 = operations_6502[0xf4] + 8;
  do {
    *local_2228 = CycleFetchOperation;
    local_2228 = local_2228 + 1;
  } while (local_2228 != operations_6502[0xf5] + 4);
  operations_6502[0xf5][4] = CycleLoadAddessZeroX;
  operations_6502[0xf5][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_2231 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_2231 = CycleWriteOperandToAddress;
  }
  operations_6502[0xf5][6] = local_2231;
  operations_6502[0xf5][7] = OperationINC;
  operations_6502[0xf5][8] = CycleWriteOperandToAddress;
  operations_6502[0xf5][9] = OperationMoveToNextProgram;
  local_2248 = operations_6502[0xf5] + 10;
  do {
    *local_2248 = CycleFetchOperation;
    local_2248 = local_2248 + 1;
  } while (local_2248 != operations_6502[0xf6] + 4);
  operations_6502[0xf6][4] = CycleLoadAddessZeroX;
  operations_6502[0xf6][5] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_2251 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_2251 = CycleWriteOperandToAddress;
  }
  operations_6502[0xf6][6] = local_2251;
  operations_6502[0xf6][7] = OperationINS;
  operations_6502[0xf6][8] = CycleWriteOperandToAddress;
  operations_6502[0xf6][9] = OperationMoveToNextProgram;
  local_2268 = operations_6502[0xf6] + 10;
  do {
    *local_2268 = CycleFetchOperation;
    local_2268 = local_2268 + 1;
  } while (local_2268 != operations_6502[0xf7] + 4);
  operations_6502[0xf7][4] = OperationSED;
  operations_6502[0xf7][5] = OperationMoveToNextProgram;
  local_2278 = operations_6502[0xf7] + 6;
  do {
    *local_2278 = CycleFetchOperation;
    local_2278 = local_2278 + 1;
  } while (local_2278 != operations_6502[0xf8] + 4);
  operations_6502[0xf8][4] = CycleLoadAddressAbsolute;
  operations_6502[0xf8][5] = CycleAddYToAddressLow;
  operations_6502[0xf8][6] = OperationCorrectAddressHigh;
  operations_6502[0xf8][7] = CycleFetchOperandFromAddress;
  operations_6502[0xf8][8] = OperationSBC;
  operations_6502[0xf8][9] = OperationMoveToNextProgram;
  local_2288 = operations_6502[0xf8] + 10;
  do {
    *local_2288 = CycleFetchOperation;
    local_2288 = local_2288 + 1;
  } while (local_2288 != operations_6502[0xf9] + 4);
  operations_6502[0xf9][4] = OperationMoveToNextProgram;
  local_2298 = operations_6502[0xf9] + 5;
  do {
    *local_2298 = CycleFetchOperation;
    local_2298 = local_2298 + 1;
  } while (local_2298 != operations_6502[0xfa] + 4);
  operations_6502[0xfa][4] = CycleLoadAddressAbsolute;
  operations_6502[0xfa][5] = CycleAddYToAddressLowRead;
  operations_6502[0xfa][6] = OperationCorrectAddressHigh;
  operations_6502[0xfa][7] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_22a1 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_22a1 = CycleWriteOperandToAddress;
  }
  operations_6502[0xfa][8] = local_22a1;
  operations_6502[0xfa][9] = OperationINS;
  operations_6502[0xfa][10] = CycleWriteOperandToAddress;
  operations_6502[0xfa][0xb] = OperationMoveToNextProgram;
  local_22b8 = operations_6502[0xfb];
  do {
    *local_22b8 = CycleFetchOperation;
    local_22b8 = local_22b8 + 1;
  } while (local_22b8 != operations_6502[0xfb] + 4);
  operations_6502[0xfb][4] = CycleLoadAddressAbsolute;
  operations_6502[0xfb][5] = CycleAddXToAddressLow;
  operations_6502[0xfb][6] = OperationCorrectAddressHigh;
  operations_6502[0xfb][7] = CycleFetchOperandFromAddress;
  operations_6502[0xfb][8] = OperationMoveToNextProgram;
  local_22c8 = operations_6502[0xfb] + 9;
  do {
    *local_22c8 = CycleFetchOperation;
    local_22c8 = local_22c8 + 1;
  } while (local_22c8 != operations_6502[0xfc] + 4);
  operations_6502[0xfc][4] = CycleLoadAddressAbsolute;
  operations_6502[0xfc][5] = CycleAddXToAddressLow;
  operations_6502[0xfc][6] = OperationCorrectAddressHigh;
  operations_6502[0xfc][7] = CycleFetchOperandFromAddress;
  operations_6502[0xfc][8] = OperationSBC;
  operations_6502[0xfc][9] = OperationMoveToNextProgram;
  local_22d8 = operations_6502[0xfc] + 10;
  do {
    *local_22d8 = CycleFetchOperation;
    local_22d8 = local_22d8 + 1;
  } while (local_22d8 != operations_6502[0xfd] + 4);
  operations_6502[0xfd][4] = CycleLoadAddressAbsolute;
  operations_6502[0xfd][5] = CycleAddXToAddressLowRead;
  operations_6502[0xfd][6] = OperationCorrectAddressHigh;
  operations_6502[0xfd][7] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_22e1 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_22e1 = CycleWriteOperandToAddress;
  }
  operations_6502[0xfd][8] = local_22e1;
  operations_6502[0xfd][9] = OperationINC;
  operations_6502[0xfd][10] = CycleWriteOperandToAddress;
  operations_6502[0xfd][0xb] = OperationMoveToNextProgram;
  local_22f8 = operations_6502[0xfe];
  do {
    *local_22f8 = CycleFetchOperation;
    local_22f8 = local_22f8 + 1;
  } while (local_22f8 != operations_6502[0xfe] + 4);
  operations_6502[0xfe][4] = CycleLoadAddressAbsolute;
  operations_6502[0xfe][5] = CycleAddXToAddressLowRead;
  operations_6502[0xfe][6] = OperationCorrectAddressHigh;
  operations_6502[0xfe][7] = CycleFetchOperandFromAddress;
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  local_2301 = CycleFetchOperandFromAddress;
  if (!bVar1) {
    local_2301 = CycleWriteOperandToAddress;
  }
  operations_6502[0xfe][8] = local_2301;
  operations_6502[0xfe][9] = OperationINS;
  operations_6502[0xfe][10] = CycleWriteOperandToAddress;
  operations_6502[0xfe][0xb] = OperationMoveToNextProgram;
  local_2318 = operations_6502[0xff];
  do {
    *local_2318 = CycleFetchOperation;
    local_2318 = local_2318 + 1;
  } while (local_2318 != operations_6502[0xff] + 4);
  operations_6502[0xff][4] = CycleFetchOperation;
  operations_6502[0xff][5] = CycleFetchOperand;
  operations_6502[0xff][6] = OperationDecodeOperation;
  local_2328 = operations_6502[0xff] + 7;
  do {
    *local_2328 = CycleFetchOperation;
    local_2328 = local_2328 + 1;
  } while (local_2328 != operations_6502[0x100] + 4);
  operations_6502[0x100][4] = CycleFetchOperand;
  operations_6502[0x100][5] = CycleFetchOperand;
  operations_6502[0x100][6] = CycleNoWritePush;
  operations_6502[0x100][7] = CycleNoWritePush;
  operations_6502[0x100][8] = OperationRSTPickVector;
  operations_6502[0x100][9] = CycleNoWritePush;
  operations_6502[0x100][10] = OperationSetNMIRSTFlags;
  operations_6502[0x100][0xb] = CycleReadVectorLow;
  operations_6502[0x101][0] = CycleReadVectorHigh;
  operations_6502[0x101][1] = OperationMoveToNextProgram;
  local_2338 = operations_6502[0x101] + 2;
  do {
    *local_2338 = CycleFetchOperation;
    local_2338 = local_2338 + 1;
  } while (local_2338 != operations_6502[0x101] + 4);
  operations_6502[0x101][4] = CycleFetchOperand;
  operations_6502[0x101][5] = CycleFetchOperand;
  operations_6502[0x101][6] = CyclePushPCH;
  operations_6502[0x101][7] = CyclePushPCL;
  operations_6502[0x101][8] = OperationBRKPickVector;
  operations_6502[0x101][9] = OperationSetOperandFromFlags;
  operations_6502[0x101][10] = CyclePushOperand;
  operations_6502[0x101][0xb] = OperationSetIRQFlags;
  operations_6502[0x102][0] = CycleReadVectorLow;
  operations_6502[0x102][1] = CycleReadVectorHigh;
  operations_6502[0x102][2] = OperationMoveToNextProgram;
  local_2348 = operations_6502[0x102] + 3;
  do {
    *local_2348 = CycleFetchOperation;
    local_2348 = local_2348 + 1;
  } while (local_2348 != operations_6502[0x102] + 4);
  operations_6502[0x102][4] = CycleFetchOperand;
  operations_6502[0x102][5] = CycleFetchOperand;
  operations_6502[0x102][6] = CyclePushPCH;
  operations_6502[0x102][7] = CyclePushPCL;
  operations_6502[0x102][8] = OperationNMIPickVector;
  operations_6502[0x102][9] = OperationSetOperandFromFlags;
  operations_6502[0x102][10] = CyclePushOperand;
  operations_6502[0x102][0xb] = OperationSetNMIRSTFlags;
  operations_6502[0x103][0] = CycleReadVectorLow;
  operations_6502[0x103][1] = CycleReadVectorHigh;
  operations_6502[0x103][2] = OperationMoveToNextProgram;
  local_2358 = operations_6502[0x103] + 3;
  do {
    *local_2358 = CycleFetchOperation;
    local_2358 = local_2358 + 1;
  } while (local_2358 != operations_6502[0x103] + 4);
  operations_6502[0x103][4] = CycleReadFromPC;
  operations_6502[0x103][5] = CycleAddSignedOperandToPC;
  operations_6502[0x103][6] = OperationMoveToNextProgram;
  local_2368 = operations_6502[0x103] + 7;
  do {
    *local_2368 = CycleFetchOperation;
    local_2368 = local_2368 + 1;
  } while (local_2368 != operations_6502[0x104] + 4);
  operations_6502[0x104][4] = CycleFetchOperand;
  operations_6502[0x104][5] = OperationIncrementPC;
  operations_6502[0x104][6] = CycleFetchFromHalfUpdatedPC;
  operations_6502[0x104][7] = OperationAddSignedOperandToPC16;
  operations_6502[0x104][8] = OperationMoveToNextProgram;
  local_2378 = operations_6502[0x104] + 9;
  do {
    *local_2378 = CycleFetchOperation;
    local_2378 = local_2378 + 1;
  } while (local_2378 != operations_6502[0x105] + 4);
  operations_6502[0x105][4] = CycleFetchOperand;
  operations_6502[0x105][5] = OperationIncrementPC;
  operations_6502[0x105][6] = CycleFetchFromHalfUpdatedPC;
  operations_6502[0x105][7] = OperationMoveToNextProgram;
  local_2388 = operations_6502[0x105] + 8;
  do {
    *local_2388 = CycleFetchOperation;
    local_2388 = local_2388 + 1;
  } while (local_2388 != operations_6502[0x106] + 4);
  memcpy(this,code + 4,0xc54);
  bVar1 = is_65c02(operations_6502[0x106]._4_4_);
  if (bVar1) {
    code[0] = CycleFetchOperation;
    code[1] = CycleFetchOperation;
    code[2] = CycleFetchOperation;
    code[3] = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x5a) + 0) = CyclePushY;
    *(MicroOp *)((long)(this->operations_ + 0x5a) + 1) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x5a) + 2) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x5a) + 3) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x5a) + 4) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x5a) + 5) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x5a) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x5a) + 7) = CycleFetchOperation;
    paMVar2 = this->operations_;
    *(MicroOp *)((long)(paMVar2 + 0x5a) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x5a) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x5a) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x5a) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xda) + 0) = CyclePushX;
    *(MicroOp *)((long)(this->operations_ + 0xda) + 1) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0xda) + 2) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xda) + 3) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xda) + 4) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xda) + 5) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xda) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xda) + 7) = CycleFetchOperation;
    paMVar2 = this->operations_;
    *(MicroOp *)((long)(paMVar2 + 0xda) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0xda) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0xda) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0xda) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x7a) + 0) = CycleReadFromS;
    *(MicroOp *)((long)(this->operations_ + 0x7a) + 1) = CyclePullY;
    *(MicroOp *)((long)(this->operations_ + 0x7a) + 2) = OperationSetFlagsFromY;
    *(MicroOp *)((long)(this->operations_ + 0x7a) + 3) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x7a) + 4) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x7a) + 5) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x7a) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x7a) + 7) = CycleFetchOperation;
    paMVar2 = this->operations_;
    *(MicroOp *)((long)(paMVar2 + 0x7a) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x7a) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x7a) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x7a) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xfa) + 0) = CycleReadFromS;
    *(MicroOp *)((long)(this->operations_ + 0xfa) + 1) = CyclePullX;
    *(MicroOp *)((long)(this->operations_ + 0xfa) + 2) = OperationSetFlagsFromX;
    *(MicroOp *)((long)(this->operations_ + 0xfa) + 3) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0xfa) + 4) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xfa) + 5) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xfa) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xfa) + 7) = CycleFetchOperation;
    paMVar2 = this->operations_;
    *(MicroOp *)((long)(paMVar2 + 0xfa) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0xfa) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0xfa) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0xfa) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x80) + 0) = OperationBRA;
    *(MicroOp *)((long)(this->operations_ + 0x80) + 1) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x80) + 2) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x80) + 3) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x80) + 4) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x80) + 5) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x80) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x80) + 7) = CycleFetchOperation;
    paMVar2 = this->operations_;
    *(MicroOp *)((long)(paMVar2 + 0x80) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x80) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x80) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x80) + 0xb) = CycleFetchOperation;
    code_5[4] = OperationMoveToNextProgram;
    code_5[5] = CycleFetchOperation;
    code_5[6] = CycleFetchOperation;
    code_5[7] = CycleFetchOperation;
    for (; (int)code_5._4_4_ < 0xf4; code_5._4_4_ = code_5._4_4_ + 0x10) {
      paMVar2 = this->operations_ + (int)code_5._4_4_;
      *(MicroOp *)((long)paMVar2 + 0) = OperationMoveToNextProgram;
      *(MicroOp *)((long)paMVar2 + 1) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 2) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 3) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 4) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 5) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 6) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 7) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 8) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 9) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 10) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 0xb) = CycleFetchOperation;
    }
    code_6[4] = OperationSetIRQFlags;
    code_6[5] = CycleFetchOperation;
    code_6[6] = CycleFetchOperation;
    code_6[7] = CycleFetchOperation;
    for (; (int)code_6._4_4_ < 0xbc; code_6._4_4_ = code_6._4_4_ + 0x10) {
      paMVar2 = this->operations_ + (int)code_6._4_4_;
      *(MicroOp *)((long)paMVar2 + 0) = OperationMoveToNextProgram;
      *(MicroOp *)((long)paMVar2 + 1) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 2) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 3) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 4) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 5) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 6) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 7) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 8) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 9) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 10) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 0xb) = CycleFetchOperation;
    }
    code_7[4] = OperationLAS|OperationBPL;
    code_7[5] = CycleFetchOperation;
    code_7[6] = CycleFetchOperation;
    code_7[7] = CycleFetchOperation;
    for (; (int)code_7._4_4_ < 0xfc; code_7._4_4_ = code_7._4_4_ + 0x10) {
      paMVar2 = this->operations_ + (int)code_7._4_4_;
      *(MicroOp *)((long)paMVar2 + 0) = OperationMoveToNextProgram;
      *(MicroOp *)((long)paMVar2 + 1) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 2) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 3) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 4) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 5) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 6) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 7) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 8) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 9) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 10) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 0xb) = CycleFetchOperation;
    }
    code_8[4] = OperationDecodeOperation;
    code_8[5] = CycleFetchOperation;
    code_8[6] = CycleFetchOperation;
    code_8[7] = CycleFetchOperation;
    for (; (int)code_8._4_4_ < 99; code_8._4_4_ = code_8._4_4_ + 0x10) {
      paMVar2 = this->operations_ + (int)code_8._4_4_;
      *(MicroOp *)((long)paMVar2 + 0) = OperationIncrementPC;
      *(MicroOp *)((long)paMVar2 + 1) = OperationMoveToNextProgram;
      *(MicroOp *)((long)paMVar2 + 2) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 3) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 4) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 5) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 6) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 7) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 8) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 9) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 10) = CycleFetchOperation;
      *(MicroOp *)((long)paMVar2 + 0xb) = CycleFetchOperation;
    }
    *(MicroOp *)((long)(this->operations_ + 0x6c) + 0) = CycleReadAddressHLoadAddressL;
    *(MicroOp *)((long)(this->operations_ + 0x6c) + 1) = CycleReadPCLFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x6c) + 2) = CycleReadPCHFromAddressLowInc;
    *(MicroOp *)((long)(this->operations_ + 0x6c) + 3) = CycleReadPCHFromAddressFixed;
    *(MicroOp *)((long)(this->operations_ + 0x6c) + 4) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x6c) + 5) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x6c) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x6c) + 7) = CycleFetchOperation;
    paMVar2 = this->operations_;
    *(MicroOp *)((long)(paMVar2 + 0x6c) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x6c) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x6c) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x6c) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x7c) + 0) = CycleReadAddressHLoadAddressL;
    *(MicroOp *)((long)(this->operations_ + 0x7c) + 1) = CycleAddXToAddressLowRead;
    *(MicroOp *)((long)(this->operations_ + 0x7c) + 2) = OperationCorrectAddressHigh;
    *(MicroOp *)((long)(this->operations_ + 0x7c) + 3) = CycleReadPCLFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x7c) + 4) = CycleReadPCHFromAddressInc;
    *(MicroOp *)((long)(this->operations_ + 0x7c) + 5) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x7c) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x7c) + 7) = CycleFetchOperation;
    paMVar2 = this->operations_;
    *(MicroOp *)((long)(paMVar2 + 0x7c) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x7c) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x7c) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x7c) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x1a) + 0) = OperationINA;
    *(MicroOp *)((long)(this->operations_ + 0x1a) + 1) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x1a) + 2) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x1a) + 3) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x1a) + 4) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x1a) + 5) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x1a) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x1a) + 7) = CycleFetchOperation;
    paMVar2 = this->operations_;
    *(MicroOp *)((long)(paMVar2 + 0x1a) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x1a) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x1a) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x1a) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x3a) + 0) = OperationDEA;
    *(MicroOp *)((long)(this->operations_ + 0x3a) + 1) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x3a) + 2) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x3a) + 3) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x3a) + 4) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x3a) + 5) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x3a) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x3a) + 7) = CycleFetchOperation;
    paMVar2 = this->operations_;
    *(MicroOp *)((long)(paMVar2 + 0x3a) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x3a) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x3a) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x3a) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x12) + 0) = OperationLoadAddressZeroPage;
    *(MicroOp *)((long)(this->operations_ + 0x12) + 1) = CycleFetchAddressLowFromOperand;
    *(MicroOp *)((long)(this->operations_ + 0x12) + 2) = CycleIncrementOperandFetchAddressHigh;
    *(MicroOp *)((long)(this->operations_ + 0x12) + 3) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x12) + 4) = OperationORA;
    *(MicroOp *)((long)(this->operations_ + 0x12) + 5) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x12) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x12) + 7) = CycleFetchOperation;
    paMVar2 = this->operations_;
    *(MicroOp *)((long)(paMVar2 + 0x12) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x12) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x12) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x12) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x32) + 0) = OperationLoadAddressZeroPage;
    *(MicroOp *)((long)(this->operations_ + 0x32) + 1) = CycleFetchAddressLowFromOperand;
    *(MicroOp *)((long)(this->operations_ + 0x32) + 2) = CycleIncrementOperandFetchAddressHigh;
    *(MicroOp *)((long)(this->operations_ + 0x32) + 3) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x32) + 4) = OperationAND;
    *(MicroOp *)((long)(this->operations_ + 0x32) + 5) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x32) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x32) + 7) = CycleFetchOperation;
    paMVar2 = this->operations_;
    *(MicroOp *)((long)(paMVar2 + 0x32) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x32) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x32) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x32) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x52) + 0) = OperationLoadAddressZeroPage;
    *(MicroOp *)((long)(this->operations_ + 0x52) + 1) = CycleFetchAddressLowFromOperand;
    *(MicroOp *)((long)(this->operations_ + 0x52) + 2) = CycleIncrementOperandFetchAddressHigh;
    *(MicroOp *)((long)(this->operations_ + 0x52) + 3) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x52) + 4) = OperationEOR;
    *(MicroOp *)((long)(this->operations_ + 0x52) + 5) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x52) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x52) + 7) = CycleFetchOperation;
    paMVar2 = this->operations_;
    *(MicroOp *)((long)(paMVar2 + 0x52) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x52) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x52) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x52) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x72) + 0) = OperationLoadAddressZeroPage;
    *(MicroOp *)((long)(this->operations_ + 0x72) + 1) = CycleFetchAddressLowFromOperand;
    *(MicroOp *)((long)(this->operations_ + 0x72) + 2) = CycleIncrementOperandFetchAddressHigh;
    *(MicroOp *)((long)(this->operations_ + 0x72) + 3) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x72) + 4) = OperationADC;
    *(MicroOp *)((long)(this->operations_ + 0x72) + 5) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x72) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x72) + 7) = CycleFetchOperation;
    paMVar2 = this->operations_;
    *(MicroOp *)((long)(paMVar2 + 0x72) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x72) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x72) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x72) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x92) + 0) = OperationLoadAddressZeroPage;
    *(MicroOp *)((long)(this->operations_ + 0x92) + 1) = CycleFetchAddressLowFromOperand;
    *(MicroOp *)((long)(this->operations_ + 0x92) + 2) = CycleIncrementOperandFetchAddressHigh;
    *(MicroOp *)((long)(this->operations_ + 0x92) + 3) = OperationSTA;
    *(MicroOp *)((long)(this->operations_ + 0x92) + 4) = CycleWriteOperandToAddress;
    *(MicroOp *)((long)(this->operations_ + 0x92) + 5) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x92) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x92) + 7) = CycleFetchOperation;
    paMVar2 = this->operations_;
    *(MicroOp *)((long)(paMVar2 + 0x92) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x92) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x92) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x92) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xb2) + 0) = OperationLoadAddressZeroPage;
    *(MicroOp *)((long)(this->operations_ + 0xb2) + 1) = CycleFetchAddressLowFromOperand;
    *(MicroOp *)((long)(this->operations_ + 0xb2) + 2) = CycleIncrementOperandFetchAddressHigh;
    *(MicroOp *)((long)(this->operations_ + 0xb2) + 3) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0xb2) + 4) = OperationLDA;
    *(MicroOp *)((long)(this->operations_ + 0xb2) + 5) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0xb2) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xb2) + 7) = CycleFetchOperation;
    paMVar2 = this->operations_;
    *(MicroOp *)((long)(paMVar2 + 0xb2) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0xb2) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0xb2) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0xb2) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xd2) + 0) = OperationLoadAddressZeroPage;
    *(MicroOp *)((long)(this->operations_ + 0xd2) + 1) = CycleFetchAddressLowFromOperand;
    *(MicroOp *)((long)(this->operations_ + 0xd2) + 2) = CycleIncrementOperandFetchAddressHigh;
    *(MicroOp *)((long)(this->operations_ + 0xd2) + 3) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0xd2) + 4) = OperationCMP;
    *(MicroOp *)((long)(this->operations_ + 0xd2) + 5) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0xd2) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xd2) + 7) = CycleFetchOperation;
    paMVar2 = this->operations_;
    *(MicroOp *)((long)(paMVar2 + 0xd2) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0xd2) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0xd2) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0xd2) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xf2) + 0) = OperationLoadAddressZeroPage;
    *(MicroOp *)((long)(this->operations_ + 0xf2) + 1) = CycleFetchAddressLowFromOperand;
    *(MicroOp *)((long)(this->operations_ + 0xf2) + 2) = CycleIncrementOperandFetchAddressHigh;
    *(MicroOp *)((long)(this->operations_ + 0xf2) + 3) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0xf2) + 4) = OperationSBC;
    *(MicroOp *)((long)(this->operations_ + 0xf2) + 5) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0xf2) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0xf2) + 7) = CycleFetchOperation;
    paMVar2 = this->operations_;
    *(MicroOp *)((long)(paMVar2 + 0xf2) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0xf2) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0xf2) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0xf2) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x9c) + 0) = CycleLoadAddressAbsolute;
    *(MicroOp *)((long)(this->operations_ + 0x9c) + 1) = OperationSTZ;
    *(MicroOp *)((long)(this->operations_ + 0x9c) + 2) = CycleWriteOperandToAddress;
    *(MicroOp *)((long)(this->operations_ + 0x9c) + 3) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x9c) + 4) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x9c) + 5) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x9c) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x9c) + 7) = CycleFetchOperation;
    paMVar2 = this->operations_;
    *(MicroOp *)((long)(paMVar2 + 0x9c) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x9c) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x9c) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x9c) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x9e) + 0) = CycleLoadAddressAbsolute;
    *(MicroOp *)((long)(this->operations_ + 0x9e) + 1) = CycleAddXToAddressLowRead;
    *(MicroOp *)((long)(this->operations_ + 0x9e) + 2) = OperationCorrectAddressHigh;
    *(MicroOp *)((long)(this->operations_ + 0x9e) + 3) = OperationSTZ;
    *(MicroOp *)((long)(this->operations_ + 0x9e) + 4) = CycleWriteOperandToAddress;
    *(MicroOp *)((long)(this->operations_ + 0x9e) + 5) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x9e) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x9e) + 7) = CycleFetchOperation;
    paMVar2 = this->operations_;
    *(MicroOp *)((long)(paMVar2 + 0x9e) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x9e) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x9e) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x9e) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 100) + 0) = OperationLoadAddressZeroPage;
    *(MicroOp *)((long)(this->operations_ + 100) + 1) = OperationSTZ;
    *(MicroOp *)((long)(this->operations_ + 100) + 2) = CycleWriteOperandToAddress;
    *(MicroOp *)((long)(this->operations_ + 100) + 3) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 100) + 4) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 100) + 5) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 100) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 100) + 7) = CycleFetchOperation;
    paMVar2 = this->operations_;
    *(MicroOp *)((long)(paMVar2 + 100) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 100) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 100) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 100) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x74) + 0) = CycleLoadAddessZeroX;
    *(MicroOp *)((long)(this->operations_ + 0x74) + 1) = OperationSTZ;
    *(MicroOp *)((long)(this->operations_ + 0x74) + 2) = CycleWriteOperandToAddress;
    *(MicroOp *)((long)(this->operations_ + 0x74) + 3) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x74) + 4) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x74) + 5) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x74) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x74) + 7) = CycleFetchOperation;
    paMVar2 = this->operations_;
    *(MicroOp *)((long)(paMVar2 + 0x74) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x74) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x74) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x74) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x34) + 0) = CycleLoadAddessZeroX;
    *(MicroOp *)((long)(this->operations_ + 0x34) + 1) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x34) + 2) = OperationBIT;
    *(MicroOp *)((long)(this->operations_ + 0x34) + 3) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x34) + 4) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x34) + 5) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x34) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x34) + 7) = CycleFetchOperation;
    paMVar2 = this->operations_;
    *(MicroOp *)((long)(paMVar2 + 0x34) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x34) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x34) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x34) + 0xb) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x3c) + 0) = CycleLoadAddressAbsolute;
    *(MicroOp *)((long)(this->operations_ + 0x3c) + 1) = CycleAddXToAddressLow;
    *(MicroOp *)((long)(this->operations_ + 0x3c) + 2) = OperationCorrectAddressHigh;
    *(MicroOp *)((long)(this->operations_ + 0x3c) + 3) = CycleFetchOperandFromAddress;
    *(MicroOp *)((long)(this->operations_ + 0x3c) + 4) = OperationBIT;
    *(MicroOp *)((long)(this->operations_ + 0x3c) + 5) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x3c) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x3c) + 7) = CycleFetchOperation;
    paMVar2 = this->operations_;
    *(MicroOp *)((long)(paMVar2 + 0x3c) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x3c) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x3c) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x3c) + 0xb) = CycleFetchOperation;
    code_28[4] = OperationIncrementPC;
    code_28[5] = OperationBITNoNV;
    code_28[6] = OperationMoveToNextProgram;
    code_28[7] = CycleFetchOperation;
    code_28[8] = CycleFetchOperation;
    code_28[9] = CycleFetchOperation;
    code_28[10] = CycleFetchOperation;
    code_28[0xb] = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x89) + 0) = OperationIncrementPC;
    *(MicroOp *)((long)(this->operations_ + 0x89) + 1) = OperationBITNoNV;
    *(MicroOp *)((long)(this->operations_ + 0x89) + 2) = OperationMoveToNextProgram;
    *(MicroOp *)((long)(this->operations_ + 0x89) + 3) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x89) + 4) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x89) + 5) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x89) + 6) = CycleFetchOperation;
    *(MicroOp *)((long)(this->operations_ + 0x89) + 7) = CycleFetchOperation;
    paMVar2 = this->operations_;
    *(MicroOp *)((long)(paMVar2 + 0x89) + 8) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x89) + 9) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x89) + 10) = CycleFetchOperation;
    *(MicroOp *)((long)(paMVar2 + 0x89) + 0xb) = CycleFetchOperation;
    code_29[4] = OperationLoadAddressZeroPage;
    code_29[5] = CycleFetchOperandFromAddress;
    bVar1 = is_65c02(operations_6502[0x106]._4_4_);
    local_2391 = CycleFetchOperandFromAddress;
    if (!bVar1) {
      local_2391 = CycleWriteOperandToAddress;
    }
    code_29[6] = local_2391;
    code_29[7] = OperationTSB;
    code_29[8] = CycleWriteOperandToAddress;
    code_29[9] = OperationMoveToNextProgram;
    local_23a0 = code_29 + 10;
    do {
      *local_23a0 = CycleFetchOperation;
      local_23a0 = local_23a0 + 1;
    } while (local_23a0 != code_28 + 4);
    *(ulong *)this->operations_[4] =
         CONCAT26(code_29._10_2_,
                  CONCAT15(3,CONCAT14(0x2f,CONCAT13(0x62,CONCAT12(local_2391,
                                                                  CONCAT11(code_29[5],code_29[4]))))
                          ));
    *(undefined4 *)(this->operations_[4] + 8) = code_28._0_4_;
    code_30[4] = CycleLoadAddressAbsolute;
    code_30[5] = CycleFetchOperandFromAddress;
    bVar1 = is_65c02(operations_6502[0x106]._4_4_);
    local_23a9 = CycleFetchOperandFromAddress;
    if (!bVar1) {
      local_23a9 = CycleWriteOperandToAddress;
    }
    code_30[6] = local_23a9;
    code_30[7] = OperationTSB;
    code_30[8] = CycleWriteOperandToAddress;
    code_30[9] = OperationMoveToNextProgram;
    local_23b8 = code_30 + 10;
    do {
      *local_23b8 = CycleFetchOperation;
      local_23b8 = local_23b8 + 1;
    } while (local_23b8 != code_29 + 4);
    *(ulong *)this->operations_[0xc] =
         CONCAT26(code_30._10_2_,
                  CONCAT15(3,CONCAT14(0x2f,CONCAT13(0x62,CONCAT12(local_23a9,
                                                                  CONCAT11(code_30[5],code_30[4]))))
                          ));
    *(undefined4 *)(this->operations_[0xc] + 8) = code_29._0_4_;
    code_31[4] = OperationLoadAddressZeroPage;
    code_31[5] = CycleFetchOperandFromAddress;
    bVar1 = is_65c02(operations_6502[0x106]._4_4_);
    local_23c1 = CycleFetchOperandFromAddress;
    if (!bVar1) {
      local_23c1 = CycleWriteOperandToAddress;
    }
    code_31[6] = local_23c1;
    code_31[7] = OperationTRB;
    code_31[8] = CycleWriteOperandToAddress;
    code_31[9] = OperationMoveToNextProgram;
    local_23d0 = code_31 + 10;
    do {
      *local_23d0 = CycleFetchOperation;
      local_23d0 = local_23d0 + 1;
    } while (local_23d0 != code_30 + 4);
    *(ulong *)this->operations_[0x14] =
         CONCAT26(code_31._10_2_,
                  CONCAT15(3,CONCAT14(0x2f,CONCAT13(0x61,CONCAT12(local_23c1,
                                                                  CONCAT11(code_31[5],code_31[4]))))
                          ));
    *(undefined4 *)(this->operations_[0x14] + 8) = code_30._0_4_;
    code_32[4] = CycleLoadAddressAbsolute;
    code_32[5] = CycleFetchOperandFromAddress;
    bVar1 = is_65c02(operations_6502[0x106]._4_4_);
    local_23d9 = CycleFetchOperandFromAddress;
    if (!bVar1) {
      local_23d9 = CycleWriteOperandToAddress;
    }
    code_32[6] = local_23d9;
    code_32[7] = OperationTRB;
    code_32[8] = CycleWriteOperandToAddress;
    code_32[9] = OperationMoveToNextProgram;
    local_23e8 = code_32 + 10;
    do {
      *local_23e8 = CycleFetchOperation;
      local_23e8 = local_23e8 + 1;
    } while (local_23e8 != code_31 + 4);
    *(ulong *)this->operations_[0x1c] =
         CONCAT26(code_32._10_2_,
                  CONCAT15(3,CONCAT14(0x2f,CONCAT13(0x61,CONCAT12(local_23d9,
                                                                  CONCAT11(code_32[5],code_32[4]))))
                          ));
    *(undefined4 *)(this->operations_[0x1c] + 8) = code_31._0_4_;
    code_33[4] = CycleLoadAddressAbsolute;
    code_33[5] = CycleAddXToAddressLow;
    code_33[6] = OperationCorrectAddressHigh;
    code_33[7] = CycleFetchOperandFromAddress;
    bVar1 = is_65c02(operations_6502[0x106]._4_4_);
    local_23f1 = CycleFetchOperandFromAddress;
    if (!bVar1) {
      local_23f1 = CycleWriteOperandToAddress;
    }
    code_33[8] = local_23f1;
    code_33[9] = OperationASL;
    code_33[10] = CycleWriteOperandToAddress;
    code_33[0xb] = OperationMoveToNextProgram;
    local_2400 = code_32;
    do {
      *local_2400 = CycleFetchOperation;
      local_2400 = local_2400 + 1;
    } while (local_2400 != code_32 + 4);
    *(ulong *)this->operations_[0x1e] =
         CONCAT17(3,CONCAT16(0x2f,CONCAT15(0x4f,CONCAT14(local_23f1,
                                                         CONCAT13(code_33[7],
                                                                  CONCAT12(code_33[6],
                                                                           CONCAT11(code_33[5],
                                                                                    code_33[4]))))))
                 );
    *(undefined4 *)(this->operations_[0x1e] + 8) = code_32._0_4_;
    code_34[4] = CycleLoadAddressAbsolute;
    code_34[5] = CycleAddXToAddressLow;
    code_34[6] = OperationCorrectAddressHigh;
    code_34[7] = CycleFetchOperandFromAddress;
    bVar1 = is_65c02(operations_6502[0x106]._4_4_);
    local_2409 = CycleFetchOperandFromAddress;
    if (!bVar1) {
      local_2409 = CycleWriteOperandToAddress;
    }
    code_34[8] = local_2409;
    code_34[9] = OperationASO;
    code_34[10] = CycleWriteOperandToAddress;
    code_34[0xb] = OperationMoveToNextProgram;
    local_2418 = code_33;
    do {
      *local_2418 = CycleFetchOperation;
      local_2418 = local_2418 + 1;
    } while (local_2418 != code_33 + 4);
    *(ulong *)this->operations_[0x1f] =
         CONCAT17(3,CONCAT16(0x2f,CONCAT15(0x50,CONCAT14(local_2409,
                                                         CONCAT13(code_34[7],
                                                                  CONCAT12(code_34[6],
                                                                           CONCAT11(code_34[5],
                                                                                    code_34[4]))))))
                 );
    *(undefined4 *)(this->operations_[0x1f] + 8) = code_33._0_4_;
    code_35[4] = CycleLoadAddressAbsolute;
    code_35[5] = CycleAddXToAddressLow;
    code_35[6] = OperationCorrectAddressHigh;
    code_35[7] = CycleFetchOperandFromAddress;
    bVar1 = is_65c02(operations_6502[0x106]._4_4_);
    local_2421 = CycleFetchOperandFromAddress;
    if (!bVar1) {
      local_2421 = CycleWriteOperandToAddress;
    }
    code_35[8] = local_2421;
    code_35[9] = OperationROL;
    code_35[10] = CycleWriteOperandToAddress;
    code_35[0xb] = OperationMoveToNextProgram;
    local_2430 = code_34;
    do {
      *local_2430 = CycleFetchOperation;
      local_2430 = local_2430 + 1;
    } while (local_2430 != code_34 + 4);
    *(ulong *)this->operations_[0x3e] =
         CONCAT17(3,CONCAT16(0x2f,CONCAT15(0x51,CONCAT14(local_2421,
                                                         CONCAT13(code_35[7],
                                                                  CONCAT12(code_35[6],
                                                                           CONCAT11(code_35[5],
                                                                                    code_35[4]))))))
                 );
    *(undefined4 *)(this->operations_[0x3e] + 8) = code_34._0_4_;
    code_36[4] = CycleLoadAddressAbsolute;
    code_36[5] = CycleAddXToAddressLow;
    code_36[6] = OperationCorrectAddressHigh;
    code_36[7] = CycleFetchOperandFromAddress;
    bVar1 = is_65c02(operations_6502[0x106]._4_4_);
    local_2439 = CycleFetchOperandFromAddress;
    if (!bVar1) {
      local_2439 = CycleWriteOperandToAddress;
    }
    code_36[8] = local_2439;
    code_36[9] = OperationRLA;
    code_36[10] = CycleWriteOperandToAddress;
    code_36[0xb] = OperationMoveToNextProgram;
    local_2448 = code_35;
    do {
      *local_2448 = CycleFetchOperation;
      local_2448 = local_2448 + 1;
    } while (local_2448 != code_35 + 4);
    *(ulong *)this->operations_[0x3f] =
         CONCAT17(3,CONCAT16(0x2f,CONCAT15(0x52,CONCAT14(local_2439,
                                                         CONCAT13(code_36[7],
                                                                  CONCAT12(code_36[6],
                                                                           CONCAT11(code_36[5],
                                                                                    code_36[4]))))))
                 );
    *(undefined4 *)(this->operations_[0x3f] + 8) = code_35._0_4_;
    code_37[4] = CycleLoadAddressAbsolute;
    code_37[5] = CycleAddXToAddressLow;
    code_37[6] = OperationCorrectAddressHigh;
    code_37[7] = CycleFetchOperandFromAddress;
    bVar1 = is_65c02(operations_6502[0x106]._4_4_);
    local_2451 = CycleFetchOperandFromAddress;
    if (!bVar1) {
      local_2451 = CycleWriteOperandToAddress;
    }
    code_37[8] = local_2451;
    code_37[9] = OperationLSR;
    code_37[10] = CycleWriteOperandToAddress;
    code_37[0xb] = OperationMoveToNextProgram;
    local_2460 = code_36;
    do {
      *local_2460 = CycleFetchOperation;
      local_2460 = local_2460 + 1;
    } while (local_2460 != code_36 + 4);
    *(ulong *)this->operations_[0x5e] =
         CONCAT17(3,CONCAT16(0x2f,CONCAT15(0x53,CONCAT14(local_2451,
                                                         CONCAT13(code_37[7],
                                                                  CONCAT12(code_37[6],
                                                                           CONCAT11(code_37[5],
                                                                                    code_37[4]))))))
                 );
    *(undefined4 *)(this->operations_[0x5e] + 8) = code_36._0_4_;
    code_38[4] = CycleLoadAddressAbsolute;
    code_38[5] = CycleAddXToAddressLow;
    code_38[6] = OperationCorrectAddressHigh;
    code_38[7] = CycleFetchOperandFromAddress;
    bVar1 = is_65c02(operations_6502[0x106]._4_4_);
    local_2469 = CycleFetchOperandFromAddress;
    if (!bVar1) {
      local_2469 = CycleWriteOperandToAddress;
    }
    code_38[8] = local_2469;
    code_38[9] = OperationLSE;
    code_38[10] = CycleWriteOperandToAddress;
    code_38[0xb] = OperationMoveToNextProgram;
    local_2478 = code_37;
    do {
      *local_2478 = CycleFetchOperation;
      local_2478 = local_2478 + 1;
    } while (local_2478 != code_37 + 4);
    *(ulong *)this->operations_[0x5f] =
         CONCAT17(3,CONCAT16(0x2f,CONCAT15(0x54,CONCAT14(local_2469,
                                                         CONCAT13(code_38[7],
                                                                  CONCAT12(code_38[6],
                                                                           CONCAT11(code_38[5],
                                                                                    code_38[4]))))))
                 );
    *(undefined4 *)(this->operations_[0x5f] + 8) = code_37._0_4_;
    code_39[4] = CycleLoadAddressAbsolute;
    code_39[5] = CycleAddXToAddressLow;
    code_39[6] = OperationCorrectAddressHigh;
    code_39[7] = CycleFetchOperandFromAddress;
    bVar1 = is_65c02(operations_6502[0x106]._4_4_);
    local_2481 = CycleFetchOperandFromAddress;
    if (!bVar1) {
      local_2481 = CycleWriteOperandToAddress;
    }
    code_39[8] = local_2481;
    code_39[9] = OperationROR;
    code_39[10] = CycleWriteOperandToAddress;
    code_39[0xb] = OperationMoveToNextProgram;
    local_2490 = code_38;
    do {
      *local_2490 = CycleFetchOperation;
      local_2490 = local_2490 + 1;
    } while (local_2490 != code_38 + 4);
    *(ulong *)this->operations_[0x7e] =
         CONCAT17(3,CONCAT16(0x2f,CONCAT15(0x56,CONCAT14(local_2481,
                                                         CONCAT13(code_39[7],
                                                                  CONCAT12(code_39[6],
                                                                           CONCAT11(code_39[5],
                                                                                    code_39[4]))))))
                 );
    *(undefined4 *)(this->operations_[0x7e] + 8) = code_38._0_4_;
    bVar1 = is_65c02(operations_6502[0x106]._4_4_);
    local_2499 = 0x2e;
    if (!bVar1) {
      local_2499 = 0x2f;
    }
    code_39[0] = OperationMoveToNextProgram;
    local_24a8 = code_39 + 1;
    do {
      *local_24a8 = CycleFetchOperation;
      local_24a8 = local_24a8 + 1;
    } while (local_24a8 != code_39 + 4);
    *(ulong *)this->operations_[0x7f] =
         CONCAT17(0x2f,CONCAT16(0x3a,CONCAT15(0x57,CONCAT14(local_2499,0x2e2a2824))));
    *(undefined4 *)(this->operations_[0x7f] + 8) = code_39._0_4_;
    bVar1 = has_bbrbbsrmbsmb(operations_6502[0x106]._4_4_);
    if (bVar1) {
      code_40[4] = OperationRSTPickVector;
      code_40[5] = CycleFetchOperation;
      code_40[6] = CycleFetchOperation;
      code_40[7] = CycleFetchOperation;
      for (; (int)code_40._4_4_ < 0x100; code_40._4_4_ = code_40._4_4_ + 0x10) {
        stack0xfffffffffffff198 = 0x3742e25;
        paMVar2 = this->operations_ + (int)code_40._4_4_;
        *(MicroOp *)((long)paMVar2 + 0) = OperationLoadAddressZeroPage;
        *(MicroOp *)((long)paMVar2 + 1) = CycleFetchOperandFromAddress;
        *(MicroOp *)((long)paMVar2 + 2) = OperationBBRBBS;
        *(MicroOp *)((long)paMVar2 + 3) = OperationMoveToNextProgram;
        *(MicroOp *)((long)paMVar2 + 4) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 5) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 6) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 7) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 8) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 9) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 10) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 0xb) = CycleFetchOperation;
      }
      code_41[4] = CyclePushA;
      code_41[5] = CycleFetchOperation;
      code_41[6] = CycleFetchOperation;
      code_41[7] = CycleFetchOperation;
      for (; (int)code_41._4_4_ < 0x78; code_41._4_4_ = code_41._4_4_ + 0x10) {
        code_42[8] = OperationLoadAddressZeroPage;
        code_42[9] = CycleFetchOperandFromAddress;
        bVar1 = is_65c02(operations_6502[0x106]._4_4_);
        local_24b1 = CycleFetchOperandFromAddress;
        if (!bVar1) {
          local_24b1 = CycleWriteOperandToAddress;
        }
        code_42[10] = local_24b1;
        code_42[0xb] = OperationRMB;
        c_5._0_1_ = 0x2f;
        c_5._1_1_ = 3;
        local_24c0 = (MicroOp *)((long)&c_5 + 2);
        do {
          *local_24c0 = CycleFetchOperation;
          local_24c0 = local_24c0 + 1;
        } while (local_24c0 != code_41 + 4);
        *(ulong *)this->operations_[(int)code_41._4_4_] =
             CONCAT26(c_5._2_2_,
                      CONCAT15(3,CONCAT14(0x2f,CONCAT13(0x5f,CONCAT12(local_24b1,
                                                                      CONCAT11(code_42[9],code_42[8]
                                                                              ))))));
        *(undefined4 *)(this->operations_[(int)code_41._4_4_] + 8) = code_41._0_4_;
      }
      code_42[4] = OperationSetFlagsFromA;
      code_42[5] = CycleFetchOperation;
      code_42[6] = CycleFetchOperation;
      code_42[7] = CycleFetchOperation;
      for (; (int)code_42._4_4_ < 0xf8; code_42._4_4_ = code_42._4_4_ + 0x10) {
        bVar1 = is_65c02(operations_6502[0x106]._4_4_);
        local_24c9 = 0x2e;
        if (!bVar1) {
          local_24c9 = 0x2f;
        }
        location_1._0_1_ = 0x2f;
        location_1._1_1_ = 3;
        local_24d8 = (MicroOp *)((long)&location_1 + 2);
        do {
          *local_24d8 = CycleFetchOperation;
          local_24d8 = local_24d8 + 1;
        } while (local_24d8 != code_42 + 4);
        *(ulong *)this->operations_[(int)code_42._4_4_] =
             CONCAT26(location_1._2_2_,
                      CONCAT15(3,CONCAT14(0x2f,CONCAT13(0x60,CONCAT12(local_24c9,0x2e25)))));
        *(undefined4 *)(this->operations_[(int)code_42._4_4_] + 8) = code_42._0_4_;
      }
    }
    else {
      code_43[4] = OperationRSTPickVector;
      code_43[5] = CycleFetchOperation;
      code_43[6] = CycleFetchOperation;
      code_43[7] = CycleFetchOperation;
      for (; (int)code_43._4_4_ < 0xf0; code_43._4_4_ = code_43._4_4_ + 0x20) {
        paMVar2 = this->operations_ + (int)code_43._4_4_;
        *(MicroOp *)((long)paMVar2 + 0) = CycleLoadAddressAbsolute;
        *(MicroOp *)((long)paMVar2 + 1) = CycleFetchOperandFromAddress;
        *(MicroOp *)((long)paMVar2 + 2) = OperationMoveToNextProgram;
        *(MicroOp *)((long)paMVar2 + 3) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 4) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 5) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 6) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 7) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 8) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 9) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 10) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 0xb) = CycleFetchOperation;
      }
      code_44[4] = CycleReadAddressHLoadAddressL;
      code_44[5] = CycleFetchOperation;
      code_44[6] = CycleFetchOperation;
      code_44[7] = CycleFetchOperation;
      for (; (int)code_44._4_4_ < 0x100; code_44._4_4_ = code_44._4_4_ + 0x20) {
        paMVar2 = this->operations_ + (int)code_44._4_4_;
        *(MicroOp *)((long)paMVar2 + 0) = CycleLoadAddressAbsolute;
        *(MicroOp *)((long)paMVar2 + 1) = CycleAddXToAddressLow;
        *(MicroOp *)((long)paMVar2 + 2) = OperationCorrectAddressHigh;
        *(MicroOp *)((long)paMVar2 + 3) = CycleFetchOperandFromAddress;
        *(MicroOp *)((long)paMVar2 + 4) = OperationMoveToNextProgram;
        *(MicroOp *)((long)paMVar2 + 5) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 6) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 7) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 8) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 9) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 10) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 0xb) = CycleFetchOperation;
      }
      code_45[4] = CyclePushA;
      code_45[5] = CycleFetchOperation;
      code_45[6] = CycleFetchOperation;
      code_45[7] = CycleFetchOperation;
      for (; (int)code_45._4_4_ < 0xe8; code_45._4_4_ = code_45._4_4_ + 0x20) {
        paMVar2 = this->operations_ + (int)code_45._4_4_;
        *(MicroOp *)((long)paMVar2 + 0) = OperationLoadAddressZeroPage;
        *(MicroOp *)((long)paMVar2 + 1) = CycleFetchOperandFromAddress;
        *(MicroOp *)((long)paMVar2 + 2) = OperationMoveToNextProgram;
        *(MicroOp *)((long)paMVar2 + 3) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 4) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 5) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 6) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 7) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 8) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 9) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 10) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 0xb) = CycleFetchOperation;
      }
      code_46[4] = CyclePullX;
      code_46[5] = CycleFetchOperation;
      code_46[6] = CycleFetchOperation;
      code_46[7] = CycleFetchOperation;
      for (; (int)code_46._4_4_ < 0xf8; code_46._4_4_ = code_46._4_4_ + 0x20) {
        paMVar2 = this->operations_ + (int)code_46._4_4_;
        *(MicroOp *)((long)paMVar2 + 0) = CycleLoadAddessZeroX;
        *(MicroOp *)((long)paMVar2 + 1) = CycleFetchOperandFromAddress;
        *(MicroOp *)((long)paMVar2 + 2) = OperationMoveToNextProgram;
        *(MicroOp *)((long)paMVar2 + 3) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 4) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 5) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 6) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 7) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 8) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 9) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 10) = CycleFetchOperation;
        *(MicroOp *)((long)paMVar2 + 0xb) = CycleFetchOperation;
      }
    }
    bVar1 = has_stpwai(operations_6502[0x106]._4_4_);
    if (bVar1) {
      *(MicroOp *)((long)(this->operations_ + 0xcb) + 0) = OperationScheduleWait;
      *(MicroOp *)((long)(this->operations_ + 0xcb) + 1) = OperationMoveToNextProgram;
      *(MicroOp *)((long)(this->operations_ + 0xcb) + 2) = CycleFetchOperation;
      *(MicroOp *)((long)(this->operations_ + 0xcb) + 3) = CycleFetchOperation;
      *(MicroOp *)((long)(this->operations_ + 0xcb) + 4) = CycleFetchOperation;
      *(MicroOp *)((long)(this->operations_ + 0xcb) + 5) = CycleFetchOperation;
      *(MicroOp *)((long)(this->operations_ + 0xcb) + 6) = CycleFetchOperation;
      *(MicroOp *)((long)(this->operations_ + 0xcb) + 7) = CycleFetchOperation;
      paMVar2 = this->operations_;
      *(MicroOp *)((long)(paMVar2 + 0xcb) + 8) = CycleFetchOperation;
      *(MicroOp *)((long)(paMVar2 + 0xcb) + 9) = CycleFetchOperation;
      *(MicroOp *)((long)(paMVar2 + 0xcb) + 10) = CycleFetchOperation;
      *(MicroOp *)((long)(paMVar2 + 0xcb) + 0xb) = CycleFetchOperation;
      *(MicroOp *)((long)(this->operations_ + 0xdb) + 0) = OperationScheduleStop;
      *(MicroOp *)((long)(this->operations_ + 0xdb) + 1) = OperationMoveToNextProgram;
      *(MicroOp *)((long)(this->operations_ + 0xdb) + 2) = CycleFetchOperation;
      *(MicroOp *)((long)(this->operations_ + 0xdb) + 3) = CycleFetchOperation;
      *(MicroOp *)((long)(this->operations_ + 0xdb) + 4) = CycleFetchOperation;
      *(MicroOp *)((long)(this->operations_ + 0xdb) + 5) = CycleFetchOperation;
      *(MicroOp *)((long)(this->operations_ + 0xdb) + 6) = CycleFetchOperation;
      *(MicroOp *)((long)(this->operations_ + 0xdb) + 7) = CycleFetchOperation;
      paMVar2 = this->operations_;
      *(MicroOp *)((long)(paMVar2 + 0xdb) + 8) = CycleFetchOperation;
      *(MicroOp *)((long)(paMVar2 + 0xdb) + 9) = CycleFetchOperation;
      *(MicroOp *)((long)(paMVar2 + 0xdb) + 10) = CycleFetchOperation;
      *(MicroOp *)((long)(paMVar2 + 0xdb) + 0xb) = CycleFetchOperation;
    }
    else {
      *(MicroOp *)((long)(this->operations_ + 0xcb) + 0) = OperationMoveToNextProgram;
      *(MicroOp *)((long)(this->operations_ + 0xcb) + 1) = CycleFetchOperation;
      *(MicroOp *)((long)(this->operations_ + 0xcb) + 2) = CycleFetchOperation;
      *(MicroOp *)((long)(this->operations_ + 0xcb) + 3) = CycleFetchOperation;
      *(MicroOp *)((long)(this->operations_ + 0xcb) + 4) = CycleFetchOperation;
      *(MicroOp *)((long)(this->operations_ + 0xcb) + 5) = CycleFetchOperation;
      *(MicroOp *)((long)(this->operations_ + 0xcb) + 6) = CycleFetchOperation;
      *(MicroOp *)((long)(this->operations_ + 0xcb) + 7) = CycleFetchOperation;
      paMVar2 = this->operations_;
      *(MicroOp *)((long)(paMVar2 + 0xcb) + 8) = CycleFetchOperation;
      *(MicroOp *)((long)(paMVar2 + 0xcb) + 9) = CycleFetchOperation;
      *(MicroOp *)((long)(paMVar2 + 0xcb) + 10) = CycleFetchOperation;
      *(MicroOp *)((long)(paMVar2 + 0xcb) + 0xb) = CycleFetchOperation;
      *(MicroOp *)((long)(this->operations_ + 0xdb) + 0) = CycleLoadAddessZeroX;
      *(MicroOp *)((long)(this->operations_ + 0xdb) + 1) = CycleFetchOperandFromAddress;
      *(MicroOp *)((long)(this->operations_ + 0xdb) + 2) = OperationMoveToNextProgram;
      *(MicroOp *)((long)(this->operations_ + 0xdb) + 3) = CycleFetchOperation;
      *(MicroOp *)((long)(this->operations_ + 0xdb) + 4) = CycleFetchOperation;
      *(MicroOp *)((long)(this->operations_ + 0xdb) + 5) = CycleFetchOperation;
      *(MicroOp *)((long)(this->operations_ + 0xdb) + 6) = CycleFetchOperation;
      *(MicroOp *)((long)(this->operations_ + 0xdb) + 7) = CycleFetchOperation;
      paMVar2 = this->operations_;
      *(MicroOp *)((long)(paMVar2 + 0xdb) + 8) = CycleFetchOperation;
      *(MicroOp *)((long)(paMVar2 + 0xdb) + 9) = CycleFetchOperation;
      *(MicroOp *)((long)(paMVar2 + 0xdb) + 10) = CycleFetchOperation;
      *(MicroOp *)((long)(paMVar2 + 0xdb) + 0xb) = CycleFetchOperation;
    }
  }
  return;
}

Assistant:

ProcessorStorage::ProcessorStorage(Personality personality) {
	const InstructionList operations_6502[] = {
		/* 0x00 BRK */			Program(CycleIncPCPushPCH, CyclePushPCL, OperationBRKPickVector, OperationSetOperandFromFlagsWithBRKSet, CyclePushOperand, OperationSetIRQFlags, CycleReadVectorLow, CycleReadVectorHigh),
		/* 0x01 ORA x, ind */	IndexedIndirectRead(OperationORA),
		/* 0x02 JAM */			JAM,																	/* 0x03 ASO x, ind */	IndexedIndirectReadModifyWrite(OperationASO),
		/* 0x04 NOP zpg */		ZeroNop(),																/* 0x05 ORA zpg */		ZeroRead(OperationORA),
		/* 0x06 ASL zpg */		ZeroReadModifyWrite(OperationASL),										/* 0x07 ASO zpg */		ZeroReadModifyWrite(OperationASO),
		/* 0x08 PHP */			Program(OperationSetOperandFromFlagsWithBRKSet, CyclePushOperand),
		/* 0x09 ORA # */		Immediate(OperationORA),
		/* 0x0a ASL A */		Implied(OperationASL),													/* 0x0b ANC # */		Immediate(OperationANC),
		/* 0x0c NOP abs */		AbsoluteNop(),															/* 0x0d ORA abs */		AbsoluteRead(OperationORA),
		/* 0x0e ASL abs */		AbsoluteReadModifyWrite(OperationASL),									/* 0x0f ASO abs */		AbsoluteReadModifyWrite(OperationASO),
		/* 0x10 BPL */			Program(OperationBPL),													/* 0x11 ORA ind, y */	IndirectIndexedRead(OperationORA),
		/* 0x12 JAM */			JAM,																	/* 0x13 ASO ind, y */	IndirectIndexedReadModifyWrite(OperationASO),
		/* 0x14 NOP zpg, x */	ZeroXNop(),																/* 0x15 ORA zpg, x */	ZeroXRead(OperationORA),
		/* 0x16 ASL zpg, x */	ZeroXReadModifyWrite(OperationASL),										/* 0x17 ASO zpg, x */	ZeroXReadModifyWrite(OperationASO),
		/* 0x18 CLC */			Program(OperationCLC),													/* 0x19 ORA abs, y */	AbsoluteYRead(OperationORA),
		/* 0x1a NOP # */		ImpliedNop(),															/* 0x1b ASO abs, y */	AbsoluteYReadModifyWrite(OperationASO),
		/* 0x1c NOP abs, x */	AbsoluteXNop(),															/* 0x1d ORA abs, x */	AbsoluteXRead(OperationORA),
		/* 0x1e ASL abs, x */	AbsoluteXReadModifyWrite(OperationASL),									/* 0x1f ASO abs, x */	AbsoluteXReadModifyWrite(OperationASO),
		/* 0x20 JSR abs */		Program(CycleIncrementPCAndReadStack, CyclePushPCH, CyclePushPCL, CycleReadPCHLoadPCL),
		/* 0x21 AND x, ind */	IndexedIndirectRead(OperationAND),
		/* 0x22 JAM */			JAM,																	/* 0x23 RLA x, ind */	IndexedIndirectReadModifyWrite(OperationRLA),
		/* 0x24 BIT zpg */		ZeroRead(OperationBIT),													/* 0x25 AND zpg */		ZeroRead(OperationAND),
		/* 0x26 ROL zpg */		ZeroReadModifyWrite(OperationROL),										/* 0x27 RLA zpg */		ZeroReadModifyWrite(OperationRLA),
		/* 0x28 PLP */			Program(CycleReadFromS, CyclePullOperand, OperationSetFlagsFromOperand),
		/* 0x29 AND A # */		Immediate(OperationAND),
		/* 0x2a ROL A */		Implied(OperationROL),													/* 0x2b ANC # */		Immediate(OperationANC),
		/* 0x2c BIT abs */		AbsoluteRead(OperationBIT),												/* 0x2d AND abs */		AbsoluteRead(OperationAND),
		/* 0x2e ROL abs */		AbsoluteReadModifyWrite(OperationROL),									/* 0x2f RLA abs */		AbsoluteReadModifyWrite(OperationRLA),
		/* 0x30 BMI */			Program(OperationBMI),													/* 0x31 AND ind, y */	IndirectIndexedRead(OperationAND),
		/* 0x32 JAM */			JAM,																	/* 0x33 RLA ind, y */	IndirectIndexedReadModifyWrite(OperationRLA),
		/* 0x34 NOP zpg, x */	ZeroXNop(),																/* 0x35 AND zpg, x */	ZeroXRead(OperationAND),
		/* 0x36 ROL zpg, x */	ZeroXReadModifyWrite(OperationROL),										/* 0x37 RLA zpg, x */	ZeroXReadModifyWrite(OperationRLA),
		/* 0x38 SEC */			Program(OperationSEC),													/* 0x39 AND abs, y */	AbsoluteYRead(OperationAND),
		/* 0x3a NOP # */		ImpliedNop(),															/* 0x3b RLA abs, y */	AbsoluteYReadModifyWrite(OperationRLA),
		/* 0x3c NOP abs, x */	AbsoluteXNop(),															/* 0x3d AND abs, x */	AbsoluteXRead(OperationAND),
		/* 0x3e ROL abs, x */	AbsoluteXReadModifyWrite(OperationROL),									/* 0x3f RLA abs, x */	AbsoluteXReadModifyWrite(OperationRLA),
		/* 0x40 RTI */			Program(CycleReadFromS, CyclePullOperand, OperationSetFlagsFromOperand, CyclePullPCL, CyclePullPCH),
		/* 0x41 EOR x, ind */	IndexedIndirectRead(OperationEOR),
		/* 0x42 JAM */			JAM,																	/* 0x43 LSE x, ind */	IndexedIndirectReadModifyWrite(OperationLSE),
		/* 0x44 NOP zpg */		ZeroNop(),																/* 0x45 EOR zpg */		ZeroRead(OperationEOR),
		/* 0x46 LSR zpg */		ZeroReadModifyWrite(OperationLSR),										/* 0x47 LSE zpg */		ZeroReadModifyWrite(OperationLSE),
		/* 0x48 PHA */			Program(CyclePushA),													/* 0x49 EOR # */		Immediate(OperationEOR),
		/* 0x4a LSR A */		Implied(OperationLSR),													/* 0x4b ASR A */		Immediate(OperationASR),
		/* 0x4c JMP abs */		Program(CycleIncrementPCReadPCHLoadPCL),								/* 0x4d EOR abs */		AbsoluteRead(OperationEOR),
		/* 0x4e LSR abs */		AbsoluteReadModifyWrite(OperationLSR),									/* 0x4f LSE abs */		AbsoluteReadModifyWrite(OperationLSE),
		/* 0x50 BVC */			Program(OperationBVC),													/* 0x51 EOR ind, y */	IndirectIndexedRead(OperationEOR),
		/* 0x52 JAM */			JAM,																	/* 0x53 LSE ind, y */	IndirectIndexedReadModifyWrite(OperationLSE),
		/* 0x54 NOP zpg, x */	ZeroXNop(),																/* 0x55 EOR zpg, x */	ZeroXRead(OperationEOR),
		/* 0x56 LSR zpg, x */	ZeroXReadModifyWrite(OperationLSR),										/* 0x57 LSE zpg, x */	ZeroXReadModifyWrite(OperationLSE),
		/* 0x58 CLI */			Program(OperationCLI),													/* 0x59 EOR abs, y */	AbsoluteYRead(OperationEOR),
		/* 0x5a NOP # */		ImpliedNop(),															/* 0x5b LSE abs, y */	AbsoluteYReadModifyWrite(OperationLSE),
		/* 0x5c NOP abs, x */	AbsoluteXNop(),															/* 0x5d EOR abs, x */	AbsoluteXRead(OperationEOR),
		/* 0x5e LSR abs, x */	AbsoluteXReadModifyWrite(OperationLSR),									/* 0x5f LSE abs, x */	AbsoluteXReadModifyWrite(OperationLSE),
		/* 0x60 RTS */			Program(CycleReadFromS, CyclePullPCL, CyclePullPCH, CycleReadAndIncrementPC),
		/* 0x61 ADC x, ind */	IndexedIndirectRead(OperationADC),
		/* 0x62 JAM */			JAM,																	/* 0x63 RRA x, ind */	IndexedIndirectReadModifyWrite(OperationRRA, OperationADC),
		/* 0x64 NOP zpg */		ZeroNop(),																/* 0x65 ADC zpg */		ZeroRead(OperationADC),
		/* 0x66 ROR zpg */		ZeroReadModifyWrite(OperationROR),										/* 0x67 RRA zpg */		ZeroReadModifyWrite(OperationRRA, OperationADC),
		/* 0x68 PLA */			Program(CycleReadFromS, CyclePullA, OperationSetFlagsFromA),			/* 0x69 ADC # */		Immediate(OperationADC),
		/* 0x6a ROR A */		Implied(OperationROR),													/* 0x6b ARR # */		Immediate(OperationARR),
		/* 0x6c JMP (abs) */	Program(CycleReadAddressHLoadAddressL, CycleReadPCLFromAddress, CycleReadPCHFromAddressLowInc),
		/* 0x6d ADC abs */		AbsoluteRead(OperationADC),
		/* 0x6e ROR abs */		AbsoluteReadModifyWrite(OperationROR),									/* 0x6f RRA abs */		AbsoluteReadModifyWrite(OperationRRA, OperationADC),
		/* 0x70 BVS */			Program(OperationBVS),													/* 0x71 ADC ind, y */	IndirectIndexedRead(OperationADC),
		/* 0x72 JAM */			JAM,																	/* 0x73 RRA ind, y */	IndirectIndexedReadModifyWrite(OperationRRA, OperationADC),
		/* 0x74 NOP zpg, x */	ZeroXNop(),																/* 0x75 ADC zpg, x */	ZeroXRead(OperationADC),
		/* 0x76 ROR zpg, x */	ZeroXReadModifyWrite(OperationROR),										/* 0x77 RRA zpg, x */	ZeroXReadModifyWrite(OperationRRA, OperationADC),
		/* 0x78 SEI */			Program(OperationSEI),													/* 0x79 ADC abs, y */	AbsoluteYRead(OperationADC),
		/* 0x7a NOP # */		ImpliedNop(),															/* 0x7b RRA abs, y */	AbsoluteYReadModifyWrite(OperationRRA, OperationADC),
		/* 0x7c NOP abs, x */	AbsoluteXNop(),															/* 0x7d ADC abs, x */	AbsoluteXRead(OperationADC),
		/* 0x7e ROR abs, x */	AbsoluteXReadModifyWrite(OperationROR),									/* 0x7f RRA abs, x */	AbsoluteXReadModifyWrite(OperationRRA, OperationADC),
		/* 0x80 NOP # */		ImmediateNop(),															/* 0x81 STA x, ind */	IndexedIndirectWrite(OperationSTA),
		/* 0x82 NOP # */		ImmediateNop(),															/* 0x83 SAX x, ind */	IndexedIndirectWrite(OperationSAX),
		/* 0x84 STY zpg */		ZeroWrite(OperationSTY),												/* 0x85 STA zpg */		ZeroWrite(OperationSTA),
		/* 0x86 STX zpg */		ZeroWrite(OperationSTX),												/* 0x87 SAX zpg */		ZeroWrite(OperationSAX),
		/* 0x88 DEY */			Program(OperationDEY),													/* 0x89 NOP # */		ImmediateNop(),
		/* 0x8a TXA */			Program(OperationTXA),													/* 0x8b ANE # */		Immediate(OperationANE),
		/* 0x8c STY abs */		AbsoluteWrite(OperationSTY),											/* 0x8d STA abs */		AbsoluteWrite(OperationSTA),
		/* 0x8e STX abs */		AbsoluteWrite(OperationSTX),											/* 0x8f SAX abs */		AbsoluteWrite(OperationSAX),
		/* 0x90 BCC */			Program(OperationBCC),													/* 0x91 STA ind, y */	IndirectIndexedWrite(OperationSTA),
		/* 0x92 JAM */			JAM,																	/* 0x93 SHA ind, y */	IndirectIndexedWrite(OperationSHA),
		/* 0x94 STY zpg, x */	ZeroXWrite(OperationSTY),												/* 0x95 STA zpg, x */	ZeroXWrite(OperationSTA),
		/* 0x96 STX zpg, y */	ZeroYWrite(OperationSTX),												/* 0x97 SAX zpg, y */	ZeroYWrite(OperationSAX),
		/* 0x98 TYA */			Program(OperationTYA),													/* 0x99 STA abs, y */	AbsoluteYWrite(OperationSTA),
		/* 0x9a TXS */			Program(OperationTXS),													/* 0x9b SHS abs, y */	AbsoluteYWrite(OperationSHS),
		/* 0x9c SHY abs, x */	AbsoluteXWrite(OperationSHY),											/* 0x9d STA abs, x */	AbsoluteXWrite(OperationSTA),
		/* 0x9e SHX abs, y */	AbsoluteYWrite(OperationSHX),											/* 0x9f SHA abs, y */	AbsoluteYWrite(OperationSHA),
		/* 0xa0 LDY # */		Immediate(OperationLDY),												/* 0xa1 LDA x, ind */	IndexedIndirectRead(OperationLDA),
		/* 0xa2 LDX # */		Immediate(OperationLDX),												/* 0xa3 LAX x, ind */	IndexedIndirectRead(OperationLAX),
		/* 0xa4 LDY zpg */		ZeroRead(OperationLDY),													/* 0xa5 LDA zpg */		ZeroRead(OperationLDA),
		/* 0xa6 LDX zpg */		ZeroRead(OperationLDX),													/* 0xa7 LAX zpg */		ZeroRead(OperationLAX),
		/* 0xa8 TAY */			Program(OperationTAY),													/* 0xa9 LDA # */		Immediate(OperationLDA),
		/* 0xaa TAX */			Program(OperationTAX),													/* 0xab LXA # */		Immediate(OperationLXA),
		/* 0xac LDY abs */		AbsoluteRead(OperationLDY),												/* 0xad LDA abs */		AbsoluteRead(OperationLDA),
		/* 0xae LDX abs */		AbsoluteRead(OperationLDX),												/* 0xaf LAX abs */		AbsoluteRead(OperationLAX),
		/* 0xb0 BCS */			Program(OperationBCS),													/* 0xb1 LDA ind, y */	IndirectIndexedRead(OperationLDA),
		/* 0xb2 JAM */			JAM,																	/* 0xb3 LAX ind, y */	IndirectIndexedRead(OperationLAX),
		/* 0xb4 LDY zpg, x */	ZeroXRead(OperationLDY),												/* 0xb5 LDA zpg, x */	ZeroXRead(OperationLDA),
		/* 0xb6 LDX zpg, y */	ZeroYRead(OperationLDX),												/* 0xb7 LAX zpg, x */	ZeroYRead(OperationLAX),
		/* 0xb8 CLV */			Program(OperationCLV),													/* 0xb9 LDA abs, y */	AbsoluteYRead(OperationLDA),
		/* 0xba TSX */			Program(OperationTSX),													/* 0xbb LAS abs, y */	AbsoluteYRead(OperationLAS),
		/* 0xbc LDY abs, x */	AbsoluteXRead(OperationLDY),											/* 0xbd LDA abs, x */	AbsoluteXRead(OperationLDA),
		/* 0xbe LDX abs, y */	AbsoluteYRead(OperationLDX),											/* 0xbf LAX abs, y */	AbsoluteYRead(OperationLAX),
		/* 0xc0 CPY # */		Immediate(OperationCPY),												/* 0xc1 CMP x, ind */	IndexedIndirectRead(OperationCMP),
		/* 0xc2 NOP # */		ImmediateNop(),															/* 0xc3 DCP x, ind */	IndexedIndirectReadModifyWrite(OperationDecrementOperand, OperationCMP),
		/* 0xc4 CPY zpg */		ZeroRead(OperationCPY),													/* 0xc5 CMP zpg */		ZeroRead(OperationCMP),
		/* 0xc6 DEC zpg */		ZeroReadModifyWrite(OperationDEC),										/* 0xc7 DCP zpg */		ZeroReadModifyWrite(OperationDecrementOperand, OperationCMP),
		/* 0xc8 INY */			Program(OperationINY),													/* 0xc9 CMP # */		Immediate(OperationCMP),
		/* 0xca DEX */			Program(OperationDEX),													/* 0xcb ARR # */		Immediate(OperationSBX),
		/* 0xcc CPY abs */		AbsoluteRead(OperationCPY),												/* 0xcd CMP abs */		AbsoluteRead(OperationCMP),
		/* 0xce DEC abs */		AbsoluteReadModifyWrite(OperationDEC),									/* 0xcf DCP abs */		AbsoluteReadModifyWrite(OperationDecrementOperand, OperationCMP),
		/* 0xd0 BNE */			Program(OperationBNE),													/* 0xd1 CMP ind, y */	IndirectIndexedRead(OperationCMP),
		/* 0xd2 JAM */			JAM,																	/* 0xd3 DCP ind, y */	IndirectIndexedReadModifyWrite(OperationDecrementOperand, OperationCMP),
		/* 0xd4 NOP zpg, x */	ZeroXNop(),																/* 0xd5 CMP zpg, x */	ZeroXRead(OperationCMP),
		/* 0xd6 DEC zpg, x */	ZeroXReadModifyWrite(OperationDEC),										/* 0xd7 DCP zpg, x */	ZeroXReadModifyWrite(OperationDecrementOperand, OperationCMP),
		/* 0xd8 CLD */			Program(OperationCLD),													/* 0xd9 CMP abs, y */	AbsoluteYRead(OperationCMP),
		/* 0xda NOP # */		ImpliedNop(),															/* 0xdb DCP abs, y */	AbsoluteYReadModifyWrite(OperationDecrementOperand, OperationCMP),
		/* 0xdc NOP abs, x */	AbsoluteXNop(),															/* 0xdd CMP abs, x */	AbsoluteXRead(OperationCMP),
		/* 0xde DEC abs, x */	AbsoluteXReadModifyWrite(OperationDEC),									/* 0xdf DCP abs, x */	AbsoluteXReadModifyWrite(OperationDecrementOperand, OperationCMP),
		/* 0xe0 CPX # */		Immediate(OperationCPX),												/* 0xe1 SBC x, ind */	IndexedIndirectRead(OperationSBC),
		/* 0xe2 NOP # */		ImmediateNop(),															/* 0xe3 INS x, ind */	IndexedIndirectReadModifyWrite(OperationINS),
		/* 0xe4 CPX zpg */		ZeroRead(OperationCPX),													/* 0xe5 SBC zpg */		ZeroRead(OperationSBC),
		/* 0xe6 INC zpg */		ZeroReadModifyWrite(OperationINC),										/* 0xe7 INS zpg */		ZeroReadModifyWrite(OperationINS),
		/* 0xe8 INX */			Program(OperationINX),													/* 0xe9 SBC # */		Immediate(OperationSBC),
		/* 0xea NOP # */		ImpliedNop(),															/* 0xeb SBC # */		Immediate(OperationSBC),
		/* 0xec CPX abs */		AbsoluteRead(OperationCPX),												/* 0xed SBC abs */		AbsoluteRead(OperationSBC),
		/* 0xee INC abs */		AbsoluteReadModifyWrite(OperationINC),									/* 0xef INS abs */		AbsoluteReadModifyWrite(OperationINS),
		/* 0xf0 BEQ */			Program(OperationBEQ),													/* 0xf1 SBC ind, y */	IndirectIndexedRead(OperationSBC),
		/* 0xf2 JAM */			JAM,																	/* 0xf3 INS ind, y */	IndirectIndexedReadModifyWrite(OperationINS),
		/* 0xf4 NOP zpg, x */	ZeroXNop(),																/* 0xf5 SBC zpg, x */	ZeroXRead(OperationSBC),
		/* 0xf6 INC zpg, x */	ZeroXReadModifyWrite(OperationINC),										/* 0xf7 INS zpg, x */	ZeroXReadModifyWrite(OperationINS),
		/* 0xf8 SED */			Program(OperationSED),													/* 0xf9 SBC abs, y */	AbsoluteYRead(OperationSBC),
		/* 0xfa NOP # */		ImpliedNop(),															/* 0xfb INS abs, y */	AbsoluteYReadModifyWrite(OperationINS),
		/* 0xfc NOP abs, x */	AbsoluteXNop(),															/* 0xfd SBC abs, x */	AbsoluteXRead(OperationSBC),
		/* 0xfe INC abs, x */	AbsoluteXReadModifyWrite(OperationINC),									/* 0xff INS abs, x */	AbsoluteXReadModifyWrite(OperationINS),

		/* 0x100: Fetch, decode, execute. */
		{
			CycleFetchOperation,
			CycleFetchOperand,
			OperationDecodeOperation
		},

		/* 0x101: Reset. */
		Program(
			CycleFetchOperand,
			CycleFetchOperand,
			CycleNoWritePush,
			CycleNoWritePush,
			OperationRSTPickVector,
			CycleNoWritePush,
			OperationSetNMIRSTFlags,
			CycleReadVectorLow,
			CycleReadVectorHigh
		),

		/* 0x102: IRQ. */
		Program(
			CycleFetchOperand,
			CycleFetchOperand,
			CyclePushPCH,
			CyclePushPCL,
			OperationBRKPickVector,
			OperationSetOperandFromFlags,
			CyclePushOperand,
			OperationSetIRQFlags,
			CycleReadVectorLow,
			CycleReadVectorHigh
		),

		/* 0x103: NMI. */
		Program(
			CycleFetchOperand,
			CycleFetchOperand,
			CyclePushPCH,
			CyclePushPCL,
			OperationNMIPickVector,
			OperationSetOperandFromFlags,
			CyclePushOperand,
			OperationSetNMIRSTFlags,
			CycleReadVectorLow,
			CycleReadVectorHigh
		),

		/* 0x104: Do BRA. */
		Program(
			CycleReadFromPC,
			CycleAddSignedOperandToPC
		),

		/* 0x105: Do BBR or BBS. */
		Program(
			CycleFetchOperand,				// Fetch offset.
			OperationIncrementPC,
			CycleFetchFromHalfUpdatedPC,
			OperationAddSignedOperandToPC16
		),

		/* 0x106: Complete BBR or BBS without branching. */
		Program(
			CycleFetchOperand,
			OperationIncrementPC,
			CycleFetchFromHalfUpdatedPC
		)
	};

	static_assert(sizeof(operations_6502) == sizeof(operations_));

	// Install the basic 6502 table.
	memcpy(operations_, operations_6502, sizeof(operations_));

	// Patch the table according to the chip's personality.
	//
	// The 6502 and NES 6502 both have the same mapping of operation codes to actions
	// (respect for the decimal mode flag aside); included in that are 'unofficial'
	// operations — spots that are not formally defined to do anything but which the
	// processor makes no particular effort to react to in a well-defined way.
	//
	// The 65C02s add some official instructions but also ensure that all of the
	// undefined ones act as no-ops of various addressing modes.
	//
	// So the branch below has to add a bunch of new actions but also removes various
	// others by dint of replacing them with NOPs.
	//
	// Those 6502 opcodes that need redefining, one way or the other, are:
	//
	// 0x02, 0x03, 0x04, 0x07, 0x0b, 0x0c, 0x0f, 0x12, 0x13, 0x14, 0x17, 0x1a, 0x1b, 0x1c, 0x1f,
	// 0x22, 0x23, 0x27, 0x2b, 0x2f, 0x32, 0x33, 0x34, 0x37, 0x3a, 0x3b, 0x3c, 0x3f,
	// 0x42, 0x43, 0x47, 0x4b, 0x4f, 0x52, 0x53, 0x57, 0x5a, 0x5b, 0x5f,
	// 0x62, 0x63, 0x64, 0x67, 0x6b, 0x6f, 0x72, 0x73, 0x74, 0x77, 0x7b, 0x7a, 0x7c, 0x7f,
	// 0x80, 0x82, 0x83, 0x87, 0x89, 0x8b, 0x8f, 0x92, 0x93, 0x97, 0x9b, 0x9e, 0x9c, 0x9f,
	// 0xa3, 0xa7, 0xab, 0xaf, 0xb2, 0xb3, 0xb7, 0xbb, 0xbf,
	// 0xc3, 0xc7, 0xcb, 0xcf, 0xd2, 0xd3, 0xd7, 0xda, 0xdb, 0xdf,
	// 0xe3, 0xe7, 0xeb, 0xef, 0xf2, 0xf3, 0xf7, 0xfa, 0xfb, 0xff
	//
	// ... not including those that aren't defined on the 6502 but perform NOPs exactly like they
	// would on a 65C02.

#define Install(location, instructions) {\
		const InstructionList code = instructions;	\
		memcpy(&operations_[location], code, sizeof(InstructionList));	\
	}
	if(is_65c02(personality)) {
		// Add P[L/H][X/Y].
		Install(0x5a, Program(CyclePushY));
		Install(0xda, Program(CyclePushX));
		Install(0x7a, Program(CycleReadFromS, CyclePullY, OperationSetFlagsFromY));
		Install(0xfa, Program(CycleReadFromS, CyclePullX, OperationSetFlagsFromX));

		// Add BRA.
		Install(0x80, Program(OperationBRA));

		// The 1-byte, 1-cycle (!) NOPs.
		for(int c = 0x03; c <= 0xf3; c += 0x10) {
			Install(c, ImpliedNop());
		}
		for(int c = 0x0b; c <= 0xbb; c += 0x10) {
			Install(c, ImpliedNop());
		}
		for(int c = 0xeb; c <= 0xfb; c += 0x10) {
			Install(c, ImpliedNop());
		}

		// The 2-byte, 2-cycle NOPs that the 6502 doesn't have.
		for(int c = 0x02; c <= 0x62; c += 0x10) {
			Install(c, ImmediateNop());
		}

		// Correct JMP (abs) and install JMP (abs, x).
		//
		// Guess: JMP (abs, x), being listed at a fixed 6 cycles, uses the slower abs,x of INC and DEC.
		Install(0x6c, Program(CycleReadAddressHLoadAddressL, CycleReadPCLFromAddress, CycleReadPCHFromAddressLowInc, CycleReadPCHFromAddressFixed));
		Install(0x7c, Program(
			CycleReadAddressHLoadAddressL,	// (3) read second byte of (addr)
			CycleAddXToAddressLowRead,
			OperationCorrectAddressHigh,	// (4) read from incorrectly-calculated address
			CycleReadPCLFromAddress,		// (5) read from real (addr+x)
			CycleReadPCHFromAddressInc		// (6) read from addr+x+1
		));

		// Add INA and DEA.
		Install(0x1a, Program(OperationINA));
		Install(0x3a, Program(OperationDEA));

		// Add (zp) operations.
		Install(0x12, ZeroIndirectRead(OperationORA));
		Install(0x32, ZeroIndirectRead(OperationAND));
		Install(0x52, ZeroIndirectRead(OperationEOR));
		Install(0x72, ZeroIndirectRead(OperationADC));
		Install(0x92, ZeroIndirectWrite(OperationSTA));
		Install(0xb2, ZeroIndirectRead(OperationLDA));
		Install(0xd2, ZeroIndirectRead(OperationCMP));
		Install(0xf2, ZeroIndirectRead(OperationSBC));

		// Add STZ.
		Install(0x9c, AbsoluteWrite(OperationSTZ));
		Install(0x9e, AbsoluteXWrite(OperationSTZ));
		Install(0x64, ZeroWrite(OperationSTZ));
		Install(0x74, ZeroXWrite(OperationSTZ));

		// Add the extra BITs.
		Install(0x34, ZeroXRead(OperationBIT));
		Install(0x3c, AbsoluteXRead(OperationBIT));
		Install(0x89, Immediate(OperationBITNoNV));

		// Add TRB and TSB.
		Install(0x04, ZeroReadModifyWrite(OperationTSB));
		Install(0x0c, AbsoluteReadModifyWrite(OperationTSB));
		Install(0x14, ZeroReadModifyWrite(OperationTRB));
		Install(0x1c, AbsoluteReadModifyWrite(OperationTRB));

		// Install faster ASL, LSR, ROL, ROR abs,[x/y]. Note: INC, DEC deliberately not improved.
		Install(0x1e, FastAbsoluteXReadModifyWrite(OperationASL));
		Install(0x1f, FastAbsoluteXReadModifyWrite(OperationASO));
		Install(0x3e, FastAbsoluteXReadModifyWrite(OperationROL));
		Install(0x3f, FastAbsoluteXReadModifyWrite(OperationRLA));
		Install(0x5e, FastAbsoluteXReadModifyWrite(OperationLSR));
		Install(0x5f, FastAbsoluteXReadModifyWrite(OperationLSE));
		Install(0x7e, FastAbsoluteXReadModifyWrite(OperationROR));
		Install(0x7f, FastAbsoluteXReadModifyWrite(OperationRRA, OperationADC));

		// Outstanding:
		// 0x07, 0x0f, 0x17, 0x1f,
		// 0x27, 0x2f, 0x37, 0x3f,
		// 0x47, 0x4f, 0x57, 0x5f,
		// 0x67, 0x6f, 0x77, 0x7f,
		// 0x87, 0x8f, 0x97, 0x9f,
		// 0xa7, 0xaf, 0xb7, 0xbf,
		// 0xc7, 0xcb, 0xcf, 0xd7, 0xdb, 0xdf,
		// 0xe7, 0xef, 0xf7, 0xff
		if(has_bbrbbsrmbsmb(personality)) {
			// Add BBS and BBR. These take five cycles. My guessed breakdown is:
			// 1. read opcode
			// 2. read operand
			// 3. read zero page
			// 4. read second operand
			// 5. read from PC without top byte fixed yet
			// ... with the caveat that (3) and (4) could be the other way around.
			for(int location = 0x0f; location <= 0xff; location += 0x10) {
				Install(location, Program(OperationLoadAddressZeroPage, CycleFetchOperandFromAddress, OperationBBRBBS));
			}

			// Add RMB and SMB.
			for(int c = 0x07; c <= 0x77; c += 0x10) {
				Install(c, ZeroReadModifyWrite(OperationRMB));
			}
			for(int c = 0x87; c <= 0xf7; c += 0x10) {
				Install(c, ZeroReadModifyWrite(OperationSMB));
			}
		} else {
			for(int location = 0x0f; location <= 0xef; location += 0x20) {
				Install(location, AbsoluteNop());
			}
			for(int location = 0x1f; location <= 0xff; location += 0x20) {
				Install(location, AbsoluteXNop());
			}
			for(int c = 0x07; c <= 0xe7; c += 0x20) {
				Install(c, ZeroNop());
			}
			for(int c = 0x17; c <= 0xf7; c += 0x20) {
				Install(c, ZeroXNop());
			}
		}

		// Outstanding:
		// 0xcb, 0xdb,
		if(has_stpwai(personality)) {
			Install(0xcb, Program(OperationScheduleWait));
			Install(0xdb, Program(OperationScheduleStop));
		} else {
			Install(0xcb, ImpliedNop());
			Install(0xdb, ZeroXNop());
		}
	}
#undef Install
}